

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx::CurveNiMBIntersectorK<8,8>::
     intersect_t<embree::avx::RibbonCurve1IntersectorK<embree::BezierCurveT,8,8>,embree::avx::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined1 (*pauVar7) [28];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  Primitive PVar18;
  uint uVar19;
  uint uVar20;
  undefined4 uVar21;
  Geometry *pGVar22;
  __int_type_conflict _Var23;
  long lVar24;
  RTCFilterFunctionN p_Var25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [28];
  undefined1 auVar134 [28];
  undefined1 auVar135 [28];
  undefined1 auVar136 [28];
  undefined1 auVar137 [28];
  undefined1 auVar138 [24];
  uint uVar139;
  uint uVar140;
  uint uVar141;
  ulong uVar142;
  long lVar143;
  ulong uVar144;
  uint uVar145;
  long lVar146;
  long lVar147;
  undefined1 auVar148 [8];
  undefined4 uVar149;
  undefined8 unaff_R13;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar151;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar150;
  float fVar173;
  float fVar175;
  float fVar181;
  float fVar183;
  float fVar185;
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  float fVar178;
  undefined1 auVar159 [32];
  float fVar176;
  float fVar179;
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  float fVar174;
  float fVar177;
  float fVar180;
  float fVar182;
  float fVar184;
  float fVar186;
  float fVar187;
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  float fVar188;
  float fVar207;
  float fVar208;
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  float fVar209;
  float fVar210;
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  float fVar211;
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [64];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar231 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar246;
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  float fVar247;
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  float fVar245;
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  float fVar248;
  float fVar262;
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  float fVar260;
  float fVar261;
  float fVar263;
  float fVar264;
  float fVar265;
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  float fVar266;
  undefined1 auVar259 [32];
  float fVar267;
  float fVar272;
  float fVar273;
  float fVar274;
  undefined1 auVar268 [16];
  float fVar275;
  float fVar276;
  float fVar277;
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [64];
  float fVar278;
  float fVar279;
  float fVar287;
  float fVar289;
  float fVar291;
  float fVar293;
  float fVar296;
  float fVar298;
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  float fVar288;
  float fVar290;
  float fVar292;
  float fVar294;
  float fVar295;
  float fVar297;
  float fVar299;
  float fVar300;
  float fVar301;
  undefined1 auVar285 [32];
  undefined1 auVar286 [64];
  float fVar302;
  float fVar310;
  float fVar311;
  float fVar312;
  float fVar313;
  float fVar314;
  float fVar315;
  float fVar316;
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [64];
  float fVar325;
  float fVar326;
  float fVar327;
  float fVar328;
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [64];
  float fVar329;
  float fVar330;
  float fVar340;
  float fVar341;
  float fVar342;
  undefined1 auVar331 [16];
  float fVar344;
  float fVar345;
  float fVar346;
  float fVar347;
  float fVar348;
  float fVar349;
  float fVar350;
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  float fVar351;
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  float fVar343;
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [64];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  float fVar359;
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  float fVar367;
  float fVar380;
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  undefined1 auVar379 [32];
  undefined1 auVar381 [32];
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  undefined1 auVar385 [32];
  undefined1 auVar386 [32];
  undefined1 auVar387 [64];
  float fVar388;
  float fVar392;
  undefined1 auVar390 [32];
  undefined1 auVar391 [32];
  float fVar393;
  float fVar394;
  float fVar399;
  float fVar401;
  float fVar402;
  undefined1 auVar396 [32];
  float fVar400;
  undefined1 auVar397 [32];
  undefined1 auVar398 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  undefined8 uStack_8e8;
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  undefined8 uStack_858;
  undefined8 uStack_848;
  undefined8 uStack_838;
  RTCFilterFunctionNArguments local_830;
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [8];
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined1 local_7a0 [32];
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  ulong local_730;
  undefined8 uStack_728;
  undefined1 *local_720;
  undefined1 (*local_718) [16];
  undefined1 (*local_710) [32];
  Precalculations *local_708;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  undefined1 local_6e0 [8];
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined1 local_6a0 [8];
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  LinearSpace3fa *local_5f0;
  Primitive *local_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_510 [16];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [8];
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined1 local_480 [8];
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [32];
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  uint local_380;
  uint local_37c;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  float local_300 [4];
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  RTCHitN local_260 [16];
  undefined1 auStack_250 [16];
  undefined1 local_240 [16];
  undefined1 auStack_230 [16];
  undefined1 local_220 [16];
  undefined1 auStack_210 [16];
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [32];
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [32];
  undefined1 auVar303 [16];
  undefined1 auVar368 [16];
  undefined1 auVar389 [16];
  undefined1 auVar395 [16];
  
  PVar18 = prim[1];
  uVar142 = (ulong)(byte)PVar18;
  auVar231 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar142 * 4 + 6)));
  auVar220 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar142 * 4 + 10)));
  auVar218 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar142 * 5 + 6)));
  auVar32 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar142 * 5 + 10)));
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar142 * 6 + 6)));
  auVar34 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar142 * 6 + 10)));
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar142 * 0xf + 6)));
  lVar143 = uVar142 * 0x25;
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar142 * 0xf + 10)));
  auVar37 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar18 * 0x10 + 6)));
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar18 * 0x10 + 10)));
  auVar39 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar142 * 0x11 + 6)));
  auVar40 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar142 * 0x11 + 10)));
  auVar253 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar253 = vinsertps_avx(auVar253,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar216 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar216 = vinsertps_avx(auVar216,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar253 = vsubps_avx(auVar253,*(undefined1 (*) [16])(prim + lVar143 + 6));
  fVar248 = *(float *)(prim + lVar143 + 0x12);
  local_880._4_4_ = fVar248 * auVar253._4_4_;
  local_880._0_4_ = fVar248 * auVar253._0_4_;
  fStack_878 = fVar248 * auVar253._8_4_;
  fStack_874 = fVar248 * auVar253._12_4_;
  auVar253 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar142 * 0x1a + 6)));
  auVar331._0_4_ = fVar248 * auVar216._0_4_;
  auVar331._4_4_ = fVar248 * auVar216._4_4_;
  auVar331._8_4_ = fVar248 * auVar216._8_4_;
  auVar331._12_4_ = fVar248 * auVar216._12_4_;
  auVar216 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar142 * 0x1a + 10)));
  auVar156._16_16_ = auVar220;
  auVar156._0_16_ = auVar231;
  auVar164._16_16_ = auVar32;
  auVar164._0_16_ = auVar218;
  auVar232._16_16_ = auVar34;
  auVar232._0_16_ = auVar33;
  auVar360._16_16_ = auVar36;
  auVar360._0_16_ = auVar35;
  auVar231 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar142 * 0x1b + 6)));
  auVar220 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar142 * 0x1b + 10)));
  auVar218 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar142 * 0x1c + 6)));
  auVar32 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar142 * 0x1c + 10)));
  auVar164 = vcvtdq2ps_avx(auVar164);
  auVar241 = vcvtdq2ps_avx(auVar232);
  auVar233._16_16_ = auVar38;
  auVar233._0_16_ = auVar37;
  auVar26 = vcvtdq2ps_avx(auVar233);
  auVar280._16_16_ = auVar40;
  auVar280._0_16_ = auVar39;
  auVar321 = vcvtdq2ps_avx(auVar280);
  auVar369._16_16_ = auVar216;
  auVar369._0_16_ = auVar253;
  auVar304._16_16_ = auVar220;
  auVar304._0_16_ = auVar231;
  auVar317._16_16_ = auVar32;
  auVar317._0_16_ = auVar218;
  auVar253 = vshufps_avx(auVar331,auVar331,0x55);
  auVar216 = vshufps_avx(auVar331,auVar331,0xaa);
  fVar248 = auVar216._0_4_;
  fVar267 = auVar216._4_4_;
  fVar359 = auVar216._8_4_;
  fVar260 = auVar216._12_4_;
  fVar247 = auVar253._0_4_;
  fVar262 = auVar253._4_4_;
  fVar274 = auVar253._8_4_;
  fVar245 = auVar253._12_4_;
  auVar27 = vcvtdq2ps_avx(auVar156);
  auVar28 = vcvtdq2ps_avx(auVar360);
  auVar29 = vcvtdq2ps_avx(auVar369);
  auVar30 = vcvtdq2ps_avx(auVar304);
  auVar31 = vcvtdq2ps_avx(auVar317);
  auVar253 = vshufps_avx(auVar331,auVar331,0);
  fVar272 = auVar253._0_4_;
  fVar242 = auVar253._4_4_;
  fVar261 = auVar253._8_4_;
  fVar273 = auVar253._12_4_;
  auVar381._0_4_ = fVar272 * auVar27._0_4_ + fVar247 * auVar164._0_4_ + fVar248 * auVar241._0_4_;
  auVar381._4_4_ = fVar242 * auVar27._4_4_ + fVar262 * auVar164._4_4_ + fVar267 * auVar241._4_4_;
  auVar381._8_4_ = fVar261 * auVar27._8_4_ + fVar274 * auVar164._8_4_ + fVar359 * auVar241._8_4_;
  auVar381._12_4_ = fVar273 * auVar27._12_4_ + fVar245 * auVar164._12_4_ + fVar260 * auVar241._12_4_
  ;
  auVar381._16_4_ = fVar272 * auVar27._16_4_ + fVar247 * auVar164._16_4_ + fVar248 * auVar241._16_4_
  ;
  auVar381._20_4_ = fVar242 * auVar27._20_4_ + fVar262 * auVar164._20_4_ + fVar267 * auVar241._20_4_
  ;
  auVar381._24_4_ = fVar261 * auVar27._24_4_ + fVar274 * auVar164._24_4_ + fVar359 * auVar241._24_4_
  ;
  auVar381._28_4_ = 0;
  auVar370._0_4_ = fVar272 * auVar28._0_4_ + fVar247 * auVar26._0_4_ + fVar248 * auVar321._0_4_;
  auVar370._4_4_ = fVar242 * auVar28._4_4_ + fVar262 * auVar26._4_4_ + fVar267 * auVar321._4_4_;
  auVar370._8_4_ = fVar261 * auVar28._8_4_ + fVar274 * auVar26._8_4_ + fVar359 * auVar321._8_4_;
  auVar370._12_4_ = fVar273 * auVar28._12_4_ + fVar245 * auVar26._12_4_ + fVar260 * auVar321._12_4_;
  auVar370._16_4_ = fVar272 * auVar28._16_4_ + fVar247 * auVar26._16_4_ + fVar248 * auVar321._16_4_;
  auVar370._20_4_ = fVar242 * auVar28._20_4_ + fVar262 * auVar26._20_4_ + fVar267 * auVar321._20_4_;
  auVar370._24_4_ = fVar261 * auVar28._24_4_ + fVar274 * auVar26._24_4_ + fVar359 * auVar321._24_4_;
  auVar370._28_4_ = 0;
  auVar361._0_4_ = fVar272 * auVar29._0_4_ + fVar247 * auVar30._0_4_ + fVar248 * auVar31._0_4_;
  auVar361._4_4_ = fVar242 * auVar29._4_4_ + fVar262 * auVar30._4_4_ + fVar267 * auVar31._4_4_;
  auVar361._8_4_ = fVar261 * auVar29._8_4_ + fVar274 * auVar30._8_4_ + fVar359 * auVar31._8_4_;
  auVar361._12_4_ = fVar273 * auVar29._12_4_ + fVar245 * auVar30._12_4_ + fVar260 * auVar31._12_4_;
  auVar361._16_4_ = fVar272 * auVar29._16_4_ + fVar247 * auVar30._16_4_ + fVar248 * auVar31._16_4_;
  auVar361._20_4_ = fVar242 * auVar29._20_4_ + fVar262 * auVar30._20_4_ + fVar267 * auVar31._20_4_;
  auVar361._24_4_ = fVar261 * auVar29._24_4_ + fVar274 * auVar30._24_4_ + fVar359 * auVar31._24_4_;
  auVar361._28_4_ = fVar260 + 0.0 + 0.0;
  auVar253 = vshufps_avx(_local_880,_local_880,0x55);
  auVar216 = vshufps_avx(_local_880,_local_880,0xaa);
  fVar272 = auVar216._0_4_;
  fVar242 = auVar216._4_4_;
  fVar261 = auVar216._8_4_;
  fVar273 = auVar216._12_4_;
  fVar248 = auVar253._0_4_;
  fVar267 = auVar253._4_4_;
  fVar359 = auVar253._8_4_;
  fVar260 = auVar253._12_4_;
  fVar247 = auVar321._28_4_ + 0.0;
  auVar253._8_8_ = 0;
  auVar253._0_8_ = *(ulong *)(prim + uVar142 * 7 + 6);
  auVar253 = vpmovsxwd_avx(auVar253);
  auVar216._8_8_ = 0;
  auVar216._0_8_ = *(ulong *)(prim + uVar142 * 7 + 0xe);
  auVar216 = vpmovsxwd_avx(auVar216);
  auVar231 = vshufps_avx(_local_880,_local_880,0);
  fVar262 = auVar231._0_4_;
  fVar274 = auVar231._4_4_;
  fVar245 = auVar231._8_4_;
  fVar263 = auVar231._12_4_;
  auVar193._0_4_ = fVar262 * auVar27._0_4_ + auVar164._0_4_ * fVar248 + fVar272 * auVar241._0_4_;
  auVar193._4_4_ = fVar274 * auVar27._4_4_ + auVar164._4_4_ * fVar267 + fVar242 * auVar241._4_4_;
  auVar193._8_4_ = fVar245 * auVar27._8_4_ + auVar164._8_4_ * fVar359 + fVar261 * auVar241._8_4_;
  auVar193._12_4_ = fVar263 * auVar27._12_4_ + auVar164._12_4_ * fVar260 + fVar273 * auVar241._12_4_
  ;
  auVar193._16_4_ = fVar262 * auVar27._16_4_ + auVar164._16_4_ * fVar248 + fVar272 * auVar241._16_4_
  ;
  auVar193._20_4_ = fVar274 * auVar27._20_4_ + auVar164._20_4_ * fVar267 + fVar242 * auVar241._20_4_
  ;
  auVar193._24_4_ = fVar245 * auVar27._24_4_ + auVar164._24_4_ * fVar359 + fVar261 * auVar241._24_4_
  ;
  auVar193._28_4_ = fVar260 + fVar247;
  auVar157._0_4_ = auVar28._0_4_ * fVar262 + fVar248 * auVar26._0_4_ + fVar272 * auVar321._0_4_;
  auVar157._4_4_ = auVar28._4_4_ * fVar274 + fVar267 * auVar26._4_4_ + fVar242 * auVar321._4_4_;
  auVar157._8_4_ = auVar28._8_4_ * fVar245 + fVar359 * auVar26._8_4_ + fVar261 * auVar321._8_4_;
  auVar157._12_4_ = auVar28._12_4_ * fVar263 + fVar260 * auVar26._12_4_ + fVar273 * auVar321._12_4_;
  auVar157._16_4_ = auVar28._16_4_ * fVar262 + fVar248 * auVar26._16_4_ + fVar272 * auVar321._16_4_;
  auVar157._20_4_ = auVar28._20_4_ * fVar274 + fVar267 * auVar26._20_4_ + fVar242 * auVar321._20_4_;
  auVar157._24_4_ = auVar28._24_4_ * fVar245 + fVar359 * auVar26._24_4_ + fVar261 * auVar321._24_4_;
  auVar157._28_4_ = fVar260 + auVar241._28_4_ + 0.0;
  auVar352._8_4_ = 0x7fffffff;
  auVar352._0_8_ = 0x7fffffff7fffffff;
  auVar352._12_4_ = 0x7fffffff;
  auVar352._16_4_ = 0x7fffffff;
  auVar352._20_4_ = 0x7fffffff;
  auVar352._24_4_ = 0x7fffffff;
  auVar352._28_4_ = 0x7fffffff;
  auVar254._8_4_ = 0x219392ef;
  auVar254._0_8_ = 0x219392ef219392ef;
  auVar254._12_4_ = 0x219392ef;
  auVar254._16_4_ = 0x219392ef;
  auVar254._20_4_ = 0x219392ef;
  auVar254._24_4_ = 0x219392ef;
  auVar254._28_4_ = 0x219392ef;
  auVar164 = vandps_avx(auVar381,auVar352);
  auVar164 = vcmpps_avx(auVar164,auVar254,1);
  auVar241 = vblendvps_avx(auVar381,auVar254,auVar164);
  auVar164 = vandps_avx(auVar370,auVar352);
  auVar164 = vcmpps_avx(auVar164,auVar254,1);
  auVar26 = vblendvps_avx(auVar370,auVar254,auVar164);
  auVar164 = vandps_avx(auVar361,auVar352);
  auVar164 = vcmpps_avx(auVar164,auVar254,1);
  auVar164 = vblendvps_avx(auVar361,auVar254,auVar164);
  auVar222._0_4_ = fVar262 * auVar29._0_4_ + auVar30._0_4_ * fVar248 + fVar272 * auVar31._0_4_;
  auVar222._4_4_ = fVar274 * auVar29._4_4_ + auVar30._4_4_ * fVar267 + fVar242 * auVar31._4_4_;
  auVar222._8_4_ = fVar245 * auVar29._8_4_ + auVar30._8_4_ * fVar359 + fVar261 * auVar31._8_4_;
  auVar222._12_4_ = fVar263 * auVar29._12_4_ + auVar30._12_4_ * fVar260 + fVar273 * auVar31._12_4_;
  auVar222._16_4_ = fVar262 * auVar29._16_4_ + auVar30._16_4_ * fVar248 + fVar272 * auVar31._16_4_;
  auVar222._20_4_ = fVar274 * auVar29._20_4_ + auVar30._20_4_ * fVar267 + fVar242 * auVar31._20_4_;
  auVar222._24_4_ = fVar245 * auVar29._24_4_ + auVar30._24_4_ * fVar359 + fVar261 * auVar31._24_4_;
  auVar222._28_4_ = fVar247 + fVar260 + fVar273;
  auVar321 = vrcpps_avx(auVar241);
  fVar248 = auVar321._0_4_;
  fVar260 = auVar321._4_4_;
  auVar27._4_4_ = auVar241._4_4_ * fVar260;
  auVar27._0_4_ = auVar241._0_4_ * fVar248;
  fVar261 = auVar321._8_4_;
  auVar27._8_4_ = auVar241._8_4_ * fVar261;
  fVar262 = auVar321._12_4_;
  auVar27._12_4_ = auVar241._12_4_ * fVar262;
  fVar263 = auVar321._16_4_;
  auVar27._16_4_ = auVar241._16_4_ * fVar263;
  fVar264 = auVar321._20_4_;
  auVar27._20_4_ = auVar241._20_4_ * fVar264;
  fVar265 = auVar321._24_4_;
  auVar27._24_4_ = auVar241._24_4_ * fVar265;
  auVar27._28_4_ = 0x219392ef;
  auVar382._8_4_ = 0x3f800000;
  auVar382._0_8_ = 0x3f8000003f800000;
  auVar382._12_4_ = 0x3f800000;
  auVar382._16_4_ = 0x3f800000;
  auVar382._20_4_ = 0x3f800000;
  auVar382._24_4_ = 0x3f800000;
  auVar382._28_4_ = 0x3f800000;
  auVar28 = vsubps_avx(auVar382,auVar27);
  auVar27 = vrcpps_avx(auVar26);
  fVar248 = fVar248 + fVar248 * auVar28._0_4_;
  fVar260 = fVar260 + fVar260 * auVar28._4_4_;
  fVar261 = fVar261 + fVar261 * auVar28._8_4_;
  fVar262 = fVar262 + fVar262 * auVar28._12_4_;
  fVar263 = fVar263 + fVar263 * auVar28._16_4_;
  fVar264 = fVar264 + fVar264 * auVar28._20_4_;
  fVar265 = fVar265 + fVar265 * auVar28._24_4_;
  fVar267 = auVar27._0_4_;
  fVar272 = auVar27._4_4_;
  auVar241._4_4_ = auVar26._4_4_ * fVar272;
  auVar241._0_4_ = auVar26._0_4_ * fVar267;
  fVar273 = auVar27._8_4_;
  auVar241._8_4_ = auVar26._8_4_ * fVar273;
  fVar274 = auVar27._12_4_;
  auVar241._12_4_ = auVar26._12_4_ * fVar274;
  fVar275 = auVar27._16_4_;
  auVar241._16_4_ = auVar26._16_4_ * fVar275;
  fVar276 = auVar27._20_4_;
  auVar241._20_4_ = auVar26._20_4_ * fVar276;
  fVar277 = auVar27._24_4_;
  auVar241._24_4_ = auVar26._24_4_ * fVar277;
  auVar241._28_4_ = auVar321._28_4_;
  auVar26 = vsubps_avx(auVar382,auVar241);
  fVar267 = fVar267 + fVar267 * auVar26._0_4_;
  fVar272 = fVar272 + fVar272 * auVar26._4_4_;
  fVar273 = fVar273 + fVar273 * auVar26._8_4_;
  fVar274 = fVar274 + fVar274 * auVar26._12_4_;
  fVar275 = fVar275 + fVar275 * auVar26._16_4_;
  fVar276 = fVar276 + fVar276 * auVar26._20_4_;
  fVar277 = fVar277 + fVar277 * auVar26._24_4_;
  auVar241 = vrcpps_avx(auVar164);
  auVar231._8_8_ = 0;
  auVar231._0_8_ = *(ulong *)(prim + uVar142 * 0xb + 6);
  auVar231 = vpmovsxwd_avx(auVar231);
  auVar220._8_8_ = 0;
  auVar220._0_8_ = *(ulong *)(prim + uVar142 * 0xb + 0xe);
  auVar220 = vpmovsxwd_avx(auVar220);
  auVar218._8_8_ = 0;
  auVar218._0_8_ = *(ulong *)(prim + uVar142 * 9 + 6);
  auVar218 = vpmovsxwd_avx(auVar218);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *(ulong *)(prim + uVar142 * 9 + 0xe);
  auVar32 = vpmovsxwd_avx(auVar32);
  fVar278 = auVar241._0_4_;
  fVar287 = auVar241._4_4_;
  auVar29._4_4_ = fVar287 * auVar164._4_4_;
  auVar29._0_4_ = fVar278 * auVar164._0_4_;
  fVar289 = auVar241._8_4_;
  auVar29._8_4_ = fVar289 * auVar164._8_4_;
  fVar291 = auVar241._12_4_;
  auVar29._12_4_ = fVar291 * auVar164._12_4_;
  fVar293 = auVar241._16_4_;
  auVar29._16_4_ = fVar293 * auVar164._16_4_;
  fVar296 = auVar241._20_4_;
  auVar29._20_4_ = fVar296 * auVar164._20_4_;
  fVar298 = auVar241._24_4_;
  auVar29._24_4_ = fVar298 * auVar164._24_4_;
  auVar29._28_4_ = auVar164._28_4_;
  auVar164 = vsubps_avx(auVar382,auVar29);
  fVar278 = fVar278 + fVar278 * auVar164._0_4_;
  fVar287 = fVar287 + fVar287 * auVar164._4_4_;
  fVar289 = fVar289 + fVar289 * auVar164._8_4_;
  fVar291 = fVar291 + fVar291 * auVar164._12_4_;
  fVar293 = fVar293 + fVar293 * auVar164._16_4_;
  fVar296 = fVar296 + fVar296 * auVar164._20_4_;
  fVar298 = fVar298 + fVar298 * auVar164._24_4_;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *(ulong *)(prim + uVar142 * 0xd + 6);
  auVar33 = vpmovsxwd_avx(auVar33);
  auVar305._16_16_ = auVar216;
  auVar305._0_16_ = auVar253;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(ulong *)(prim + uVar142 * 0xd + 0xe);
  auVar253 = vpmovsxwd_avx(auVar34);
  auVar216 = vpermilps_avx(ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) -
                                          *(float *)(prim + lVar143 + 0x16)) *
                                         *(float *)(prim + lVar143 + 0x1a))),0);
  auVar164 = vcvtdq2ps_avx(auVar305);
  auVar362._16_16_ = auVar220;
  auVar362._0_16_ = auVar231;
  auVar241 = vcvtdq2ps_avx(auVar362);
  auVar241 = vsubps_avx(auVar241,auVar164);
  fVar359 = auVar216._0_4_;
  fVar242 = auVar216._4_4_;
  fVar247 = auVar216._8_4_;
  fVar245 = auVar216._12_4_;
  auVar306._0_4_ = auVar241._0_4_ * fVar359 + auVar164._0_4_;
  auVar306._4_4_ = auVar241._4_4_ * fVar242 + auVar164._4_4_;
  auVar306._8_4_ = auVar241._8_4_ * fVar247 + auVar164._8_4_;
  auVar306._12_4_ = auVar241._12_4_ * fVar245 + auVar164._12_4_;
  auVar306._16_4_ = auVar241._16_4_ * fVar359 + auVar164._16_4_;
  auVar306._20_4_ = auVar241._20_4_ * fVar242 + auVar164._20_4_;
  auVar306._24_4_ = auVar241._24_4_ * fVar247 + auVar164._24_4_;
  auVar306._28_4_ = auVar241._28_4_ + auVar164._28_4_;
  auVar318._16_16_ = auVar32;
  auVar318._0_16_ = auVar218;
  auVar164 = vcvtdq2ps_avx(auVar318);
  auVar332._16_16_ = auVar253;
  auVar332._0_16_ = auVar33;
  auVar241 = vcvtdq2ps_avx(auVar332);
  auVar241 = vsubps_avx(auVar241,auVar164);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *(ulong *)(prim + uVar142 * 0x12 + 6);
  auVar253 = vpmovsxwd_avx(auVar35);
  auVar319._0_4_ = auVar164._0_4_ + auVar241._0_4_ * fVar359;
  auVar319._4_4_ = auVar164._4_4_ + auVar241._4_4_ * fVar242;
  auVar319._8_4_ = auVar164._8_4_ + auVar241._8_4_ * fVar247;
  auVar319._12_4_ = auVar164._12_4_ + auVar241._12_4_ * fVar245;
  auVar319._16_4_ = auVar164._16_4_ + auVar241._16_4_ * fVar359;
  auVar319._20_4_ = auVar164._20_4_ + auVar241._20_4_ * fVar242;
  auVar319._24_4_ = auVar164._24_4_ + auVar241._24_4_ * fVar247;
  auVar319._28_4_ = auVar164._28_4_ + auVar241._28_4_;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(prim + uVar142 * 0x12 + 0xe);
  auVar216 = vpmovsxwd_avx(auVar36);
  auVar333._16_16_ = auVar216;
  auVar333._0_16_ = auVar253;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar142 * 0x16 + 6);
  auVar253 = vpmovsxwd_avx(auVar37);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar142 * 0x16 + 0xe);
  auVar216 = vpmovsxwd_avx(auVar38);
  auVar164 = vcvtdq2ps_avx(auVar333);
  auVar353._16_16_ = auVar216;
  auVar353._0_16_ = auVar253;
  auVar241 = vcvtdq2ps_avx(auVar353);
  auVar241 = vsubps_avx(auVar241,auVar164);
  auVar334._0_4_ = auVar164._0_4_ + auVar241._0_4_ * fVar359;
  auVar334._4_4_ = auVar164._4_4_ + auVar241._4_4_ * fVar242;
  auVar334._8_4_ = auVar164._8_4_ + auVar241._8_4_ * fVar247;
  auVar334._12_4_ = auVar164._12_4_ + auVar241._12_4_ * fVar245;
  auVar334._16_4_ = auVar164._16_4_ + auVar241._16_4_ * fVar359;
  auVar334._20_4_ = auVar164._20_4_ + auVar241._20_4_ * fVar242;
  auVar334._24_4_ = auVar164._24_4_ + auVar241._24_4_ * fVar247;
  auVar334._28_4_ = auVar164._28_4_ + auVar241._28_4_;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *(ulong *)(prim + uVar142 * 0x14 + 6);
  auVar253 = vpmovsxwd_avx(auVar39);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + uVar142 * 0x14 + 0xe);
  auVar216 = vpmovsxwd_avx(auVar40);
  auVar354._16_16_ = auVar216;
  auVar354._0_16_ = auVar253;
  auVar164 = vcvtdq2ps_avx(auVar354);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar142 * 0x18 + 6);
  auVar253 = vpmovsxwd_avx(auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar142 * 0x18 + 0xe);
  auVar216 = vpmovsxwd_avx(auVar9);
  auVar363._16_16_ = auVar216;
  auVar363._0_16_ = auVar253;
  auVar241 = vcvtdq2ps_avx(auVar363);
  auVar241 = vsubps_avx(auVar241,auVar164);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar142 * 0x1d + 6);
  auVar253 = vpmovsxwd_avx(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar142 * 0x1d + 0xe);
  auVar216 = vpmovsxwd_avx(auVar11);
  auVar355._0_4_ = auVar164._0_4_ + auVar241._0_4_ * fVar359;
  auVar355._4_4_ = auVar164._4_4_ + auVar241._4_4_ * fVar242;
  auVar355._8_4_ = auVar164._8_4_ + auVar241._8_4_ * fVar247;
  auVar355._12_4_ = auVar164._12_4_ + auVar241._12_4_ * fVar245;
  auVar355._16_4_ = auVar164._16_4_ + auVar241._16_4_ * fVar359;
  auVar355._20_4_ = auVar164._20_4_ + auVar241._20_4_ * fVar242;
  auVar355._24_4_ = auVar164._24_4_ + auVar241._24_4_ * fVar247;
  auVar355._28_4_ = auVar164._28_4_ + auVar241._28_4_;
  auVar364._16_16_ = auVar216;
  auVar364._0_16_ = auVar253;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar142 * 0x21 + 6);
  auVar253 = vpmovsxwd_avx(auVar12);
  auVar164 = vcvtdq2ps_avx(auVar364);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar142 * 0x21 + 0xe);
  auVar216 = vpmovsxwd_avx(auVar13);
  auVar371._16_16_ = auVar216;
  auVar371._0_16_ = auVar253;
  auVar241 = vcvtdq2ps_avx(auVar371);
  auVar241 = vsubps_avx(auVar241,auVar164);
  auVar365._0_4_ = auVar164._0_4_ + auVar241._0_4_ * fVar359;
  auVar365._4_4_ = auVar164._4_4_ + auVar241._4_4_ * fVar242;
  auVar365._8_4_ = auVar164._8_4_ + auVar241._8_4_ * fVar247;
  auVar365._12_4_ = auVar164._12_4_ + auVar241._12_4_ * fVar245;
  auVar365._16_4_ = auVar164._16_4_ + auVar241._16_4_ * fVar359;
  auVar365._20_4_ = auVar164._20_4_ + auVar241._20_4_ * fVar242;
  auVar365._24_4_ = auVar164._24_4_ + auVar241._24_4_ * fVar247;
  auVar365._28_4_ = auVar164._28_4_ + auVar241._28_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar142 * 0x1f + 6);
  auVar253 = vpmovsxwd_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar142 * 0x1f + 0xe);
  auVar216 = vpmovsxwd_avx(auVar15);
  auVar372._16_16_ = auVar216;
  auVar372._0_16_ = auVar253;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar142 * 0x23 + 6);
  auVar253 = vpmovsxwd_avx(auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar142 * 0x23 + 0xe);
  auVar216 = vpmovsxwd_avx(auVar17);
  auVar383._16_16_ = auVar216;
  auVar383._0_16_ = auVar253;
  auVar164 = vcvtdq2ps_avx(auVar372);
  auVar241 = vcvtdq2ps_avx(auVar383);
  auVar241 = vsubps_avx(auVar241,auVar164);
  auVar373._0_4_ = auVar164._0_4_ + auVar241._0_4_ * fVar359;
  auVar373._4_4_ = auVar164._4_4_ + auVar241._4_4_ * fVar242;
  auVar373._8_4_ = auVar164._8_4_ + auVar241._8_4_ * fVar247;
  auVar373._12_4_ = auVar164._12_4_ + auVar241._12_4_ * fVar245;
  auVar373._16_4_ = auVar164._16_4_ + auVar241._16_4_ * fVar359;
  auVar373._20_4_ = auVar164._20_4_ + auVar241._20_4_ * fVar242;
  auVar373._24_4_ = auVar164._24_4_ + auVar241._24_4_ * fVar247;
  auVar373._28_4_ = auVar164._28_4_ + fVar245;
  auVar164 = vsubps_avx(auVar306,auVar193);
  auVar228._0_4_ = fVar248 * auVar164._0_4_;
  auVar228._4_4_ = fVar260 * auVar164._4_4_;
  auVar228._8_4_ = fVar261 * auVar164._8_4_;
  auVar228._12_4_ = fVar262 * auVar164._12_4_;
  auVar30._16_4_ = fVar263 * auVar164._16_4_;
  auVar30._0_16_ = auVar228;
  auVar30._20_4_ = fVar264 * auVar164._20_4_;
  auVar30._24_4_ = fVar265 * auVar164._24_4_;
  auVar30._28_4_ = auVar164._28_4_;
  auVar164 = vsubps_avx(auVar319,auVar193);
  auVar249._0_4_ = fVar248 * auVar164._0_4_;
  auVar249._4_4_ = fVar260 * auVar164._4_4_;
  auVar249._8_4_ = fVar261 * auVar164._8_4_;
  auVar249._12_4_ = fVar262 * auVar164._12_4_;
  auVar31._16_4_ = fVar263 * auVar164._16_4_;
  auVar31._0_16_ = auVar249;
  auVar31._20_4_ = fVar264 * auVar164._20_4_;
  auVar31._24_4_ = fVar265 * auVar164._24_4_;
  auVar31._28_4_ = auVar321._28_4_ + auVar28._28_4_;
  auVar164 = vsubps_avx(auVar334,auVar157);
  auVar189._0_4_ = fVar267 * auVar164._0_4_;
  auVar189._4_4_ = fVar272 * auVar164._4_4_;
  auVar189._8_4_ = fVar273 * auVar164._8_4_;
  auVar189._12_4_ = fVar274 * auVar164._12_4_;
  auVar321._16_4_ = fVar275 * auVar164._16_4_;
  auVar321._0_16_ = auVar189;
  auVar321._20_4_ = fVar276 * auVar164._20_4_;
  auVar321._24_4_ = fVar277 * auVar164._24_4_;
  auVar321._28_4_ = auVar164._28_4_;
  auVar164 = vsubps_avx(auVar355,auVar157);
  auVar268._0_4_ = fVar267 * auVar164._0_4_;
  auVar268._4_4_ = fVar272 * auVar164._4_4_;
  auVar268._8_4_ = fVar273 * auVar164._8_4_;
  auVar268._12_4_ = fVar274 * auVar164._12_4_;
  auVar28._16_4_ = fVar275 * auVar164._16_4_;
  auVar28._0_16_ = auVar268;
  auVar28._20_4_ = fVar276 * auVar164._20_4_;
  auVar28._24_4_ = fVar277 * auVar164._24_4_;
  auVar28._28_4_ = auVar27._28_4_ + auVar26._28_4_;
  auVar164 = vsubps_avx(auVar365,auVar222);
  auVar152._0_4_ = fVar278 * auVar164._0_4_;
  auVar152._4_4_ = fVar287 * auVar164._4_4_;
  auVar152._8_4_ = fVar289 * auVar164._8_4_;
  auVar152._12_4_ = fVar291 * auVar164._12_4_;
  auVar26._16_4_ = fVar293 * auVar164._16_4_;
  auVar26._0_16_ = auVar152;
  auVar26._20_4_ = fVar296 * auVar164._20_4_;
  auVar26._24_4_ = fVar298 * auVar164._24_4_;
  auVar26._28_4_ = auVar164._28_4_;
  auVar164 = vsubps_avx(auVar373,auVar222);
  auVar212._0_4_ = fVar278 * auVar164._0_4_;
  auVar212._4_4_ = fVar287 * auVar164._4_4_;
  auVar212._8_4_ = fVar289 * auVar164._8_4_;
  auVar212._12_4_ = fVar291 * auVar164._12_4_;
  auVar41._16_4_ = fVar293 * auVar164._16_4_;
  auVar41._0_16_ = auVar212;
  auVar41._20_4_ = fVar296 * auVar164._20_4_;
  auVar41._24_4_ = fVar298 * auVar164._24_4_;
  auVar41._28_4_ = auVar164._28_4_;
  auVar253 = vpminsd_avx(auVar30._16_16_,auVar31._16_16_);
  auVar216 = vpminsd_avx(auVar228,auVar249);
  auVar356._16_16_ = auVar253;
  auVar356._0_16_ = auVar216;
  auVar231 = auVar28._16_16_;
  auVar324 = ZEXT1664(auVar231);
  auVar253 = vpminsd_avx(auVar321._16_16_,auVar231);
  auVar216 = vpminsd_avx(auVar189,auVar268);
  auVar366._16_16_ = auVar253;
  auVar366._0_16_ = auVar216;
  auVar164 = vmaxps_avx(auVar356,auVar366);
  auVar253 = vpminsd_avx(auVar26._16_16_,auVar41._16_16_);
  auVar216 = vpminsd_avx(auVar152,auVar212);
  auVar384._16_16_ = auVar253;
  auVar384._0_16_ = auVar216;
  uVar149 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar390._4_4_ = uVar149;
  auVar390._0_4_ = uVar149;
  auVar390._8_4_ = uVar149;
  auVar390._12_4_ = uVar149;
  auVar390._16_4_ = uVar149;
  auVar390._20_4_ = uVar149;
  auVar390._24_4_ = uVar149;
  auVar390._28_4_ = uVar149;
  auVar241 = vmaxps_avx(auVar384,auVar390);
  auVar164 = vmaxps_avx(auVar164,auVar241);
  local_80._4_4_ = auVar164._4_4_ * 0.99999964;
  local_80._0_4_ = auVar164._0_4_ * 0.99999964;
  local_80._8_4_ = auVar164._8_4_ * 0.99999964;
  local_80._12_4_ = auVar164._12_4_ * 0.99999964;
  local_80._16_4_ = auVar164._16_4_ * 0.99999964;
  local_80._20_4_ = auVar164._20_4_ * 0.99999964;
  local_80._24_4_ = auVar164._24_4_ * 0.99999964;
  local_80._28_4_ = 0x3f7ffffa;
  auVar253 = vpmaxsd_avx(auVar30._16_16_,auVar31._16_16_);
  auVar216 = vpmaxsd_avx(auVar228,auVar249);
  auVar234._16_16_ = auVar253;
  auVar234._0_16_ = auVar216;
  auVar253 = vpmaxsd_avx(auVar321._16_16_,auVar231);
  auVar216 = vpmaxsd_avx(auVar189,auVar268);
  auVar194._16_16_ = auVar253;
  auVar194._0_16_ = auVar216;
  auVar164 = vminps_avx(auVar234,auVar194);
  auVar253 = vpmaxsd_avx(auVar26._16_16_,auVar41._16_16_);
  auVar216 = vpmaxsd_avx(auVar152,auVar212);
  auVar158._16_16_ = auVar253;
  auVar158._0_16_ = auVar216;
  uVar149 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar223._4_4_ = uVar149;
  auVar223._0_4_ = uVar149;
  auVar223._8_4_ = uVar149;
  auVar223._12_4_ = uVar149;
  auVar223._16_4_ = uVar149;
  auVar223._20_4_ = uVar149;
  auVar223._24_4_ = uVar149;
  auVar223._28_4_ = uVar149;
  auVar241 = vminps_avx(auVar158,auVar223);
  auVar164 = vminps_avx(auVar164,auVar241);
  auVar42._4_4_ = auVar164._4_4_ * 1.0000004;
  auVar42._0_4_ = auVar164._0_4_ * 1.0000004;
  auVar42._8_4_ = auVar164._8_4_ * 1.0000004;
  auVar42._12_4_ = auVar164._12_4_ * 1.0000004;
  auVar42._16_4_ = auVar164._16_4_ * 1.0000004;
  auVar42._20_4_ = auVar164._20_4_ * 1.0000004;
  auVar42._24_4_ = auVar164._24_4_ * 1.0000004;
  auVar42._28_4_ = auVar164._28_4_;
  auVar164 = vcmpps_avx(local_80,auVar42,2);
  auVar253 = vpshufd_avx(ZEXT116((byte)PVar18),0);
  auVar195._16_16_ = auVar253;
  auVar195._0_16_ = auVar253;
  auVar241 = vcvtdq2ps_avx(auVar195);
  auVar241 = vcmpps_avx(_DAT_01f7b060,auVar241,1);
  auVar164 = vandps_avx(auVar164,auVar241);
  uVar149 = vmovmskps_avx(auVar164);
  uVar142 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar149);
  local_5f0 = pre->ray_space + k;
  local_5e0 = mm_lookupmask_ps._16_8_;
  uStack_5d8 = mm_lookupmask_ps._24_8_;
  uStack_5d0 = mm_lookupmask_ps._16_8_;
  uStack_5c8 = mm_lookupmask_ps._24_8_;
  uVar145 = 1 << ((byte)k & 0x1f);
  local_710 = (undefined1 (*) [32])&local_180;
  local_718 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar145 & 0xf) << 4));
  local_720 = mm_lookupmask_ps + (long)((int)uVar145 >> 4) * 0x10;
  local_708 = pre;
  local_5e8 = prim;
  do {
    auVar164 = local_7e0;
    if (uVar142 == 0) {
      return;
    }
    auVar241 = auVar324._0_32_;
    lVar143 = 0;
    if (uVar142 != 0) {
      for (; (uVar142 >> lVar143 & 1) == 0; lVar143 = lVar143 + 1) {
      }
    }
    uVar140 = *(uint *)(local_5e8 + 2);
    uVar19 = *(uint *)(local_5e8 + lVar143 * 4 + 6);
    pGVar22 = (context->scene->geometries).items[CONCAT44(0,uVar140)].ptr;
    uVar144 = (ulong)*(uint *)(*(long *)&pGVar22->field_0x58 +
                              (ulong)uVar19 *
                              pGVar22[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i);
    fVar248 = (pGVar22->time_range).lower;
    fVar248 = pGVar22->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0xe0) - fVar248) / ((pGVar22->time_range).upper - fVar248))
    ;
    auVar253 = vroundss_avx(ZEXT416((uint)fVar248),ZEXT416((uint)fVar248),9);
    auVar253 = vminss_avx(auVar253,ZEXT416((uint)(pGVar22->fnumTimeSegments + -1.0)));
    auVar253 = vmaxss_avx(ZEXT816(0) << 0x20,auVar253);
    fVar248 = fVar248 - auVar253._0_4_;
    _Var23 = pGVar22[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar147 = (long)(int)auVar253._0_4_ * 0x38;
    lVar143 = *(long *)(_Var23 + 0x10 + lVar147);
    lVar146 = *(long *)(_Var23 + 0x38 + lVar147);
    lVar24 = *(long *)(_Var23 + 0x48 + lVar147);
    auVar253 = vshufps_avx(ZEXT416((uint)fVar248),ZEXT416((uint)fVar248),0);
    pfVar1 = (float *)(lVar146 + uVar144 * lVar24);
    fVar272 = auVar253._0_4_;
    fVar242 = auVar253._4_4_;
    fVar261 = auVar253._8_4_;
    fVar273 = auVar253._12_4_;
    pfVar2 = (float *)(lVar146 + (uVar144 + 1) * lVar24);
    pfVar3 = (float *)(lVar146 + (uVar144 + 2) * lVar24);
    pfVar4 = (float *)(lVar146 + lVar24 * (uVar144 + 3));
    lVar146 = *(long *)(_Var23 + lVar147);
    auVar253 = vshufps_avx(ZEXT416((uint)(1.0 - fVar248)),ZEXT416((uint)(1.0 - fVar248)),0);
    pfVar5 = (float *)(lVar146 + lVar143 * uVar144);
    fVar248 = auVar253._0_4_;
    fVar267 = auVar253._4_4_;
    fVar359 = auVar253._8_4_;
    fVar260 = auVar253._12_4_;
    pfVar6 = (float *)(lVar146 + lVar143 * (uVar144 + 1));
    fVar302 = fVar272 * *pfVar1 + fVar248 * *pfVar5;
    fVar310 = fVar242 * pfVar1[1] + fVar267 * pfVar5[1];
    auVar303._0_8_ = CONCAT44(fVar310,fVar302);
    auVar303._8_4_ = fVar261 * pfVar1[2] + fVar359 * pfVar5[2];
    auVar303._12_4_ = fVar273 * pfVar1[3] + fVar260 * pfVar5[3];
    fVar388 = fVar248 * *pfVar6 + fVar272 * *pfVar2;
    fVar392 = fVar267 * pfVar6[1] + fVar242 * pfVar2[1];
    auVar389._0_8_ = CONCAT44(fVar392,fVar388);
    auVar389._8_4_ = fVar359 * pfVar6[2] + fVar261 * pfVar2[2];
    auVar389._12_4_ = fVar260 * pfVar6[3] + fVar273 * pfVar2[3];
    pfVar1 = (float *)(lVar146 + lVar143 * (uVar144 + 2));
    fVar393 = fVar248 * *pfVar1 + fVar272 * *pfVar3;
    fVar399 = fVar267 * pfVar1[1] + fVar242 * pfVar3[1];
    auVar395._0_8_ = CONCAT44(fVar399,fVar393);
    auVar395._8_4_ = fVar359 * pfVar1[2] + fVar261 * pfVar3[2];
    auVar395._12_4_ = fVar260 * pfVar1[3] + fVar273 * pfVar3[3];
    pfVar1 = (float *)(lVar146 + lVar143 * (uVar144 + 3));
    fVar367 = fVar248 * *pfVar1 + fVar272 * *pfVar4;
    fVar380 = fVar267 * pfVar1[1] + fVar242 * pfVar4[1];
    auVar368._0_8_ = CONCAT44(fVar380,fVar367);
    auVar368._8_4_ = fVar359 * pfVar1[2] + fVar261 * pfVar4[2];
    auVar368._12_4_ = fVar260 * pfVar1[3] + fVar273 * pfVar4[3];
    uVar20 = (uint)pGVar22[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar253 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                             0x1c);
    auVar220 = vinsertps_avx(auVar253,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    auVar231 = vsubps_avx(auVar303,auVar220);
    auVar253 = vshufps_avx(auVar231,auVar231,0);
    auVar216 = vshufps_avx(auVar231,auVar231,0x55);
    auVar231 = vshufps_avx(auVar231,auVar231,0xaa);
    fVar248 = (local_5f0->vx).field_0.m128[0];
    fVar267 = (local_5f0->vx).field_0.m128[1];
    fVar359 = (local_5f0->vx).field_0.m128[2];
    fVar260 = (local_5f0->vx).field_0.m128[3];
    fVar272 = (local_5f0->vy).field_0.m128[0];
    fVar242 = (local_5f0->vy).field_0.m128[1];
    fVar261 = (local_5f0->vy).field_0.m128[2];
    fVar273 = (local_5f0->vy).field_0.m128[3];
    fVar247 = (local_5f0->vz).field_0.m128[0];
    fVar262 = (local_5f0->vz).field_0.m128[1];
    fVar274 = (local_5f0->vz).field_0.m128[2];
    fVar245 = (local_5f0->vz).field_0.m128[3];
    auVar250._0_4_ = auVar253._0_4_ * fVar248 + auVar216._0_4_ * fVar272 + fVar247 * auVar231._0_4_;
    auVar250._4_4_ = auVar253._4_4_ * fVar267 + auVar216._4_4_ * fVar242 + fVar262 * auVar231._4_4_;
    auVar250._8_4_ = auVar253._8_4_ * fVar359 + auVar216._8_4_ * fVar261 + fVar274 * auVar231._8_4_;
    auVar250._12_4_ =
         auVar253._12_4_ * fVar260 + auVar216._12_4_ * fVar273 + fVar245 * auVar231._12_4_;
    auVar253 = vblendps_avx(auVar250,auVar303,8);
    auVar218 = vsubps_avx(auVar389,auVar220);
    auVar216 = vshufps_avx(auVar218,auVar218,0);
    auVar231 = vshufps_avx(auVar218,auVar218,0x55);
    auVar218 = vshufps_avx(auVar218,auVar218,0xaa);
    auVar251._0_8_ =
         CONCAT44(auVar216._4_4_ * fVar267 + auVar231._4_4_ * fVar242 + fVar262 * auVar218._4_4_,
                  auVar216._0_4_ * fVar248 + auVar231._0_4_ * fVar272 + fVar247 * auVar218._0_4_);
    auVar251._8_4_ = auVar216._8_4_ * fVar359 + auVar231._8_4_ * fVar261 + fVar274 * auVar218._8_4_;
    auVar251._12_4_ =
         auVar216._12_4_ * fVar260 + auVar231._12_4_ * fVar273 + fVar245 * auVar218._12_4_;
    auVar216 = vblendps_avx(auVar251,auVar389,8);
    auVar32 = vsubps_avx(auVar395,auVar220);
    auVar231 = vshufps_avx(auVar32,auVar32,0);
    auVar218 = vshufps_avx(auVar32,auVar32,0x55);
    auVar32 = vshufps_avx(auVar32,auVar32,0xaa);
    auVar252._0_4_ = auVar231._0_4_ * fVar248 + auVar218._0_4_ * fVar272 + auVar32._0_4_ * fVar247;
    auVar252._4_4_ = auVar231._4_4_ * fVar267 + auVar218._4_4_ * fVar242 + auVar32._4_4_ * fVar262;
    auVar252._8_4_ = auVar231._8_4_ * fVar359 + auVar218._8_4_ * fVar261 + auVar32._8_4_ * fVar274;
    auVar252._12_4_ =
         auVar231._12_4_ * fVar260 + auVar218._12_4_ * fVar273 + auVar32._12_4_ * fVar245;
    auVar231 = vblendps_avx(auVar252,auVar395,8);
    auVar32 = vsubps_avx(auVar368,auVar220);
    auVar220 = vshufps_avx(auVar32,auVar32,0);
    auVar218 = vshufps_avx(auVar32,auVar32,0x55);
    auVar32 = vshufps_avx(auVar32,auVar32,0xaa);
    auVar190._0_4_ = auVar220._0_4_ * fVar248 + auVar218._0_4_ * fVar272 + fVar247 * auVar32._0_4_;
    auVar190._4_4_ = auVar220._4_4_ * fVar267 + auVar218._4_4_ * fVar242 + fVar262 * auVar32._4_4_;
    auVar190._8_4_ = auVar220._8_4_ * fVar359 + auVar218._8_4_ * fVar261 + fVar274 * auVar32._8_4_;
    auVar190._12_4_ =
         auVar220._12_4_ * fVar260 + auVar218._12_4_ * fVar273 + fVar245 * auVar32._12_4_;
    auVar220 = vblendps_avx(auVar190,auVar368,8);
    auVar229._8_4_ = 0x7fffffff;
    auVar229._0_8_ = 0x7fffffff7fffffff;
    auVar229._12_4_ = 0x7fffffff;
    auVar253 = vandps_avx(auVar253,auVar229);
    auVar216 = vandps_avx(auVar216,auVar229);
    auVar218 = vmaxps_avx(auVar253,auVar216);
    auVar253 = vandps_avx(auVar231,auVar229);
    auVar216 = vandps_avx(auVar220,auVar229);
    auVar253 = vmaxps_avx(auVar253,auVar216);
    auVar253 = vmaxps_avx(auVar218,auVar253);
    auVar216 = vmovshdup_avx(auVar253);
    auVar216 = vmaxss_avx(auVar216,auVar253);
    auVar253 = vshufpd_avx(auVar253,auVar253,1);
    auVar253 = vmaxss_avx(auVar253,auVar216);
    local_7e0._0_4_ = auVar253._0_4_;
    auVar148 = (undefined1  [8])(long)(int)uVar20;
    lVar143 = (long)auVar148 * 0x44;
    fVar359 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar143 + 0x908);
    fVar242 = *(float *)(bezier_basis0 + lVar143 + 0x90c);
    fVar262 = *(float *)(bezier_basis0 + lVar143 + 0x910);
    fVar274 = *(float *)(bezier_basis0 + lVar143 + 0x914);
    fVar245 = *(float *)(bezier_basis0 + lVar143 + 0x918);
    fVar275 = *(float *)(bezier_basis0 + lVar143 + 0x91c);
    fVar264 = *(float *)(bezier_basis0 + lVar143 + 0x920);
    auVar134 = *(undefined1 (*) [28])(bezier_basis0 + lVar143 + 0x908);
    fVar276 = *(float *)(bezier_basis0 + lVar143 + 0x924);
    auVar216 = vshufps_avx(auVar252,auVar252,0);
    auVar231 = vshufps_avx(auVar252,auVar252,0x55);
    register0x00001290 = auVar231;
    _local_700 = auVar231;
    fVar265 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar143 + 0xd8c);
    fVar277 = *(float *)(bezier_basis0 + lVar143 + 0xd90);
    fVar278 = *(float *)(bezier_basis0 + lVar143 + 0xd94);
    fVar287 = *(float *)(bezier_basis0 + lVar143 + 0xd98);
    fVar289 = *(float *)(bezier_basis0 + lVar143 + 0xd9c);
    fVar291 = *(float *)(bezier_basis0 + lVar143 + 0xda0);
    fVar293 = *(float *)(bezier_basis0 + lVar143 + 0xda4);
    auVar133 = *(undefined1 (*) [28])(bezier_basis0 + lVar143 + 0xd8c);
    auVar220 = vshufps_avx(auVar190,auVar190,0);
    register0x00001550 = auVar220;
    _local_4c0 = auVar220;
    fVar347 = auVar220._0_4_;
    fVar349 = auVar220._4_4_;
    fVar294 = auVar220._8_4_;
    fVar297 = auVar220._12_4_;
    fVar188 = auVar216._0_4_;
    fVar207 = auVar216._4_4_;
    fVar208 = auVar216._8_4_;
    fVar209 = auVar216._12_4_;
    auVar216 = vshufps_avx(auVar190,auVar190,0x55);
    fVar248 = auVar216._0_4_;
    fVar272 = auVar216._4_4_;
    fVar247 = auVar216._8_4_;
    fVar263 = auVar216._12_4_;
    fVar211 = auVar231._0_4_;
    fVar279 = auVar231._4_4_;
    fVar288 = auVar231._8_4_;
    fVar290 = auVar231._12_4_;
    auVar216 = vshufps_avx(auVar395,auVar395,0xff);
    register0x00001490 = auVar216;
    _local_a0 = auVar216;
    auVar231 = vshufps_avx(auVar368,auVar368,0xff);
    register0x000013d0 = auVar231;
    _local_c0 = auVar231;
    fVar267 = auVar231._0_4_;
    fVar260 = auVar231._4_4_;
    fVar261 = auVar231._8_4_;
    fVar273 = auVar231._12_4_;
    fVar186 = auVar216._0_4_;
    fVar266 = auVar216._4_4_;
    fVar329 = auVar216._8_4_;
    auVar128._8_4_ = auVar251._8_4_;
    auVar128._0_8_ = auVar251._0_8_;
    auVar128._12_4_ = auVar251._12_4_;
    auVar231 = vshufps_avx(auVar128,auVar128,0);
    local_7a0._16_16_ = auVar231;
    local_7a0._0_16_ = auVar231;
    fVar325 = *(float *)(bezier_basis0 + lVar143 + 0x484);
    fVar243 = *(float *)(bezier_basis0 + lVar143 + 0x488);
    fVar313 = *(float *)(bezier_basis0 + lVar143 + 0x48c);
    fVar326 = *(float *)(bezier_basis0 + lVar143 + 0x490);
    fStack_530 = *(float *)(bezier_basis0 + lVar143 + 0x494);
    fStack_52c = *(float *)(bezier_basis0 + lVar143 + 0x498);
    fStack_528 = *(float *)(bezier_basis0 + lVar143 + 0x49c);
    fStack_524 = *(float *)(bezier_basis0 + lVar143 + 0x4a0);
    fVar340 = auVar231._0_4_;
    fVar300 = auVar231._4_4_;
    fVar343 = auVar231._8_4_;
    fVar345 = auVar231._12_4_;
    auVar231 = vshufps_avx(auVar128,auVar128,0x55);
    register0x00001210 = auVar231;
    _local_780 = auVar231;
    fVar150 = auVar231._0_4_;
    fVar173 = auVar231._4_4_;
    fVar175 = auVar231._8_4_;
    fVar178 = auVar231._12_4_;
    auVar231 = vshufps_avx(auVar389,auVar389,0xff);
    register0x00001590 = auVar231;
    _local_280 = auVar231;
    fVar299 = auVar231._0_4_;
    fVar301 = auVar231._4_4_;
    fVar311 = auVar231._8_4_;
    fVar312 = auVar231._12_4_;
    auVar231 = vshufps_avx(auVar250,auVar250,0);
    register0x00001310 = auVar231;
    _local_420 = auVar231;
    fVar296 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar143);
    fVar298 = *(float *)(bezier_basis0 + lVar143 + 4);
    fVar292 = *(float *)(bezier_basis0 + lVar143 + 8);
    fVar244 = *(float *)(bezier_basis0 + lVar143 + 0xc);
    fVar315 = *(float *)(bezier_basis0 + lVar143 + 0x10);
    fVar327 = *(float *)(bezier_basis0 + lVar143 + 0x14);
    fVar328 = *(float *)(bezier_basis0 + lVar143 + 0x18);
    auVar135 = *(undefined1 (*) [28])(bezier_basis0 + lVar143);
    fVar151 = auVar231._0_4_;
    fVar174 = auVar231._4_4_;
    fVar177 = auVar231._8_4_;
    fVar180 = auVar231._12_4_;
    auVar320._0_4_ = fVar151 * fVar296 + fVar340 * fVar325 + fVar188 * fVar359 + fVar347 * fVar265;
    auVar320._4_4_ = fVar174 * fVar298 + fVar300 * fVar243 + fVar207 * fVar242 + fVar349 * fVar277;
    auVar320._8_4_ = fVar177 * fVar292 + fVar343 * fVar313 + fVar208 * fVar262 + fVar294 * fVar278;
    auVar320._12_4_ = fVar180 * fVar244 + fVar345 * fVar326 + fVar209 * fVar274 + fVar297 * fVar287;
    auVar320._16_4_ =
         fVar151 * fVar315 + fVar340 * fStack_530 + fVar188 * fVar245 + fVar347 * fVar289;
    auVar320._20_4_ =
         fVar174 * fVar327 + fVar300 * fStack_52c + fVar207 * fVar275 + fVar349 * fVar291;
    auVar320._24_4_ =
         fVar177 * fVar328 + fVar343 * fStack_528 + fVar208 * fVar264 + fVar294 * fVar293;
    auVar320._28_4_ = fVar276 + fVar209 + 0.0 + 0.0;
    auVar231 = vshufps_avx(auVar250,auVar250,0x55);
    auVar396._16_16_ = auVar231;
    auVar396._0_16_ = auVar231;
    fVar394 = auVar231._0_4_;
    fVar400 = auVar231._4_4_;
    fVar401 = auVar231._8_4_;
    fVar402 = auVar231._12_4_;
    auVar374._0_4_ = fVar394 * fVar296 + fVar150 * fVar325 + fVar211 * fVar359 + fVar265 * fVar248;
    auVar374._4_4_ = fVar400 * fVar298 + fVar173 * fVar243 + fVar279 * fVar242 + fVar277 * fVar272;
    auVar374._8_4_ = fVar401 * fVar292 + fVar175 * fVar313 + fVar288 * fVar262 + fVar278 * fVar247;
    auVar374._12_4_ = fVar402 * fVar244 + fVar178 * fVar326 + fVar290 * fVar274 + fVar287 * fVar263;
    auVar374._16_4_ =
         fVar394 * fVar315 + fVar150 * fStack_530 + fVar211 * fVar245 + fVar289 * fVar248;
    auVar374._20_4_ =
         fVar400 * fVar327 + fVar173 * fStack_52c + fVar279 * fVar275 + fVar291 * fVar272;
    auVar374._24_4_ =
         fVar401 * fVar328 + fVar175 * fStack_528 + fVar288 * fVar264 + fVar293 * fVar247;
    auVar374._28_4_ = fVar178 + fVar290 + fVar263 + 0.0;
    auVar231 = vpermilps_avx(auVar303,0xff);
    register0x00001450 = auVar231;
    _local_2a0 = auVar231;
    fVar182 = auVar231._0_4_;
    fVar184 = auVar231._4_4_;
    fVar185 = auVar231._8_4_;
    auVar159._0_4_ = fVar182 * fVar296 + fVar299 * fVar325 + fVar186 * fVar359 + fVar265 * fVar267;
    auVar159._4_4_ = fVar184 * fVar298 + fVar301 * fVar243 + fVar266 * fVar242 + fVar277 * fVar260;
    auVar159._8_4_ = fVar185 * fVar292 + fVar311 * fVar313 + fVar329 * fVar262 + fVar278 * fVar261;
    auVar159._12_4_ =
         auVar231._12_4_ * fVar244 +
         fVar312 * fVar326 + auVar216._12_4_ * fVar274 + fVar287 * fVar273;
    auVar159._16_4_ =
         fVar182 * fVar315 + fVar299 * fStack_530 + fVar186 * fVar245 + fVar289 * fVar267;
    auVar159._20_4_ =
         fVar184 * fVar327 + fVar301 * fStack_52c + fVar266 * fVar275 + fVar291 * fVar260;
    auVar159._24_4_ =
         fVar185 * fVar328 + fVar311 * fStack_528 + fVar329 * fVar264 + fVar293 * fVar261;
    auVar159._28_4_ = 0;
    fVar292 = *(float *)(bezier_basis1 + lVar143 + 0x908);
    fVar244 = *(float *)(bezier_basis1 + lVar143 + 0x90c);
    fVar315 = *(float *)(bezier_basis1 + lVar143 + 0x910);
    fVar327 = *(float *)(bezier_basis1 + lVar143 + 0x914);
    fVar328 = *(float *)(bezier_basis1 + lVar143 + 0x918);
    fVar246 = *(float *)(bezier_basis1 + lVar143 + 0x91c);
    fVar210 = *(float *)(bezier_basis1 + lVar143 + 0x920);
    fVar274 = *(float *)*(undefined1 (*) [28])(bezier_basis1 + lVar143 + 0xd8c);
    fVar245 = *(float *)(bezier_basis1 + lVar143 + 0xd90);
    fVar264 = *(float *)(bezier_basis1 + lVar143 + 0xd94);
    fVar277 = *(float *)(bezier_basis1 + lVar143 + 0xd98);
    fVar278 = *(float *)(bezier_basis1 + lVar143 + 0xd9c);
    fVar289 = *(float *)(bezier_basis1 + lVar143 + 0xda0);
    fVar291 = *(float *)(bezier_basis1 + lVar143 + 0xda4);
    auVar136 = *(undefined1 (*) [28])(bezier_basis1 + lVar143 + 0xd8c);
    auVar26 = *(undefined1 (*) [32])(bezier_basis1 + lVar143 + 0x484);
    auVar286 = ZEXT3264(auVar26);
    fVar359 = auVar26._0_4_;
    fVar242 = auVar26._4_4_;
    fVar262 = auVar26._8_4_;
    fVar275 = auVar26._12_4_;
    fVar265 = auVar26._16_4_;
    fVar287 = auVar26._20_4_;
    fVar293 = auVar26._24_4_;
    fVar298 = fVar297 + fVar276 + 0.0;
    fVar295 = *(float *)(bezier_basis1 + lVar143);
    fVar351 = *(float *)(bezier_basis1 + lVar143 + 4);
    fVar176 = *(float *)(bezier_basis1 + lVar143 + 8);
    fVar179 = *(float *)(bezier_basis1 + lVar143 + 0xc);
    fVar181 = *(float *)(bezier_basis1 + lVar143 + 0x10);
    fVar183 = *(float *)(bezier_basis1 + lVar143 + 0x14);
    fVar187 = *(float *)(bezier_basis1 + lVar143 + 0x18);
    auVar255._0_4_ = fVar151 * fVar295 + fVar340 * fVar359 + fVar292 * fVar188 + fVar347 * fVar274;
    auVar255._4_4_ = fVar174 * fVar351 + fVar300 * fVar242 + fVar244 * fVar207 + fVar349 * fVar245;
    auVar255._8_4_ = fVar177 * fVar176 + fVar343 * fVar262 + fVar315 * fVar208 + fVar294 * fVar264;
    auVar255._12_4_ = fVar180 * fVar179 + fVar345 * fVar275 + fVar327 * fVar209 + fVar297 * fVar277;
    auVar255._16_4_ = fVar151 * fVar181 + fVar340 * fVar265 + fVar328 * fVar188 + fVar347 * fVar278;
    auVar255._20_4_ = fVar174 * fVar183 + fVar300 * fVar287 + fVar246 * fVar207 + fVar349 * fVar289;
    auVar255._24_4_ = fVar177 * fVar187 + fVar343 * fVar293 + fVar210 * fVar208 + fVar294 * fVar291;
    auVar255._28_4_ = fVar312 + fVar298;
    local_6c0._0_4_ = fVar394 * fVar295 + fVar150 * fVar359 + fVar292 * fVar211 + fVar274 * fVar248;
    local_6c0._4_4_ = fVar400 * fVar351 + fVar173 * fVar242 + fVar244 * fVar279 + fVar245 * fVar272;
    fStack_6b8 = fVar401 * fVar176 + fVar175 * fVar262 + fVar315 * fVar288 + fVar264 * fVar247;
    fStack_6b4 = fVar402 * fVar179 + fVar178 * fVar275 + fVar327 * fVar290 + fVar277 * fVar263;
    auVar235._16_4_ = fVar394 * fVar181 + fVar150 * fVar265 + fVar328 * fVar211 + fVar278 * fVar248;
    auVar235._0_16_ = _local_6c0;
    auVar235._20_4_ = fVar400 * fVar183 + fVar173 * fVar287 + fVar246 * fVar279 + fVar289 * fVar272;
    auVar235._24_4_ = fVar401 * fVar187 + fVar175 * fVar293 + fVar210 * fVar288 + fVar291 * fVar247;
    auVar235._28_4_ = fVar298 + fVar297 + fVar276 + 0.0;
    local_800._0_4_ = fVar299 * fVar359 + fVar186 * fVar292 + fVar267 * fVar274 + fVar182 * fVar295;
    local_800._4_4_ = fVar301 * fVar242 + fVar266 * fVar244 + fVar260 * fVar245 + fVar184 * fVar351;
    local_800._8_4_ = fVar311 * fVar262 + fVar329 * fVar315 + fVar261 * fVar264 + fVar185 * fVar176;
    local_800._12_4_ =
         fVar312 * fVar275 + auVar216._12_4_ * fVar327 + fVar273 * fVar277 +
         auVar231._12_4_ * fVar179;
    local_800._16_4_ = fVar299 * fVar265 + fVar186 * fVar328 + fVar267 * fVar278 + fVar182 * fVar181
    ;
    local_800._20_4_ = fVar301 * fVar287 + fVar266 * fVar246 + fVar260 * fVar289 + fVar184 * fVar183
    ;
    local_800._24_4_ = fVar311 * fVar293 + fVar329 * fVar210 + fVar261 * fVar291 + fVar185 * fVar187
    ;
    local_800._28_4_ = fVar297 + fVar273 + fVar276 + fVar298;
    auVar28 = vsubps_avx(auVar255,auVar320);
    auVar29 = vsubps_avx(auVar235,auVar374);
    fVar267 = auVar28._0_4_;
    fVar261 = auVar28._4_4_;
    auVar43._4_4_ = auVar374._4_4_ * fVar261;
    auVar43._0_4_ = auVar374._0_4_ * fVar267;
    fVar274 = auVar28._8_4_;
    auVar43._8_4_ = auVar374._8_4_ * fVar274;
    fVar264 = auVar28._12_4_;
    auVar43._12_4_ = auVar374._12_4_ * fVar264;
    fVar277 = auVar28._16_4_;
    auVar43._16_4_ = auVar374._16_4_ * fVar277;
    fVar289 = auVar28._20_4_;
    auVar43._20_4_ = auVar374._20_4_ * fVar289;
    fVar296 = auVar28._24_4_;
    auVar43._24_4_ = auVar374._24_4_ * fVar296;
    auVar43._28_4_ = fVar298;
    fVar260 = auVar29._0_4_;
    fVar273 = auVar29._4_4_;
    auVar44._4_4_ = auVar320._4_4_ * fVar273;
    auVar44._0_4_ = auVar320._0_4_ * fVar260;
    fVar245 = auVar29._8_4_;
    auVar44._8_4_ = auVar320._8_4_ * fVar245;
    fVar276 = auVar29._12_4_;
    auVar44._12_4_ = auVar320._12_4_ * fVar276;
    fVar278 = auVar29._16_4_;
    auVar44._16_4_ = auVar320._16_4_ * fVar278;
    fVar291 = auVar29._20_4_;
    auVar44._20_4_ = auVar320._20_4_ * fVar291;
    fVar298 = auVar29._24_4_;
    auVar44._24_4_ = auVar320._24_4_ * fVar298;
    auVar44._28_4_ = auVar235._28_4_;
    auVar27 = vsubps_avx(auVar43,auVar44);
    auVar321 = vmaxps_avx(auVar159,local_800);
    auVar45._4_4_ = auVar321._4_4_ * auVar321._4_4_ * (fVar261 * fVar261 + fVar273 * fVar273);
    auVar45._0_4_ = auVar321._0_4_ * auVar321._0_4_ * (fVar267 * fVar267 + fVar260 * fVar260);
    auVar45._8_4_ = auVar321._8_4_ * auVar321._8_4_ * (fVar274 * fVar274 + fVar245 * fVar245);
    auVar45._12_4_ = auVar321._12_4_ * auVar321._12_4_ * (fVar264 * fVar264 + fVar276 * fVar276);
    auVar45._16_4_ = auVar321._16_4_ * auVar321._16_4_ * (fVar277 * fVar277 + fVar278 * fVar278);
    auVar45._20_4_ = auVar321._20_4_ * auVar321._20_4_ * (fVar289 * fVar289 + fVar291 * fVar291);
    auVar45._24_4_ = auVar321._24_4_ * auVar321._24_4_ * (fVar296 * fVar296 + fVar298 * fVar298);
    auVar45._28_4_ = auVar29._28_4_ + auVar235._28_4_;
    auVar46._4_4_ = auVar27._4_4_ * auVar27._4_4_;
    auVar46._0_4_ = auVar27._0_4_ * auVar27._0_4_;
    auVar46._8_4_ = auVar27._8_4_ * auVar27._8_4_;
    auVar46._12_4_ = auVar27._12_4_ * auVar27._12_4_;
    auVar46._16_4_ = auVar27._16_4_ * auVar27._16_4_;
    auVar46._20_4_ = auVar27._20_4_ * auVar27._20_4_;
    auVar46._24_4_ = auVar27._24_4_ * auVar27._24_4_;
    auVar46._28_4_ = auVar27._28_4_;
    auVar321 = vcmpps_avx(auVar46,auVar45,2);
    auVar230._0_4_ = (float)(int)uVar20;
    auVar230._4_12_ = auVar216._4_12_;
    local_4e0._0_16_ = auVar230;
    auVar216 = vshufps_avx(auVar230,auVar230,0);
    auVar236._16_16_ = auVar216;
    auVar236._0_16_ = auVar216;
    auVar27 = vcmpps_avx(_DAT_01f7b060,auVar236,1);
    auVar216 = vpermilps_avx(auVar250,0xaa);
    register0x00001450 = auVar216;
    _local_680 = auVar216;
    auVar129._8_4_ = auVar251._8_4_;
    auVar129._0_8_ = auVar251._0_8_;
    auVar129._12_4_ = auVar251._12_4_;
    auVar231 = vpermilps_avx(auVar129,0xaa);
    register0x00001550 = auVar231;
    _local_e0 = auVar231;
    auVar387 = ZEXT3264(_local_e0);
    auVar220 = vpermilps_avx(auVar252,0xaa);
    register0x00001590 = auVar220;
    _local_100 = auVar220;
    auVar218 = vpermilps_avx(auVar190,0xaa);
    register0x00001310 = auVar218;
    _local_400 = auVar218;
    auVar30 = auVar27 & auVar321;
    uVar145 = *(uint *)(ray + k * 4 + 0x60);
    uStack_728 = auVar252._8_8_;
    local_730 = CONCAT44(0,uVar140);
    local_510 = ZEXT416(uVar140);
    local_500._0_16_ = ZEXT416(uVar19);
    auVar253 = ZEXT416((uint)(auVar253._0_4_ * 4.7683716e-07));
    uStack_8e8 = auVar303._8_8_;
    uStack_838 = auVar389._8_8_;
    uStack_848 = auVar395._8_8_;
    uStack_858 = auVar368._8_8_;
    fVar267 = fVar150;
    fVar260 = fVar173;
    fVar261 = fVar175;
    if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar30 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar30 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar30 >> 0x7f,0) == '\0') &&
          (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar30 >> 0xbf,0) == '\0') &&
        (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar30[0x1f]) {
      auVar324 = ZEXT3264(auVar241);
      auVar339 = ZEXT3264(local_7a0);
    }
    else {
      local_440 = vandps_avx(auVar321,auVar27);
      fVar266 = auVar216._0_4_;
      fVar329 = auVar216._4_4_;
      fVar299 = auVar216._8_4_;
      fVar301 = auVar216._12_4_;
      fVar311 = auVar231._0_4_;
      fVar312 = auVar231._4_4_;
      fVar314 = auVar231._8_4_;
      fVar316 = auVar231._12_4_;
      fVar330 = auVar220._0_4_;
      fVar341 = auVar220._4_4_;
      fVar342 = auVar220._8_4_;
      fVar344 = auVar220._12_4_;
      local_560._0_4_ = auVar136._0_4_;
      local_560._4_4_ = auVar136._4_4_;
      fStack_558 = auVar136._8_4_;
      fStack_554 = auVar136._12_4_;
      fStack_550 = auVar136._16_4_;
      fStack_54c = auVar136._20_4_;
      fStack_548 = auVar136._24_4_;
      fVar182 = auVar218._0_4_;
      fVar184 = auVar218._4_4_;
      fVar185 = auVar218._8_4_;
      fVar186 = auVar218._12_4_;
      local_560._0_4_ =
           fVar266 * fVar295 +
           fVar311 * fVar359 + fVar330 * fVar292 + fVar182 * (float)local_560._0_4_;
      local_560._4_4_ =
           fVar329 * fVar351 +
           fVar312 * fVar242 + fVar341 * fVar244 + fVar184 * (float)local_560._4_4_;
      fStack_558 = fVar299 * fVar176 + fVar314 * fVar262 + fVar342 * fVar315 + fVar185 * fStack_558;
      fStack_554 = fVar301 * fVar179 + fVar316 * fVar275 + fVar344 * fVar327 + fVar186 * fStack_554;
      fStack_550 = fVar266 * fVar181 + fVar311 * fVar265 + fVar330 * fVar328 + fVar182 * fStack_550;
      fStack_54c = fVar329 * fVar183 + fVar312 * fVar287 + fVar341 * fVar246 + fVar184 * fStack_54c;
      fStack_548 = fVar299 * fVar187 + fVar314 * fVar293 + fVar342 * fVar210 + fVar185 * fStack_548;
      fStack_544 = local_440._28_4_ +
                   auVar27._28_4_ + *(float *)(bezier_basis1 + lVar143 + 0x924) + 0.0;
      local_5a0._0_4_ = auVar135._0_4_;
      local_5a0._4_4_ = auVar135._4_4_;
      fStack_598 = auVar135._8_4_;
      fStack_594 = auVar135._12_4_;
      fStack_590 = auVar135._16_4_;
      fStack_58c = auVar135._20_4_;
      fStack_588 = auVar135._24_4_;
      local_6e0._0_4_ = auVar134._0_4_;
      local_6e0._4_4_ = auVar134._4_4_;
      uStack_6d8._0_4_ = auVar134._8_4_;
      uStack_6d8._4_4_ = auVar134._12_4_;
      uStack_6d0._0_4_ = auVar134._16_4_;
      uStack_6d0._4_4_ = auVar134._20_4_;
      uStack_6c8._0_4_ = auVar134._24_4_;
      local_8e0._0_4_ = auVar133._0_4_;
      local_8e0._4_4_ = auVar133._4_4_;
      fStack_8d8 = auVar133._8_4_;
      fStack_8d4 = auVar133._12_4_;
      fStack_8d0 = auVar133._16_4_;
      fStack_8cc = auVar133._20_4_;
      fStack_8c8 = auVar133._24_4_;
      local_6e0._0_4_ =
           fVar266 * (float)local_5a0._0_4_ +
           fVar311 * fVar325 + fVar330 * (float)local_6e0._0_4_ + fVar182 * (float)local_8e0._0_4_;
      local_6e0._4_4_ =
           fVar329 * (float)local_5a0._4_4_ +
           fVar312 * fVar243 + fVar341 * (float)local_6e0._4_4_ + fVar184 * (float)local_8e0._4_4_;
      uStack_6d8._0_4_ =
           fVar299 * fStack_598 +
           fVar314 * fVar313 + fVar342 * (float)uStack_6d8 + fVar185 * fStack_8d8;
      uStack_6d8._4_4_ =
           fVar301 * fStack_594 +
           fVar316 * fVar326 + fVar344 * uStack_6d8._4_4_ + fVar186 * fStack_8d4;
      uStack_6d0._0_4_ =
           fVar266 * fStack_590 +
           fVar311 * fStack_530 + fVar330 * (float)uStack_6d0 + fVar182 * fStack_8d0;
      uStack_6d0._4_4_ =
           fVar329 * fStack_58c +
           fVar312 * fStack_52c + fVar341 * uStack_6d0._4_4_ + fVar184 * fStack_8cc;
      uStack_6c8._0_4_ =
           fVar299 * fStack_588 +
           fVar314 * fStack_528 + fVar342 * (float)uStack_6c8 + fVar185 * fStack_8c8;
      uStack_6c8._4_4_ = fVar402 + fStack_544 + local_440._28_4_ + auVar27._28_4_;
      fVar359 = *(float *)(bezier_basis0 + lVar143 + 0x1210);
      fVar242 = *(float *)(bezier_basis0 + lVar143 + 0x1214);
      fVar273 = *(float *)(bezier_basis0 + lVar143 + 0x1218);
      fVar262 = *(float *)(bezier_basis0 + lVar143 + 0x121c);
      fVar274 = *(float *)(bezier_basis0 + lVar143 + 0x1220);
      fVar245 = *(float *)(bezier_basis0 + lVar143 + 0x1224);
      fVar275 = *(float *)(bezier_basis0 + lVar143 + 0x1228);
      fVar264 = *(float *)(bezier_basis0 + lVar143 + 0x1694);
      fVar276 = *(float *)(bezier_basis0 + lVar143 + 0x1698);
      fVar265 = *(float *)(bezier_basis0 + lVar143 + 0x169c);
      fVar277 = *(float *)(bezier_basis0 + lVar143 + 0x16a0);
      fVar278 = *(float *)(bezier_basis0 + lVar143 + 0x16a4);
      fVar287 = *(float *)(bezier_basis0 + lVar143 + 0x16a8);
      fVar289 = *(float *)(bezier_basis0 + lVar143 + 0x16ac);
      fVar291 = *(float *)(bezier_basis0 + lVar143 + 0x1b18);
      fVar293 = *(float *)(bezier_basis0 + lVar143 + 0x1b1c);
      fVar296 = *(float *)(bezier_basis0 + lVar143 + 0x1b20);
      fVar298 = *(float *)(bezier_basis0 + lVar143 + 0x1b24);
      fVar325 = *(float *)(bezier_basis0 + lVar143 + 0x1b28);
      fVar243 = *(float *)(bezier_basis0 + lVar143 + 0x1b2c);
      fVar313 = *(float *)(bezier_basis0 + lVar143 + 0x1b30);
      fVar326 = *(float *)(bezier_basis0 + lVar143 + 0x1f9c);
      fVar292 = *(float *)(bezier_basis0 + lVar143 + 0x1fa0);
      fVar244 = *(float *)(bezier_basis0 + lVar143 + 0x1fa4);
      fVar315 = *(float *)(bezier_basis0 + lVar143 + 0x1fa8);
      fVar327 = *(float *)(bezier_basis0 + lVar143 + 0x1fac);
      fVar328 = *(float *)(bezier_basis0 + lVar143 + 0x1fb0);
      fVar246 = *(float *)(bezier_basis0 + lVar143 + 0x1fb4);
      local_7e0._16_16_ = auVar164._16_16_;
      local_7e0._0_16_ = auVar253;
      fVar295 = fVar301 + auVar26._28_4_;
      fVar210 = *(float *)(bezier_basis0 + lVar143 + 0x1b34) +
                *(float *)(bezier_basis0 + lVar143 + 0x1fb8);
      fVar351 = *(float *)(bezier_basis0 + lVar143 + 0x16b0) + fVar210;
      local_540 = fVar151 * fVar359 + fVar340 * fVar264 + fVar188 * fVar291 + fVar347 * fVar326;
      fStack_53c = fVar174 * fVar242 + fVar300 * fVar276 + fVar207 * fVar293 + fVar349 * fVar292;
      fStack_538 = fVar177 * fVar273 + fVar343 * fVar265 + fVar208 * fVar296 + fVar294 * fVar244;
      fStack_534 = fVar180 * fVar262 + fVar345 * fVar277 + fVar209 * fVar298 + fVar297 * fVar315;
      fStack_530 = fVar151 * fVar274 + fVar340 * fVar278 + fVar188 * fVar325 + fVar347 * fVar327;
      fStack_52c = fVar174 * fVar245 + fVar300 * fVar287 + fVar207 * fVar243 + fVar349 * fVar328;
      fStack_528 = fVar177 * fVar275 + fVar343 * fVar289 + fVar208 * fVar313 + fVar294 * fVar246;
      fStack_524 = *(float *)(bezier_basis0 + lVar143 + 0x16b0) +
                   *(float *)(bezier_basis0 + lVar143 + 0x1fb8) + fVar295;
      auVar196._0_4_ = fVar211 * fVar291 + fVar248 * fVar326 + fVar150 * fVar264 + fVar394 * fVar359
      ;
      auVar196._4_4_ = fVar279 * fVar293 + fVar272 * fVar292 + fVar173 * fVar276 + fVar400 * fVar242
      ;
      auVar196._8_4_ = fVar288 * fVar296 + fVar247 * fVar244 + fVar175 * fVar265 + fVar401 * fVar273
      ;
      auVar196._12_4_ =
           fVar290 * fVar298 + fVar263 * fVar315 + fVar178 * fVar277 + fVar402 * fVar262;
      auVar196._16_4_ =
           fVar211 * fVar325 + fVar248 * fVar327 + fVar150 * fVar278 + fVar394 * fVar274;
      auVar196._20_4_ =
           fVar279 * fVar243 + fVar272 * fVar328 + fVar173 * fVar287 + fVar400 * fVar245;
      auVar196._24_4_ =
           fVar288 * fVar313 + fVar247 * fVar246 + fVar175 * fVar289 + fVar401 * fVar275;
      auVar196._28_4_ = fVar301 + *(float *)(bezier_basis1 + lVar143 + 0x1c) + fVar295 + fVar210;
      local_5a0._4_4_ =
           fVar312 * fVar276 + fVar341 * fVar293 + fVar184 * fVar292 + fVar329 * fVar242;
      local_5a0._0_4_ =
           fVar311 * fVar264 + fVar330 * fVar291 + fVar182 * fVar326 + fVar266 * fVar359;
      fStack_598 = fVar314 * fVar265 + fVar342 * fVar296 + fVar185 * fVar244 + fVar299 * fVar273;
      fStack_594 = fVar316 * fVar277 + fVar344 * fVar298 + fVar186 * fVar315 + fVar301 * fVar262;
      fStack_590 = fVar311 * fVar278 + fVar330 * fVar325 + fVar182 * fVar327 + fVar266 * fVar274;
      fStack_58c = fVar312 * fVar287 + fVar341 * fVar243 + fVar184 * fVar328 + fVar329 * fVar245;
      fStack_588 = fVar314 * fVar289 + fVar342 * fVar313 + fVar185 * fVar246 + fVar299 * fVar275;
      fStack_584 = fVar351 + *(float *)(bezier_basis0 + lVar143 + 0x122c);
      fVar359 = *(float *)(bezier_basis1 + lVar143 + 0x1b18);
      fVar242 = *(float *)(bezier_basis1 + lVar143 + 0x1b1c);
      fVar273 = *(float *)(bezier_basis1 + lVar143 + 0x1b20);
      fVar262 = *(float *)(bezier_basis1 + lVar143 + 0x1b24);
      fVar274 = *(float *)(bezier_basis1 + lVar143 + 0x1b28);
      fVar245 = *(float *)(bezier_basis1 + lVar143 + 0x1b2c);
      fVar275 = *(float *)(bezier_basis1 + lVar143 + 0x1b30);
      fVar264 = *(float *)(bezier_basis1 + lVar143 + 0x1f9c);
      fVar276 = *(float *)(bezier_basis1 + lVar143 + 0x1fa0);
      fVar265 = *(float *)(bezier_basis1 + lVar143 + 0x1fa4);
      fVar277 = *(float *)(bezier_basis1 + lVar143 + 0x1fa8);
      fVar278 = *(float *)(bezier_basis1 + lVar143 + 0x1fac);
      fVar287 = *(float *)(bezier_basis1 + lVar143 + 0x1fb0);
      fVar289 = *(float *)(bezier_basis1 + lVar143 + 0x1fb4);
      fVar291 = *(float *)(bezier_basis1 + lVar143 + 0x1694);
      fVar293 = *(float *)(bezier_basis1 + lVar143 + 0x1698);
      fVar296 = *(float *)(bezier_basis1 + lVar143 + 0x169c);
      fVar298 = *(float *)(bezier_basis1 + lVar143 + 0x16a0);
      fVar325 = *(float *)(bezier_basis1 + lVar143 + 0x16a4);
      fVar243 = *(float *)(bezier_basis1 + lVar143 + 0x16a8);
      fVar313 = *(float *)(bezier_basis1 + lVar143 + 0x16ac);
      fVar326 = *(float *)(bezier_basis1 + lVar143 + 0x1210);
      fVar292 = *(float *)(bezier_basis1 + lVar143 + 0x1214);
      fVar244 = *(float *)(bezier_basis1 + lVar143 + 0x1218);
      fVar315 = *(float *)(bezier_basis1 + lVar143 + 0x121c);
      fVar327 = *(float *)(bezier_basis1 + lVar143 + 0x1220);
      fVar328 = *(float *)(bezier_basis1 + lVar143 + 0x1224);
      fVar246 = *(float *)(bezier_basis1 + lVar143 + 0x1228);
      auVar307._0_4_ = fVar151 * fVar326 + fVar340 * fVar291 + fVar188 * fVar359 + fVar347 * fVar264
      ;
      auVar307._4_4_ = fVar174 * fVar292 + fVar300 * fVar293 + fVar207 * fVar242 + fVar349 * fVar276
      ;
      auVar307._8_4_ = fVar177 * fVar244 + fVar343 * fVar296 + fVar208 * fVar273 + fVar294 * fVar265
      ;
      auVar307._12_4_ =
           fVar180 * fVar315 + fVar345 * fVar298 + fVar209 * fVar262 + fVar297 * fVar277;
      auVar307._16_4_ =
           fVar151 * fVar327 + fVar340 * fVar325 + fVar188 * fVar274 + fVar347 * fVar278;
      auVar307._20_4_ =
           fVar174 * fVar328 + fVar300 * fVar243 + fVar207 * fVar245 + fVar349 * fVar287;
      auVar307._24_4_ =
           fVar177 * fVar246 + fVar343 * fVar313 + fVar208 * fVar275 + fVar294 * fVar289;
      auVar307._28_4_ = fVar290 + fVar290 + fVar351 + fVar297;
      auVar335._0_4_ = fVar394 * fVar326 + fVar150 * fVar291 + fVar211 * fVar359 + fVar248 * fVar264
      ;
      auVar335._4_4_ = fVar400 * fVar292 + fVar173 * fVar293 + fVar279 * fVar242 + fVar272 * fVar276
      ;
      auVar335._8_4_ = fVar401 * fVar244 + fVar175 * fVar296 + fVar288 * fVar273 + fVar247 * fVar265
      ;
      auVar335._12_4_ =
           fVar402 * fVar315 + fVar178 * fVar298 + fVar290 * fVar262 + fVar263 * fVar277;
      auVar335._16_4_ =
           fVar394 * fVar327 + fVar150 * fVar325 + fVar211 * fVar274 + fVar248 * fVar278;
      auVar335._20_4_ =
           fVar400 * fVar328 + fVar173 * fVar243 + fVar279 * fVar245 + fVar272 * fVar287;
      auVar335._24_4_ =
           fVar401 * fVar246 + fVar175 * fVar313 + fVar288 * fVar275 + fVar247 * fVar289;
      auVar335._28_4_ = fVar290 + fVar290 + fVar290 + fVar351;
      auVar224._0_4_ = fVar266 * fVar326 + fVar311 * fVar291 + fVar330 * fVar359 + fVar182 * fVar264
      ;
      auVar224._4_4_ = fVar329 * fVar292 + fVar312 * fVar293 + fVar341 * fVar242 + fVar184 * fVar276
      ;
      auVar224._8_4_ = fVar299 * fVar244 + fVar314 * fVar296 + fVar342 * fVar273 + fVar185 * fVar265
      ;
      auVar224._12_4_ =
           fVar301 * fVar315 + fVar316 * fVar298 + fVar344 * fVar262 + fVar186 * fVar277;
      auVar224._16_4_ =
           fVar266 * fVar327 + fVar311 * fVar325 + fVar330 * fVar274 + fVar182 * fVar278;
      auVar224._20_4_ =
           fVar329 * fVar328 + fVar312 * fVar243 + fVar341 * fVar245 + fVar184 * fVar287;
      auVar224._24_4_ =
           fVar299 * fVar246 + fVar314 * fVar313 + fVar342 * fVar275 + fVar185 * fVar289;
      auVar224._28_4_ =
           *(float *)(bezier_basis1 + lVar143 + 0x122c) +
           *(float *)(bezier_basis1 + lVar143 + 0x16b0) +
           *(float *)(bezier_basis1 + lVar143 + 0x1b34) +
           *(float *)(bezier_basis1 + lVar143 + 0x1fb8);
      auVar256._8_4_ = 0x7fffffff;
      auVar256._0_8_ = 0x7fffffff7fffffff;
      auVar256._12_4_ = 0x7fffffff;
      auVar256._16_4_ = 0x7fffffff;
      auVar256._20_4_ = 0x7fffffff;
      auVar256._24_4_ = 0x7fffffff;
      auVar256._28_4_ = 0x7fffffff;
      auVar132._4_4_ = fStack_53c;
      auVar132._0_4_ = local_540;
      auVar132._8_4_ = fStack_538;
      auVar132._12_4_ = fStack_534;
      auVar132._16_4_ = fStack_530;
      auVar132._20_4_ = fStack_52c;
      auVar132._24_4_ = fStack_528;
      auVar132._28_4_ = fStack_524;
      auVar164 = vandps_avx(auVar132,auVar256);
      auVar26 = vandps_avx(auVar196,auVar256);
      auVar26 = vmaxps_avx(auVar164,auVar26);
      auVar164 = vandps_avx(auVar256,_local_5a0);
      auVar164 = vmaxps_avx(auVar26,auVar164);
      auVar216 = vpermilps_avx(auVar253,0);
      auVar281._16_16_ = auVar216;
      auVar281._0_16_ = auVar216;
      auVar164 = vcmpps_avx(auVar164,auVar281,1);
      auVar321 = vblendvps_avx(auVar132,auVar28,auVar164);
      auVar27 = vblendvps_avx(auVar196,auVar29,auVar164);
      auVar164 = vandps_avx(auVar307,auVar256);
      auVar26 = vandps_avx(auVar335,auVar256);
      auVar30 = vmaxps_avx(auVar164,auVar26);
      auVar164 = vandps_avx(auVar224,auVar256);
      auVar164 = vmaxps_avx(auVar30,auVar164);
      auVar30 = vcmpps_avx(auVar164,auVar281,1);
      auVar164 = vblendvps_avx(auVar307,auVar28,auVar30);
      auVar28 = vblendvps_avx(auVar335,auVar29,auVar30);
      fVar295 = auVar321._0_4_;
      fVar351 = auVar321._4_4_;
      fVar176 = auVar321._8_4_;
      fVar179 = auVar321._12_4_;
      fVar181 = auVar321._16_4_;
      fVar183 = auVar321._20_4_;
      fVar187 = auVar321._24_4_;
      fVar211 = auVar164._0_4_;
      fVar279 = auVar164._4_4_;
      fVar288 = auVar164._8_4_;
      fVar290 = auVar164._12_4_;
      fVar151 = auVar164._16_4_;
      fVar174 = auVar164._20_4_;
      fVar177 = auVar164._24_4_;
      fVar180 = -auVar164._28_4_;
      fVar359 = auVar27._0_4_;
      fVar274 = auVar27._4_4_;
      fVar276 = auVar27._8_4_;
      fVar287 = auVar27._12_4_;
      fVar296 = auVar27._16_4_;
      fVar313 = auVar27._20_4_;
      fVar315 = auVar27._24_4_;
      auVar160._0_4_ = fVar359 * fVar359 + fVar295 * fVar295;
      auVar160._4_4_ = fVar274 * fVar274 + fVar351 * fVar351;
      auVar160._8_4_ = fVar276 * fVar276 + fVar176 * fVar176;
      auVar160._12_4_ = fVar287 * fVar287 + fVar179 * fVar179;
      auVar160._16_4_ = fVar296 * fVar296 + fVar181 * fVar181;
      auVar160._20_4_ = fVar313 * fVar313 + fVar183 * fVar183;
      auVar160._24_4_ = fVar315 * fVar315 + fVar187 * fVar187;
      auVar160._28_4_ = auVar335._28_4_ + auVar321._28_4_;
      auVar321 = vrsqrtps_avx(auVar160);
      fVar242 = auVar321._0_4_;
      fVar273 = auVar321._4_4_;
      auVar47._4_4_ = fVar273 * 1.5;
      auVar47._0_4_ = fVar242 * 1.5;
      fVar262 = auVar321._8_4_;
      auVar47._8_4_ = fVar262 * 1.5;
      fVar245 = auVar321._12_4_;
      auVar47._12_4_ = fVar245 * 1.5;
      fVar275 = auVar321._16_4_;
      auVar47._16_4_ = fVar275 * 1.5;
      fVar264 = auVar321._20_4_;
      auVar47._20_4_ = fVar264 * 1.5;
      fVar265 = auVar321._24_4_;
      fVar210 = auVar26._28_4_;
      auVar47._24_4_ = fVar265 * 1.5;
      auVar47._28_4_ = fVar210;
      auVar48._4_4_ = fVar273 * fVar273 * fVar273 * auVar160._4_4_ * 0.5;
      auVar48._0_4_ = fVar242 * fVar242 * fVar242 * auVar160._0_4_ * 0.5;
      auVar48._8_4_ = fVar262 * fVar262 * fVar262 * auVar160._8_4_ * 0.5;
      auVar48._12_4_ = fVar245 * fVar245 * fVar245 * auVar160._12_4_ * 0.5;
      auVar48._16_4_ = fVar275 * fVar275 * fVar275 * auVar160._16_4_ * 0.5;
      auVar48._20_4_ = fVar264 * fVar264 * fVar264 * auVar160._20_4_ * 0.5;
      auVar48._24_4_ = fVar265 * fVar265 * fVar265 * auVar160._24_4_ * 0.5;
      auVar48._28_4_ = auVar160._28_4_;
      auVar26 = vsubps_avx(auVar47,auVar48);
      fVar242 = auVar26._0_4_;
      fVar245 = auVar26._4_4_;
      fVar265 = auVar26._8_4_;
      fVar289 = auVar26._12_4_;
      fVar298 = auVar26._16_4_;
      fVar326 = auVar26._20_4_;
      fVar327 = auVar26._24_4_;
      fVar273 = auVar28._0_4_;
      fVar275 = auVar28._4_4_;
      fVar277 = auVar28._8_4_;
      fVar291 = auVar28._12_4_;
      fVar325 = auVar28._16_4_;
      fVar292 = auVar28._20_4_;
      fVar328 = auVar28._24_4_;
      auVar161._0_4_ = fVar273 * fVar273 + fVar211 * fVar211;
      auVar161._4_4_ = fVar275 * fVar275 + fVar279 * fVar279;
      auVar161._8_4_ = fVar277 * fVar277 + fVar288 * fVar288;
      auVar161._12_4_ = fVar291 * fVar291 + fVar290 * fVar290;
      auVar161._16_4_ = fVar325 * fVar325 + fVar151 * fVar151;
      auVar161._20_4_ = fVar292 * fVar292 + fVar174 * fVar174;
      auVar161._24_4_ = fVar328 * fVar328 + fVar177 * fVar177;
      auVar161._28_4_ = auVar164._28_4_ + auVar26._28_4_;
      auVar164 = vrsqrtps_avx(auVar161);
      fVar262 = auVar164._0_4_;
      fVar264 = auVar164._4_4_;
      auVar49._4_4_ = fVar264 * 1.5;
      auVar49._0_4_ = fVar262 * 1.5;
      fVar278 = auVar164._8_4_;
      auVar49._8_4_ = fVar278 * 1.5;
      fVar293 = auVar164._12_4_;
      auVar49._12_4_ = fVar293 * 1.5;
      fVar243 = auVar164._16_4_;
      auVar49._16_4_ = fVar243 * 1.5;
      fVar244 = auVar164._20_4_;
      auVar49._20_4_ = fVar244 * 1.5;
      fVar246 = auVar164._24_4_;
      auVar49._24_4_ = fVar246 * 1.5;
      auVar49._28_4_ = fVar210;
      auVar50._4_4_ = fVar264 * fVar264 * fVar264 * auVar161._4_4_ * 0.5;
      auVar50._0_4_ = fVar262 * fVar262 * fVar262 * auVar161._0_4_ * 0.5;
      auVar50._8_4_ = fVar278 * fVar278 * fVar278 * auVar161._8_4_ * 0.5;
      auVar50._12_4_ = fVar293 * fVar293 * fVar293 * auVar161._12_4_ * 0.5;
      auVar50._16_4_ = fVar243 * fVar243 * fVar243 * auVar161._16_4_ * 0.5;
      auVar50._20_4_ = fVar244 * fVar244 * fVar244 * auVar161._20_4_ * 0.5;
      auVar50._24_4_ = fVar246 * fVar246 * fVar246 * auVar161._24_4_ * 0.5;
      auVar50._28_4_ = auVar161._28_4_;
      auVar164 = vsubps_avx(auVar49,auVar50);
      fVar262 = auVar164._0_4_;
      fVar264 = auVar164._4_4_;
      fVar278 = auVar164._8_4_;
      fVar293 = auVar164._12_4_;
      fVar243 = auVar164._16_4_;
      fVar244 = auVar164._20_4_;
      fVar246 = auVar164._24_4_;
      fVar359 = auVar159._0_4_ * fVar359 * fVar242;
      fVar274 = auVar159._4_4_ * fVar274 * fVar245;
      auVar51._4_4_ = fVar274;
      auVar51._0_4_ = fVar359;
      fVar276 = auVar159._8_4_ * fVar276 * fVar265;
      auVar51._8_4_ = fVar276;
      fVar287 = auVar159._12_4_ * fVar287 * fVar289;
      auVar51._12_4_ = fVar287;
      fVar296 = auVar159._16_4_ * fVar296 * fVar298;
      auVar51._16_4_ = fVar296;
      fVar313 = auVar159._20_4_ * fVar313 * fVar326;
      auVar51._20_4_ = fVar313;
      fVar315 = auVar159._24_4_ * fVar315 * fVar327;
      auVar51._24_4_ = fVar315;
      auVar51._28_4_ = fVar180;
      local_8e0._4_4_ = auVar320._4_4_ + fVar274;
      local_8e0._0_4_ = auVar320._0_4_ + fVar359;
      fStack_8d8 = auVar320._8_4_ + fVar276;
      fStack_8d4 = auVar320._12_4_ + fVar287;
      fStack_8d0 = auVar320._16_4_ + fVar296;
      fStack_8cc = auVar320._20_4_ + fVar313;
      fStack_8c8 = auVar320._24_4_ + fVar315;
      fStack_8c4 = auVar320._28_4_ + fVar180;
      fVar359 = auVar159._0_4_ * fVar242 * -fVar295;
      fVar274 = auVar159._4_4_ * fVar245 * -fVar351;
      auVar52._4_4_ = fVar274;
      auVar52._0_4_ = fVar359;
      fVar276 = auVar159._8_4_ * fVar265 * -fVar176;
      auVar52._8_4_ = fVar276;
      fVar287 = auVar159._12_4_ * fVar289 * -fVar179;
      auVar52._12_4_ = fVar287;
      fVar296 = auVar159._16_4_ * fVar298 * -fVar181;
      auVar52._16_4_ = fVar296;
      fVar313 = auVar159._20_4_ * fVar326 * -fVar183;
      auVar52._20_4_ = fVar313;
      fVar315 = auVar159._24_4_ * fVar327 * -fVar187;
      auVar52._24_4_ = fVar315;
      auVar52._28_4_ = fVar210;
      local_660._4_4_ = fVar274 + auVar374._4_4_;
      local_660._0_4_ = fVar359 + auVar374._0_4_;
      fStack_658 = fVar276 + auVar374._8_4_;
      fStack_654 = fVar287 + auVar374._12_4_;
      fStack_650 = fVar296 + auVar374._16_4_;
      fStack_64c = fVar313 + auVar374._20_4_;
      fStack_648 = fVar315 + auVar374._24_4_;
      fStack_644 = fVar210 + auVar374._28_4_;
      fVar359 = fVar242 * 0.0 * auVar159._0_4_;
      fVar242 = fVar245 * 0.0 * auVar159._4_4_;
      auVar53._4_4_ = fVar242;
      auVar53._0_4_ = fVar359;
      fVar274 = fVar265 * 0.0 * auVar159._8_4_;
      auVar53._8_4_ = fVar274;
      fVar245 = fVar289 * 0.0 * auVar159._12_4_;
      auVar53._12_4_ = fVar245;
      fVar276 = fVar298 * 0.0 * auVar159._16_4_;
      auVar53._16_4_ = fVar276;
      fVar265 = fVar326 * 0.0 * auVar159._20_4_;
      auVar53._20_4_ = fVar265;
      fVar287 = fVar327 * 0.0 * auVar159._24_4_;
      auVar53._24_4_ = fVar287;
      auVar53._28_4_ = fVar209;
      auVar282._0_4_ = fVar359 + (float)local_6e0._0_4_;
      auVar282._4_4_ = fVar242 + (float)local_6e0._4_4_;
      auVar282._8_4_ = fVar274 + (float)uStack_6d8;
      auVar282._12_4_ = fVar245 + uStack_6d8._4_4_;
      auVar282._16_4_ = fVar276 + (float)uStack_6d0;
      auVar282._20_4_ = fVar265 + uStack_6d0._4_4_;
      auVar282._24_4_ = fVar287 + (float)uStack_6c8;
      auVar282._28_4_ = fVar209 + uStack_6c8._4_4_;
      fVar359 = local_800._0_4_ * fVar273 * fVar262;
      fVar242 = local_800._4_4_ * fVar275 * fVar264;
      auVar54._4_4_ = fVar242;
      auVar54._0_4_ = fVar359;
      fVar273 = local_800._8_4_ * fVar277 * fVar278;
      auVar54._8_4_ = fVar273;
      fVar274 = local_800._12_4_ * fVar291 * fVar293;
      auVar54._12_4_ = fVar274;
      fVar245 = local_800._16_4_ * fVar325 * fVar243;
      auVar54._16_4_ = fVar245;
      fVar275 = local_800._20_4_ * fVar292 * fVar244;
      auVar54._20_4_ = fVar275;
      fVar276 = local_800._24_4_ * fVar328 * fVar246;
      auVar54._24_4_ = fVar276;
      auVar54._28_4_ = auVar28._28_4_;
      auVar30 = vsubps_avx(auVar320,auVar51);
      auVar336._0_4_ = auVar255._0_4_ + fVar359;
      auVar336._4_4_ = auVar255._4_4_ + fVar242;
      auVar336._8_4_ = auVar255._8_4_ + fVar273;
      auVar336._12_4_ = auVar255._12_4_ + fVar274;
      auVar336._16_4_ = auVar255._16_4_ + fVar245;
      auVar336._20_4_ = auVar255._20_4_ + fVar275;
      auVar336._24_4_ = auVar255._24_4_ + fVar276;
      auVar336._28_4_ = auVar255._28_4_ + auVar28._28_4_;
      fVar359 = local_800._0_4_ * fVar262 * -fVar211;
      fVar242 = local_800._4_4_ * fVar264 * -fVar279;
      auVar55._4_4_ = fVar242;
      auVar55._0_4_ = fVar359;
      fVar273 = local_800._8_4_ * fVar278 * -fVar288;
      auVar55._8_4_ = fVar273;
      fVar274 = local_800._12_4_ * fVar293 * -fVar290;
      auVar55._12_4_ = fVar274;
      fVar245 = local_800._16_4_ * fVar243 * -fVar151;
      auVar55._16_4_ = fVar245;
      fVar275 = local_800._20_4_ * fVar244 * -fVar174;
      auVar55._20_4_ = fVar275;
      fVar276 = local_800._24_4_ * fVar246 * -fVar177;
      auVar55._24_4_ = fVar276;
      auVar55._28_4_ = fVar316;
      auVar31 = vsubps_avx(auVar374,auVar52);
      auVar357._0_4_ = (float)local_6c0._0_4_ + fVar359;
      auVar357._4_4_ = (float)local_6c0._4_4_ + fVar242;
      auVar357._8_4_ = fStack_6b8 + fVar273;
      auVar357._12_4_ = fStack_6b4 + fVar274;
      auVar357._16_4_ = auVar235._16_4_ + fVar245;
      auVar357._20_4_ = auVar235._20_4_ + fVar275;
      auVar357._24_4_ = auVar235._24_4_ + fVar276;
      auVar357._28_4_ = auVar235._28_4_ + fVar316;
      fVar359 = local_800._0_4_ * fVar262 * 0.0;
      fVar242 = local_800._4_4_ * fVar264 * 0.0;
      auVar56._4_4_ = fVar242;
      auVar56._0_4_ = fVar359;
      fVar273 = local_800._8_4_ * fVar278 * 0.0;
      auVar56._8_4_ = fVar273;
      fVar262 = local_800._12_4_ * fVar293 * 0.0;
      auVar56._12_4_ = fVar262;
      fVar274 = local_800._16_4_ * fVar243 * 0.0;
      auVar56._16_4_ = fVar274;
      fVar245 = local_800._20_4_ * fVar244 * 0.0;
      auVar56._20_4_ = fVar245;
      fVar275 = local_800._24_4_ * fVar246 * 0.0;
      auVar56._24_4_ = fVar275;
      auVar56._28_4_ = 0x3f000000;
      auVar41 = vsubps_avx(_local_6e0,auVar53);
      auVar391._0_4_ = fVar359 + (float)local_560._0_4_;
      auVar391._4_4_ = fVar242 + (float)local_560._4_4_;
      auVar391._8_4_ = fVar273 + fStack_558;
      auVar391._12_4_ = fVar262 + fStack_554;
      auVar391._16_4_ = fVar274 + fStack_550;
      auVar391._20_4_ = fVar245 + fStack_54c;
      auVar391._24_4_ = fVar275 + fStack_548;
      auVar391._28_4_ = fStack_544 + 0.5;
      auVar164 = vsubps_avx(auVar255,auVar54);
      auVar26 = vsubps_avx(auVar235,auVar55);
      auVar156 = vsubps_avx(_local_560,auVar56);
      auVar321 = vsubps_avx(auVar357,auVar31);
      auVar27 = vsubps_avx(auVar391,auVar41);
      auVar57._4_4_ = auVar41._4_4_ * auVar321._4_4_;
      auVar57._0_4_ = auVar41._0_4_ * auVar321._0_4_;
      auVar57._8_4_ = auVar41._8_4_ * auVar321._8_4_;
      auVar57._12_4_ = auVar41._12_4_ * auVar321._12_4_;
      auVar57._16_4_ = auVar41._16_4_ * auVar321._16_4_;
      auVar57._20_4_ = auVar41._20_4_ * auVar321._20_4_;
      auVar57._24_4_ = auVar41._24_4_ * auVar321._24_4_;
      auVar57._28_4_ = auVar235._28_4_;
      auVar58._4_4_ = auVar31._4_4_ * auVar27._4_4_;
      auVar58._0_4_ = auVar31._0_4_ * auVar27._0_4_;
      auVar58._8_4_ = auVar31._8_4_ * auVar27._8_4_;
      auVar58._12_4_ = auVar31._12_4_ * auVar27._12_4_;
      auVar58._16_4_ = auVar31._16_4_ * auVar27._16_4_;
      auVar58._20_4_ = auVar31._20_4_ * auVar27._20_4_;
      auVar58._24_4_ = auVar31._24_4_ * auVar27._24_4_;
      auVar58._28_4_ = fStack_544;
      auVar28 = vsubps_avx(auVar58,auVar57);
      auVar59._4_4_ = auVar30._4_4_ * auVar27._4_4_;
      auVar59._0_4_ = auVar30._0_4_ * auVar27._0_4_;
      auVar59._8_4_ = auVar30._8_4_ * auVar27._8_4_;
      auVar59._12_4_ = auVar30._12_4_ * auVar27._12_4_;
      auVar59._16_4_ = auVar30._16_4_ * auVar27._16_4_;
      auVar59._20_4_ = auVar30._20_4_ * auVar27._20_4_;
      auVar59._24_4_ = auVar30._24_4_ * auVar27._24_4_;
      auVar59._28_4_ = auVar27._28_4_;
      auVar29 = vsubps_avx(auVar336,auVar30);
      auVar60._4_4_ = auVar41._4_4_ * auVar29._4_4_;
      auVar60._0_4_ = auVar41._0_4_ * auVar29._0_4_;
      auVar60._8_4_ = auVar41._8_4_ * auVar29._8_4_;
      auVar60._12_4_ = auVar41._12_4_ * auVar29._12_4_;
      auVar60._16_4_ = auVar41._16_4_ * auVar29._16_4_;
      auVar60._20_4_ = auVar41._20_4_ * auVar29._20_4_;
      auVar60._24_4_ = auVar41._24_4_ * auVar29._24_4_;
      auVar60._28_4_ = auVar255._28_4_;
      auVar42 = vsubps_avx(auVar60,auVar59);
      auVar61._4_4_ = auVar29._4_4_ * auVar31._4_4_;
      auVar61._0_4_ = auVar29._0_4_ * auVar31._0_4_;
      auVar61._8_4_ = auVar29._8_4_ * auVar31._8_4_;
      auVar61._12_4_ = auVar29._12_4_ * auVar31._12_4_;
      auVar61._16_4_ = auVar29._16_4_ * auVar31._16_4_;
      auVar61._20_4_ = auVar29._20_4_ * auVar31._20_4_;
      auVar61._24_4_ = auVar29._24_4_ * auVar31._24_4_;
      auVar61._28_4_ = auVar27._28_4_;
      auVar62._4_4_ = auVar30._4_4_ * auVar321._4_4_;
      auVar62._0_4_ = auVar30._0_4_ * auVar321._0_4_;
      auVar62._8_4_ = auVar30._8_4_ * auVar321._8_4_;
      auVar62._12_4_ = auVar30._12_4_ * auVar321._12_4_;
      auVar62._16_4_ = auVar30._16_4_ * auVar321._16_4_;
      auVar62._20_4_ = auVar30._20_4_ * auVar321._20_4_;
      auVar62._24_4_ = auVar30._24_4_ * auVar321._24_4_;
      auVar62._28_4_ = auVar321._28_4_;
      auVar321 = vsubps_avx(auVar62,auVar61);
      auVar162._0_4_ = auVar28._0_4_ * 0.0 + auVar321._0_4_ + auVar42._0_4_ * 0.0;
      auVar162._4_4_ = auVar28._4_4_ * 0.0 + auVar321._4_4_ + auVar42._4_4_ * 0.0;
      auVar162._8_4_ = auVar28._8_4_ * 0.0 + auVar321._8_4_ + auVar42._8_4_ * 0.0;
      auVar162._12_4_ = auVar28._12_4_ * 0.0 + auVar321._12_4_ + auVar42._12_4_ * 0.0;
      auVar162._16_4_ = auVar28._16_4_ * 0.0 + auVar321._16_4_ + auVar42._16_4_ * 0.0;
      auVar162._20_4_ = auVar28._20_4_ * 0.0 + auVar321._20_4_ + auVar42._20_4_ * 0.0;
      auVar162._24_4_ = auVar28._24_4_ * 0.0 + auVar321._24_4_ + auVar42._24_4_ * 0.0;
      auVar162._28_4_ = auVar321._28_4_ + auVar321._28_4_ + auVar42._28_4_;
      auVar42 = vcmpps_avx(auVar162,ZEXT432(0) << 0x20,2);
      auVar164 = vblendvps_avx(auVar164,_local_8e0,auVar42);
      auVar26 = vblendvps_avx(auVar26,_local_660,auVar42);
      auVar321 = vblendvps_avx(auVar156,auVar282,auVar42);
      auVar286 = ZEXT3264(auVar321);
      auVar27 = vblendvps_avx(auVar30,auVar336,auVar42);
      auVar28 = vblendvps_avx(auVar31,auVar357,auVar42);
      auVar29 = vblendvps_avx(auVar41,auVar391,auVar42);
      auVar30 = vblendvps_avx(auVar336,auVar30,auVar42);
      auVar31 = vblendvps_avx(auVar357,auVar31,auVar42);
      auVar216 = vpackssdw_avx(local_440._0_16_,local_440._16_16_);
      auVar41 = vblendvps_avx(auVar391,auVar41,auVar42);
      auVar30 = vsubps_avx(auVar30,auVar164);
      auVar308 = vsubps_avx(auVar31,auVar26);
      auVar41 = vsubps_avx(auVar41,auVar321);
      auVar157 = vsubps_avx(auVar26,auVar28);
      fVar359 = auVar308._0_4_;
      fVar187 = auVar321._0_4_;
      fVar245 = auVar308._4_4_;
      fVar211 = auVar321._4_4_;
      auVar63._4_4_ = fVar211 * fVar245;
      auVar63._0_4_ = fVar187 * fVar359;
      fVar277 = auVar308._8_4_;
      fVar279 = auVar321._8_4_;
      auVar63._8_4_ = fVar279 * fVar277;
      fVar293 = auVar308._12_4_;
      fVar288 = auVar321._12_4_;
      auVar63._12_4_ = fVar288 * fVar293;
      fVar313 = auVar308._16_4_;
      fVar290 = auVar321._16_4_;
      auVar63._16_4_ = fVar290 * fVar313;
      fVar327 = auVar308._20_4_;
      fVar151 = auVar321._20_4_;
      auVar63._20_4_ = fVar151 * fVar327;
      fVar351 = auVar308._24_4_;
      fVar174 = auVar321._24_4_;
      auVar63._24_4_ = fVar174 * fVar351;
      auVar63._28_4_ = auVar31._28_4_;
      fVar242 = auVar26._0_4_;
      fVar329 = auVar41._0_4_;
      fVar275 = auVar26._4_4_;
      fVar340 = auVar41._4_4_;
      auVar64._4_4_ = fVar340 * fVar275;
      auVar64._0_4_ = fVar329 * fVar242;
      fVar278 = auVar26._8_4_;
      fVar300 = auVar41._8_4_;
      auVar64._8_4_ = fVar300 * fVar278;
      fVar296 = auVar26._12_4_;
      fVar343 = auVar41._12_4_;
      auVar64._12_4_ = fVar343 * fVar296;
      fVar326 = auVar26._16_4_;
      fVar345 = auVar41._16_4_;
      auVar64._16_4_ = fVar345 * fVar326;
      fVar328 = auVar26._20_4_;
      fVar347 = auVar41._20_4_;
      auVar64._20_4_ = fVar347 * fVar328;
      fVar176 = auVar26._24_4_;
      fVar349 = auVar41._24_4_;
      uVar149 = auVar156._28_4_;
      auVar64._24_4_ = fVar349 * fVar176;
      auVar64._28_4_ = uVar149;
      auVar26 = vsubps_avx(auVar64,auVar63);
      fVar273 = auVar164._0_4_;
      fVar264 = auVar164._4_4_;
      auVar65._4_4_ = fVar340 * fVar264;
      auVar65._0_4_ = fVar329 * fVar273;
      fVar287 = auVar164._8_4_;
      auVar65._8_4_ = fVar300 * fVar287;
      fVar298 = auVar164._12_4_;
      auVar65._12_4_ = fVar343 * fVar298;
      fVar292 = auVar164._16_4_;
      auVar65._16_4_ = fVar345 * fVar292;
      fVar246 = auVar164._20_4_;
      auVar65._20_4_ = fVar347 * fVar246;
      fVar179 = auVar164._24_4_;
      auVar65._24_4_ = fVar349 * fVar179;
      auVar65._28_4_ = uVar149;
      fVar262 = auVar30._0_4_;
      fVar276 = auVar30._4_4_;
      auVar66._4_4_ = fVar211 * fVar276;
      auVar66._0_4_ = fVar187 * fVar262;
      fVar289 = auVar30._8_4_;
      auVar66._8_4_ = fVar279 * fVar289;
      fVar325 = auVar30._12_4_;
      auVar66._12_4_ = fVar288 * fVar325;
      fVar244 = auVar30._16_4_;
      auVar66._16_4_ = fVar290 * fVar244;
      fVar210 = auVar30._20_4_;
      auVar66._20_4_ = fVar151 * fVar210;
      fVar181 = auVar30._24_4_;
      auVar66._24_4_ = fVar174 * fVar181;
      auVar66._28_4_ = auVar391._28_4_;
      auVar31 = vsubps_avx(auVar66,auVar65);
      auVar67._4_4_ = fVar275 * fVar276;
      auVar67._0_4_ = fVar242 * fVar262;
      auVar67._8_4_ = fVar278 * fVar289;
      auVar67._12_4_ = fVar296 * fVar325;
      auVar67._16_4_ = fVar326 * fVar244;
      auVar67._20_4_ = fVar328 * fVar210;
      auVar67._24_4_ = fVar176 * fVar181;
      auVar67._28_4_ = uVar149;
      auVar397._0_4_ = fVar273 * fVar359;
      auVar397._4_4_ = fVar264 * fVar245;
      auVar397._8_4_ = fVar287 * fVar277;
      auVar397._12_4_ = fVar298 * fVar293;
      auVar397._16_4_ = fVar292 * fVar313;
      auVar397._20_4_ = fVar246 * fVar327;
      auVar397._24_4_ = fVar179 * fVar351;
      auVar397._28_4_ = 0;
      auVar156 = vsubps_avx(auVar397,auVar67);
      auVar158 = vsubps_avx(auVar321,auVar29);
      fVar274 = auVar156._28_4_ + auVar31._28_4_;
      auVar197._0_4_ = auVar156._0_4_ + auVar31._0_4_ * 0.0 + auVar26._0_4_ * 0.0;
      auVar197._4_4_ = auVar156._4_4_ + auVar31._4_4_ * 0.0 + auVar26._4_4_ * 0.0;
      auVar197._8_4_ = auVar156._8_4_ + auVar31._8_4_ * 0.0 + auVar26._8_4_ * 0.0;
      auVar197._12_4_ = auVar156._12_4_ + auVar31._12_4_ * 0.0 + auVar26._12_4_ * 0.0;
      auVar197._16_4_ = auVar156._16_4_ + auVar31._16_4_ * 0.0 + auVar26._16_4_ * 0.0;
      auVar197._20_4_ = auVar156._20_4_ + auVar31._20_4_ * 0.0 + auVar26._20_4_ * 0.0;
      auVar197._24_4_ = auVar156._24_4_ + auVar31._24_4_ * 0.0 + auVar26._24_4_ * 0.0;
      auVar197._28_4_ = fVar274 + auVar26._28_4_;
      fVar177 = auVar157._0_4_;
      fVar180 = auVar157._4_4_;
      auVar68._4_4_ = fVar180 * auVar29._4_4_;
      auVar68._0_4_ = fVar177 * auVar29._0_4_;
      fVar182 = auVar157._8_4_;
      auVar68._8_4_ = fVar182 * auVar29._8_4_;
      fVar184 = auVar157._12_4_;
      auVar68._12_4_ = fVar184 * auVar29._12_4_;
      fVar185 = auVar157._16_4_;
      auVar68._16_4_ = fVar185 * auVar29._16_4_;
      fVar186 = auVar157._20_4_;
      auVar68._20_4_ = fVar186 * auVar29._20_4_;
      fVar266 = auVar157._24_4_;
      auVar68._24_4_ = fVar266 * auVar29._24_4_;
      auVar68._28_4_ = fVar274;
      fVar274 = auVar158._0_4_;
      fVar265 = auVar158._4_4_;
      auVar69._4_4_ = auVar28._4_4_ * fVar265;
      auVar69._0_4_ = auVar28._0_4_ * fVar274;
      fVar291 = auVar158._8_4_;
      auVar69._8_4_ = auVar28._8_4_ * fVar291;
      fVar243 = auVar158._12_4_;
      auVar69._12_4_ = auVar28._12_4_ * fVar243;
      fVar315 = auVar158._16_4_;
      auVar69._16_4_ = auVar28._16_4_ * fVar315;
      fVar295 = auVar158._20_4_;
      auVar69._20_4_ = auVar28._20_4_ * fVar295;
      fVar183 = auVar158._24_4_;
      auVar69._24_4_ = auVar28._24_4_ * fVar183;
      auVar69._28_4_ = auVar156._28_4_;
      auVar31 = vsubps_avx(auVar69,auVar68);
      auVar164 = vsubps_avx(auVar164,auVar27);
      fVar294 = auVar164._0_4_;
      fVar297 = auVar164._4_4_;
      auVar70._4_4_ = fVar297 * auVar29._4_4_;
      auVar70._0_4_ = fVar294 * auVar29._0_4_;
      fVar299 = auVar164._8_4_;
      auVar70._8_4_ = fVar299 * auVar29._8_4_;
      fVar301 = auVar164._12_4_;
      auVar70._12_4_ = fVar301 * auVar29._12_4_;
      fVar311 = auVar164._16_4_;
      auVar70._16_4_ = fVar311 * auVar29._16_4_;
      fVar312 = auVar164._20_4_;
      auVar70._20_4_ = fVar312 * auVar29._20_4_;
      fVar314 = auVar164._24_4_;
      auVar70._24_4_ = fVar314 * auVar29._24_4_;
      auVar70._28_4_ = auVar29._28_4_;
      auVar71._4_4_ = auVar27._4_4_ * fVar265;
      auVar71._0_4_ = auVar27._0_4_ * fVar274;
      auVar71._8_4_ = auVar27._8_4_ * fVar291;
      auVar71._12_4_ = auVar27._12_4_ * fVar243;
      auVar71._16_4_ = auVar27._16_4_ * fVar315;
      auVar71._20_4_ = auVar27._20_4_ * fVar295;
      auVar71._24_4_ = auVar27._24_4_ * fVar183;
      auVar71._28_4_ = auVar26._28_4_;
      auVar164 = vsubps_avx(auVar70,auVar71);
      auVar72._4_4_ = auVar28._4_4_ * fVar297;
      auVar72._0_4_ = auVar28._0_4_ * fVar294;
      auVar72._8_4_ = auVar28._8_4_ * fVar299;
      auVar72._12_4_ = auVar28._12_4_ * fVar301;
      auVar72._16_4_ = auVar28._16_4_ * fVar311;
      auVar72._20_4_ = auVar28._20_4_ * fVar312;
      auVar72._24_4_ = auVar28._24_4_ * fVar314;
      auVar72._28_4_ = auVar29._28_4_;
      auVar73._4_4_ = auVar27._4_4_ * fVar180;
      auVar73._0_4_ = auVar27._0_4_ * fVar177;
      auVar73._8_4_ = auVar27._8_4_ * fVar182;
      auVar73._12_4_ = auVar27._12_4_ * fVar184;
      auVar73._16_4_ = auVar27._16_4_ * fVar185;
      auVar73._20_4_ = auVar27._20_4_ * fVar186;
      auVar73._24_4_ = auVar27._24_4_ * fVar266;
      auVar73._28_4_ = auVar27._28_4_;
      auVar26 = vsubps_avx(auVar73,auVar72);
      auVar257._0_4_ = auVar31._0_4_ * 0.0 + auVar26._0_4_ + auVar164._0_4_ * 0.0;
      auVar257._4_4_ = auVar31._4_4_ * 0.0 + auVar26._4_4_ + auVar164._4_4_ * 0.0;
      auVar257._8_4_ = auVar31._8_4_ * 0.0 + auVar26._8_4_ + auVar164._8_4_ * 0.0;
      auVar257._12_4_ = auVar31._12_4_ * 0.0 + auVar26._12_4_ + auVar164._12_4_ * 0.0;
      auVar257._16_4_ = auVar31._16_4_ * 0.0 + auVar26._16_4_ + auVar164._16_4_ * 0.0;
      auVar257._20_4_ = auVar31._20_4_ * 0.0 + auVar26._20_4_ + auVar164._20_4_ * 0.0;
      auVar257._24_4_ = auVar31._24_4_ * 0.0 + auVar26._24_4_ + auVar164._24_4_ * 0.0;
      auVar257._28_4_ = auVar26._28_4_ + auVar26._28_4_ + auVar164._28_4_;
      auVar164 = vmaxps_avx(auVar197,auVar257);
      auVar164 = vcmpps_avx(auVar164,ZEXT832(0) << 0x20,2);
      auVar231 = vpackssdw_avx(auVar164._0_16_,auVar164._16_16_);
      auVar216 = vpand_avx(auVar231,auVar216);
      auVar231 = vpmovsxwd_avx(auVar216);
      auVar220 = vpunpckhwd_avx(auVar216,auVar216);
      auVar237._16_16_ = auVar220;
      auVar237._0_16_ = auVar231;
      if ((((((((auVar237 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar237 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar237 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar237 >> 0x7f,0) == '\0') &&
            (auVar237 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB161(auVar220 >> 0x3f,0) == '\0') &&
          (auVar237 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar220[0xf]
         ) {
LAB_00ab5d60:
        auVar206 = ZEXT3264(CONCAT824(uStack_5c8,
                                      CONCAT816(uStack_5d0,CONCAT88(uStack_5d8,local_5e0))));
        auVar164 = vcmpps_avx(auVar308,auVar308,0xf);
        auVar271 = ZEXT3264(auVar164);
        auVar324 = ZEXT3264(auVar241);
      }
      else {
        auVar74._4_4_ = fVar265 * fVar245;
        auVar74._0_4_ = fVar274 * fVar359;
        auVar74._8_4_ = fVar291 * fVar277;
        auVar74._12_4_ = fVar243 * fVar293;
        auVar74._16_4_ = fVar315 * fVar313;
        auVar74._20_4_ = fVar295 * fVar327;
        auVar74._24_4_ = fVar183 * fVar351;
        auVar74._28_4_ = auVar220._12_4_;
        auVar375._0_4_ = fVar177 * fVar329;
        auVar375._4_4_ = fVar180 * fVar340;
        auVar375._8_4_ = fVar182 * fVar300;
        auVar375._12_4_ = fVar184 * fVar343;
        auVar375._16_4_ = fVar185 * fVar345;
        auVar375._20_4_ = fVar186 * fVar347;
        auVar375._24_4_ = fVar266 * fVar349;
        auVar375._28_4_ = 0;
        auVar164 = vsubps_avx(auVar375,auVar74);
        auVar75._4_4_ = fVar297 * fVar340;
        auVar75._0_4_ = fVar294 * fVar329;
        auVar75._8_4_ = fVar299 * fVar300;
        auVar75._12_4_ = fVar301 * fVar343;
        auVar75._16_4_ = fVar311 * fVar345;
        auVar75._20_4_ = fVar312 * fVar347;
        auVar75._24_4_ = fVar314 * fVar349;
        auVar75._28_4_ = auVar41._28_4_;
        auVar76._4_4_ = fVar265 * fVar276;
        auVar76._0_4_ = fVar274 * fVar262;
        auVar76._8_4_ = fVar291 * fVar289;
        auVar76._12_4_ = fVar243 * fVar325;
        auVar76._16_4_ = fVar315 * fVar244;
        auVar76._20_4_ = fVar295 * fVar210;
        auVar76._24_4_ = fVar183 * fVar181;
        auVar76._28_4_ = auVar158._28_4_;
        auVar26 = vsubps_avx(auVar76,auVar75);
        auVar77._4_4_ = fVar180 * fVar276;
        auVar77._0_4_ = fVar177 * fVar262;
        auVar77._8_4_ = fVar182 * fVar289;
        auVar77._12_4_ = fVar184 * fVar325;
        auVar77._16_4_ = fVar185 * fVar244;
        auVar77._20_4_ = fVar186 * fVar210;
        auVar77._24_4_ = fVar266 * fVar181;
        auVar77._28_4_ = auVar197._28_4_;
        auVar78._4_4_ = fVar297 * fVar245;
        auVar78._0_4_ = fVar294 * fVar359;
        auVar78._8_4_ = fVar299 * fVar277;
        auVar78._12_4_ = fVar301 * fVar293;
        auVar78._16_4_ = fVar311 * fVar313;
        auVar78._20_4_ = fVar312 * fVar327;
        fVar359 = auVar308._28_4_;
        auVar78._24_4_ = fVar314 * fVar351;
        auVar78._28_4_ = fVar359;
        auVar28 = vsubps_avx(auVar78,auVar77);
        auVar308._0_4_ = auVar164._0_4_ * 0.0 + auVar28._0_4_ + auVar26._0_4_ * 0.0;
        auVar308._4_4_ = auVar164._4_4_ * 0.0 + auVar28._4_4_ + auVar26._4_4_ * 0.0;
        auVar308._8_4_ = auVar164._8_4_ * 0.0 + auVar28._8_4_ + auVar26._8_4_ * 0.0;
        auVar308._12_4_ = auVar164._12_4_ * 0.0 + auVar28._12_4_ + auVar26._12_4_ * 0.0;
        auVar308._16_4_ = auVar164._16_4_ * 0.0 + auVar28._16_4_ + auVar26._16_4_ * 0.0;
        auVar308._20_4_ = auVar164._20_4_ * 0.0 + auVar28._20_4_ + auVar26._20_4_ * 0.0;
        auVar308._24_4_ = auVar164._24_4_ * 0.0 + auVar28._24_4_ + auVar26._24_4_ * 0.0;
        auVar308._28_4_ = fVar359 + auVar28._28_4_ + auVar197._28_4_;
        auVar27 = vrcpps_avx(auVar308);
        fVar359 = auVar27._0_4_;
        fVar262 = auVar27._4_4_;
        auVar79._4_4_ = auVar308._4_4_ * fVar262;
        auVar79._0_4_ = auVar308._0_4_ * fVar359;
        fVar274 = auVar27._8_4_;
        auVar79._8_4_ = auVar308._8_4_ * fVar274;
        fVar245 = auVar27._12_4_;
        auVar79._12_4_ = auVar308._12_4_ * fVar245;
        fVar276 = auVar27._16_4_;
        auVar79._16_4_ = auVar308._16_4_ * fVar276;
        fVar265 = auVar27._20_4_;
        auVar79._20_4_ = auVar308._20_4_ * fVar265;
        fVar277 = auVar27._24_4_;
        auVar79._24_4_ = auVar308._24_4_ * fVar277;
        auVar79._28_4_ = auVar158._28_4_;
        auVar376._8_4_ = 0x3f800000;
        auVar376._0_8_ = 0x3f8000003f800000;
        auVar376._12_4_ = 0x3f800000;
        auVar376._16_4_ = 0x3f800000;
        auVar376._20_4_ = 0x3f800000;
        auVar376._24_4_ = 0x3f800000;
        auVar376._28_4_ = 0x3f800000;
        auVar29 = vsubps_avx(auVar376,auVar79);
        fVar359 = auVar29._0_4_ * fVar359 + fVar359;
        fVar262 = auVar29._4_4_ * fVar262 + fVar262;
        fVar274 = auVar29._8_4_ * fVar274 + fVar274;
        fVar245 = auVar29._12_4_ * fVar245 + fVar245;
        fVar276 = auVar29._16_4_ * fVar276 + fVar276;
        fVar265 = auVar29._20_4_ * fVar265 + fVar265;
        fVar277 = auVar29._24_4_ * fVar277 + fVar277;
        auVar80._4_4_ =
             (auVar164._4_4_ * fVar264 + auVar26._4_4_ * fVar275 + auVar28._4_4_ * fVar211) *
             fVar262;
        auVar80._0_4_ =
             (auVar164._0_4_ * fVar273 + auVar26._0_4_ * fVar242 + auVar28._0_4_ * fVar187) *
             fVar359;
        auVar80._8_4_ =
             (auVar164._8_4_ * fVar287 + auVar26._8_4_ * fVar278 + auVar28._8_4_ * fVar279) *
             fVar274;
        auVar80._12_4_ =
             (auVar164._12_4_ * fVar298 + auVar26._12_4_ * fVar296 + auVar28._12_4_ * fVar288) *
             fVar245;
        auVar80._16_4_ =
             (auVar164._16_4_ * fVar292 + auVar26._16_4_ * fVar326 + auVar28._16_4_ * fVar290) *
             fVar276;
        auVar80._20_4_ =
             (auVar164._20_4_ * fVar246 + auVar26._20_4_ * fVar328 + auVar28._20_4_ * fVar151) *
             fVar265;
        auVar80._24_4_ =
             (auVar164._24_4_ * fVar179 + auVar26._24_4_ * fVar176 + auVar28._24_4_ * fVar174) *
             fVar277;
        auVar80._28_4_ = auVar30._28_4_ + auVar321._28_4_;
        auVar231 = vpermilps_avx(ZEXT416(uVar145),0);
        auVar163._16_16_ = auVar231;
        auVar163._0_16_ = auVar231;
        auVar164 = vcmpps_avx(auVar163,auVar80,2);
        uVar149 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar238._4_4_ = uVar149;
        auVar238._0_4_ = uVar149;
        auVar238._8_4_ = uVar149;
        auVar238._12_4_ = uVar149;
        auVar238._16_4_ = uVar149;
        auVar238._20_4_ = uVar149;
        auVar238._24_4_ = uVar149;
        auVar238._28_4_ = uVar149;
        auVar26 = vcmpps_avx(auVar80,auVar238,2);
        auVar164 = vandps_avx(auVar26,auVar164);
        auVar231 = vpackssdw_avx(auVar164._0_16_,auVar164._16_16_);
        auVar216 = vpand_avx(auVar216,auVar231);
        auVar231 = vpmovsxwd_avx(auVar216);
        auVar220 = vpshufd_avx(auVar216,0xee);
        auVar220 = vpmovsxwd_avx(auVar220);
        auVar286 = ZEXT1664(auVar220);
        auVar239._16_16_ = auVar220;
        auVar239._0_16_ = auVar231;
        if ((((((((auVar239 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar239 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar239 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar239 >> 0x7f,0) == '\0') &&
              (auVar239 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar220 >> 0x3f,0) == '\0') &&
            (auVar239 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar220[0xf]) goto LAB_00ab5d60;
        auVar164 = vcmpps_avx(ZEXT832(0) << 0x20,auVar308,4);
        auVar231 = vpackssdw_avx(auVar164._0_16_,auVar164._16_16_);
        auVar216 = vpand_avx(auVar216,auVar231);
        auVar231 = vpmovsxwd_avx(auVar216);
        auVar216 = vpunpckhwd_avx(auVar216,auVar216);
        auVar283._16_16_ = auVar216;
        auVar283._0_16_ = auVar231;
        auVar286 = ZEXT3264(auVar283);
        auVar206 = ZEXT3264(CONCAT824(uStack_5c8,
                                      CONCAT816(uStack_5d0,CONCAT88(uStack_5d8,local_5e0))));
        auVar164 = vcmpps_avx(auVar308,auVar308,0xf);
        auVar271 = ZEXT3264(auVar164);
        auVar324 = ZEXT3264(auVar241);
        if ((((((((auVar283 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar283 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar283 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar283 >> 0x7f,0) != '\0') ||
              (auVar283 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB161(auVar216 >> 0x3f,0) != '\0') ||
            (auVar283 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar216[0xf] < '\0') {
          auVar81._4_4_ = auVar197._4_4_ * fVar262;
          auVar81._0_4_ = auVar197._0_4_ * fVar359;
          auVar81._8_4_ = auVar197._8_4_ * fVar274;
          auVar81._12_4_ = auVar197._12_4_ * fVar245;
          auVar81._16_4_ = auVar197._16_4_ * fVar276;
          auVar81._20_4_ = auVar197._20_4_ * fVar265;
          auVar81._24_4_ = auVar197._24_4_ * fVar277;
          auVar81._28_4_ = SUB84(uStack_5c8,4);
          auVar82._4_4_ = auVar257._4_4_ * fVar262;
          auVar82._0_4_ = auVar257._0_4_ * fVar359;
          auVar82._8_4_ = auVar257._8_4_ * fVar274;
          auVar82._12_4_ = auVar257._12_4_ * fVar245;
          auVar82._16_4_ = auVar257._16_4_ * fVar276;
          auVar82._20_4_ = auVar257._20_4_ * fVar265;
          auVar82._24_4_ = auVar257._24_4_ * fVar277;
          auVar82._28_4_ = auVar29._28_4_ + auVar27._28_4_;
          auVar258._8_4_ = 0x3f800000;
          auVar258._0_8_ = 0x3f8000003f800000;
          auVar258._12_4_ = 0x3f800000;
          auVar258._16_4_ = 0x3f800000;
          auVar258._20_4_ = 0x3f800000;
          auVar258._24_4_ = 0x3f800000;
          auVar258._28_4_ = 0x3f800000;
          auVar164 = vsubps_avx(auVar258,auVar81);
          auVar164 = vblendvps_avx(auVar164,auVar81,auVar42);
          auVar324 = ZEXT3264(auVar164);
          auVar164 = vsubps_avx(auVar258,auVar82);
          _local_480 = vblendvps_avx(auVar164,auVar82,auVar42);
          auVar206 = ZEXT3264(auVar283);
          local_460 = auVar80;
        }
      }
      auVar387 = ZEXT3264(local_800);
      auVar339 = ZEXT3264(local_7a0);
      auVar164 = auVar206._0_32_;
      if ((((((((auVar164 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar164 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar164 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar164 >> 0x7f,0) != '\0') ||
            (auVar206 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
           SUB321(auVar164 >> 0xbf,0) != '\0') ||
          (auVar206 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
          auVar206[0x1f] < '\0') {
        auVar241 = vsubps_avx(local_800,auVar159);
        fVar242 = auVar159._0_4_ + auVar324._0_4_ * auVar241._0_4_;
        fVar273 = auVar159._4_4_ + auVar324._4_4_ * auVar241._4_4_;
        fVar262 = auVar159._8_4_ + auVar324._8_4_ * auVar241._8_4_;
        fVar274 = auVar159._12_4_ + auVar324._12_4_ * auVar241._12_4_;
        fVar245 = auVar159._16_4_ + auVar324._16_4_ * auVar241._16_4_;
        fVar275 = auVar159._20_4_ + auVar324._20_4_ * auVar241._20_4_;
        fVar264 = auVar159._24_4_ + auVar324._24_4_ * auVar241._24_4_;
        fVar276 = auVar241._28_4_ + 0.0;
        fVar359 = *(float *)((long)local_708->ray_space + k * 4 + -0x20);
        auVar83._4_4_ = (fVar273 + fVar273) * fVar359;
        auVar83._0_4_ = (fVar242 + fVar242) * fVar359;
        auVar83._8_4_ = (fVar262 + fVar262) * fVar359;
        auVar83._12_4_ = (fVar274 + fVar274) * fVar359;
        auVar83._16_4_ = (fVar245 + fVar245) * fVar359;
        auVar83._20_4_ = (fVar275 + fVar275) * fVar359;
        auVar83._24_4_ = (fVar264 + fVar264) * fVar359;
        auVar83._28_4_ = fVar276 + fVar276;
        auVar241 = vcmpps_avx(local_460,auVar83,6);
        auVar26 = auVar164 & auVar241;
        if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar26 >> 0x7f,0) == '\0') &&
              (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar26 >> 0xbf,0) == '\0') &&
            (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar26[0x1f]) goto LAB_00ab48df;
        local_3c0 = (float)local_480._0_4_ + (float)local_480._0_4_ + -1.0;
        fStack_3bc = (float)local_480._4_4_ + (float)local_480._4_4_ + -1.0;
        fStack_3b8 = (float)uStack_478 + (float)uStack_478 + -1.0;
        fStack_3b4 = uStack_478._4_4_ + uStack_478._4_4_ + -1.0;
        fStack_3b0 = (float)uStack_470 + (float)uStack_470 + -1.0;
        fStack_3ac = uStack_470._4_4_ + uStack_470._4_4_ + -1.0;
        fStack_3a8 = (float)uStack_468 + (float)uStack_468 + -1.0;
        fStack_3a4 = uStack_468._4_4_ + uStack_468._4_4_ + -1.0;
        auVar321 = auVar324._0_32_;
        local_480._4_4_ = fStack_3bc;
        local_480._0_4_ = local_3c0;
        uStack_478._0_4_ = fStack_3b8;
        uStack_478._4_4_ = fStack_3b4;
        uStack_470._0_4_ = fStack_3b0;
        uStack_470._4_4_ = fStack_3ac;
        auVar138 = _local_480;
        uStack_468._0_4_ = fStack_3a8;
        uStack_468._4_4_ = fStack_3a4;
        auVar26 = _local_480;
        local_3a0 = local_460;
        local_380 = 0;
        uStack_368 = uStack_8e8;
        uStack_358 = uStack_838;
        uStack_348 = uStack_848;
        uStack_338 = uStack_858;
        _local_480 = auVar26;
        if ((pGVar22->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
          local_620 = vandps_avx(auVar241,auVar164);
          auVar213._0_4_ = 1.0 / auVar230._0_4_;
          auVar213._4_12_ = SUB6012((undefined1  [60])0x0,0);
          auVar253 = vshufps_avx(auVar213,auVar213,0);
          local_300[0] = auVar253._0_4_ * (auVar324._0_4_ + 0.0);
          local_300[1] = auVar253._4_4_ * (auVar324._4_4_ + 1.0);
          local_300[2] = auVar253._8_4_ * (auVar324._8_4_ + 2.0);
          local_300[3] = auVar253._12_4_ * (auVar324._12_4_ + 3.0);
          fStack_2f0 = auVar253._0_4_ * (auVar324._16_4_ + 4.0);
          fStack_2ec = auVar253._4_4_ * (auVar324._20_4_ + 5.0);
          fStack_2e8 = auVar253._8_4_ * (auVar324._24_4_ + 6.0);
          fStack_2e4 = auVar324._28_4_ + 7.0;
          uStack_470 = auVar138._16_8_;
          uStack_468 = auVar26._24_8_;
          local_2e0 = local_480;
          uStack_2d8 = uStack_478;
          uStack_2d0 = uStack_470;
          uStack_2c8 = uStack_468;
          local_2c0 = local_460;
          auVar198._8_4_ = 0x7f800000;
          auVar198._0_8_ = 0x7f8000007f800000;
          auVar198._12_4_ = 0x7f800000;
          auVar198._16_4_ = 0x7f800000;
          auVar198._20_4_ = 0x7f800000;
          auVar198._24_4_ = 0x7f800000;
          auVar198._28_4_ = 0x7f800000;
          auVar164 = vblendvps_avx(auVar198,local_460,local_620);
          auVar241 = vshufps_avx(auVar164,auVar164,0xb1);
          auVar241 = vminps_avx(auVar164,auVar241);
          auVar26 = vshufpd_avx(auVar241,auVar241,5);
          auVar241 = vminps_avx(auVar241,auVar26);
          auVar26 = vperm2f128_avx(auVar241,auVar241,1);
          auVar241 = vminps_avx(auVar241,auVar26);
          auVar241 = vcmpps_avx(auVar164,auVar241,0);
          auVar26 = local_620 & auVar241;
          auVar164 = local_620;
          if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar26 >> 0x7f,0) != '\0') ||
                (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar26 >> 0xbf,0) != '\0') ||
              (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar26[0x1f] < '\0') {
            auVar164 = vandps_avx(auVar241,local_620);
          }
          uVar139 = vmovmskps_avx(auVar164);
          uVar141 = 0;
          if (uVar139 != 0) {
            for (; (uVar139 >> uVar141 & 1) == 0; uVar141 = uVar141 + 1) {
            }
          }
          uVar144 = (ulong)uVar141;
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar22->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            fVar359 = local_300[uVar144];
            uVar149 = *(undefined4 *)((long)&local_2e0 + uVar144 * 4);
            fVar273 = 1.0 - fVar359;
            fVar242 = fVar359 * fVar273 + fVar359 * fVar273;
            auVar286 = ZEXT464(0x40400000);
            auVar253 = ZEXT416((uint)(fVar359 * fVar359 * 3.0));
            auVar253 = vshufps_avx(auVar253,auVar253,0);
            auVar216 = ZEXT416((uint)((fVar242 - fVar359 * fVar359) * 3.0));
            auVar216 = vshufps_avx(auVar216,auVar216,0);
            auVar231 = ZEXT416((uint)((fVar273 * fVar273 - fVar242) * 3.0));
            auVar231 = vshufps_avx(auVar231,auVar231,0);
            auVar220 = ZEXT416((uint)(fVar273 * fVar273 * -3.0));
            auVar220 = vshufps_avx(auVar220,auVar220,0);
            auVar214._0_4_ =
                 auVar220._0_4_ * fVar302 +
                 auVar231._0_4_ * fVar388 + auVar253._0_4_ * fVar367 + auVar216._0_4_ * fVar393;
            auVar214._4_4_ =
                 auVar220._4_4_ * fVar310 +
                 auVar231._4_4_ * fVar392 + auVar253._4_4_ * fVar380 + auVar216._4_4_ * fVar399;
            auVar214._8_4_ =
                 auVar220._8_4_ * auVar303._8_4_ +
                 auVar231._8_4_ * auVar389._8_4_ +
                 auVar253._8_4_ * auVar368._8_4_ + auVar216._8_4_ * auVar395._8_4_;
            auVar214._12_4_ =
                 auVar220._12_4_ * auVar303._12_4_ +
                 auVar231._12_4_ * auVar389._12_4_ +
                 auVar253._12_4_ * auVar368._12_4_ + auVar216._12_4_ * auVar395._12_4_;
            *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2c0 + uVar144 * 4);
            *(float *)(ray + k * 4 + 0x180) = auVar214._0_4_;
            uVar21 = vextractps_avx(auVar214,1);
            *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar21;
            uVar21 = vextractps_avx(auVar214,2);
            *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar21;
            *(float *)(ray + k * 4 + 0x1e0) = fVar359;
            *(undefined4 *)(ray + k * 4 + 0x200) = uVar149;
            *(uint *)(ray + k * 4 + 0x220) = uVar19;
            *(uint *)(ray + k * 4 + 0x240) = uVar140;
            *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
          }
          else {
            auVar253 = vpermilps_avx(local_510,0);
            register0x00001210 = auVar253;
            _local_6a0 = auVar253;
            auVar253 = vpermilps_avx(ZEXT416(uVar19),0);
            register0x00001210 = auVar253;
            _local_7c0 = auVar253;
            local_640 = ZEXT1632(*local_718);
            uStack_6b0 = *(undefined8 *)(local_720 + 0x10);
            uStack_6a8 = *(undefined8 *)(local_720 + 0x18);
            uStack_6d0 = *(undefined8 *)(local_720 + 0x10);
            _local_6e0 = *local_718;
            uStack_6c8 = *(undefined8 *)(local_720 + 0x18);
            auVar206 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
            local_3e0 = auVar321;
            local_37c = uVar20;
            local_370 = auVar303._0_8_;
            local_360 = auVar389._0_8_;
            local_350 = auVar395._0_8_;
            local_340 = auVar368._0_8_;
            while( true ) {
              local_200 = local_300[uVar144];
              local_1e0 = *(undefined4 *)((long)&local_2e0 + uVar144 * 4);
              *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2c0 + uVar144 * 4);
              fVar242 = 1.0 - local_200;
              fVar359 = local_200 * fVar242 + local_200 * fVar242;
              auVar286 = ZEXT464(0x40400000);
              auVar253 = ZEXT416((uint)(local_200 * local_200 * 3.0));
              auVar253 = vshufps_avx(auVar253,auVar253,0);
              auVar216 = ZEXT416((uint)((fVar359 - local_200 * local_200) * 3.0));
              auVar216 = vshufps_avx(auVar216,auVar216,0);
              auVar231 = ZEXT416((uint)((fVar242 * fVar242 - fVar359) * 3.0));
              auVar231 = vshufps_avx(auVar231,auVar231,0);
              local_830.context = context->user;
              auVar220 = ZEXT416((uint)(fVar242 * fVar242 * -3.0));
              auVar220 = vshufps_avx(auVar220,auVar220,0);
              auVar221._0_4_ =
                   auVar220._0_4_ * fVar302 +
                   auVar231._0_4_ * fVar388 + auVar253._0_4_ * fVar367 + auVar216._0_4_ * fVar393;
              auVar221._4_4_ =
                   auVar220._4_4_ * fVar310 +
                   auVar231._4_4_ * fVar392 + auVar253._4_4_ * fVar380 + auVar216._4_4_ * fVar399;
              auVar221._8_4_ =
                   auVar220._8_4_ * auVar303._8_4_ +
                   auVar231._8_4_ * auVar389._8_4_ +
                   auVar253._8_4_ * auVar368._8_4_ + auVar216._8_4_ * auVar395._8_4_;
              auVar221._12_4_ =
                   auVar220._12_4_ * auVar303._12_4_ +
                   auVar231._12_4_ * auVar389._12_4_ +
                   auVar253._12_4_ * auVar368._12_4_ + auVar216._12_4_ * auVar395._12_4_;
              auStack_250 = vshufps_avx(auVar221,auVar221,0);
              local_260[0] = (RTCHitN)auStack_250[0];
              local_260[1] = (RTCHitN)auStack_250[1];
              local_260[2] = (RTCHitN)auStack_250[2];
              local_260[3] = (RTCHitN)auStack_250[3];
              local_260[4] = (RTCHitN)auStack_250[4];
              local_260[5] = (RTCHitN)auStack_250[5];
              local_260[6] = (RTCHitN)auStack_250[6];
              local_260[7] = (RTCHitN)auStack_250[7];
              local_260[8] = (RTCHitN)auStack_250[8];
              local_260[9] = (RTCHitN)auStack_250[9];
              local_260[10] = (RTCHitN)auStack_250[10];
              local_260[0xb] = (RTCHitN)auStack_250[0xb];
              local_260[0xc] = (RTCHitN)auStack_250[0xc];
              local_260[0xd] = (RTCHitN)auStack_250[0xd];
              local_260[0xe] = (RTCHitN)auStack_250[0xe];
              local_260[0xf] = (RTCHitN)auStack_250[0xf];
              auStack_230 = vshufps_avx(auVar221,auVar221,0x55);
              local_240 = auStack_230;
              auStack_210 = vshufps_avx(auVar221,auVar221,0xaa);
              local_220 = auStack_210;
              fStack_1fc = local_200;
              fStack_1f8 = local_200;
              fStack_1f4 = local_200;
              fStack_1f0 = local_200;
              fStack_1ec = local_200;
              fStack_1e8 = local_200;
              fStack_1e4 = local_200;
              uStack_1dc = local_1e0;
              uStack_1d8 = local_1e0;
              uStack_1d4 = local_1e0;
              uStack_1d0 = local_1e0;
              uStack_1cc = local_1e0;
              uStack_1c8 = local_1e0;
              uStack_1c4 = local_1e0;
              local_1c0 = local_7c0;
              uStack_1b8 = uStack_7b8;
              uStack_1b0 = uStack_7b0;
              uStack_1a8 = uStack_7a8;
              local_1a0 = local_6a0;
              uStack_198 = uStack_698;
              uStack_190 = uStack_690;
              uStack_188 = uStack_688;
              local_710[1] = auVar271._0_32_;
              *local_710 = auVar271._0_32_;
              local_180 = (local_830.context)->instID[0];
              uStack_17c = local_180;
              uStack_178 = local_180;
              uStack_174 = local_180;
              uStack_170 = local_180;
              uStack_16c = local_180;
              uStack_168 = local_180;
              uStack_164 = local_180;
              local_160 = (local_830.context)->instPrimID[0];
              uStack_15c = local_160;
              uStack_158 = local_160;
              uStack_154 = local_160;
              uStack_150 = local_160;
              uStack_14c = local_160;
              uStack_148 = local_160;
              uStack_144 = local_160;
              local_760 = local_6e0;
              uStack_758 = uStack_6d8;
              uStack_750 = uStack_6d0;
              uStack_748 = uStack_6c8;
              local_830.valid = (int *)&local_760;
              local_830.geometryUserPtr = pGVar22->userPtr;
              local_830.hit = local_260;
              local_830.N = 8;
              auVar192 = local_640._0_16_;
              auVar155 = _local_6c0;
              local_830.ray = (RTCRayN *)ray;
              if (pGVar22->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                local_800._0_16_ = auVar206._0_16_;
                auVar286 = ZEXT1664(auVar286._0_16_);
                auVar164 = ZEXT1632(auVar271._0_16_);
                auVar387 = ZEXT1664(auVar387._0_16_);
                (*pGVar22->intersectionFilterN)(&local_830);
                auVar206 = ZEXT1664(local_800._0_16_);
                auVar339 = ZEXT3264(local_7a0);
                auVar324 = ZEXT3264(auVar321);
                auVar164 = vcmpps_avx(auVar164,auVar164,0xf);
                auVar271 = ZEXT3264(auVar164);
                auVar192._8_8_ = uStack_758;
                auVar192._0_8_ = local_760;
                auVar155._8_8_ = uStack_748;
                auVar155._0_8_ = uStack_750;
                fVar150 = (float)local_780._0_4_;
                fVar173 = (float)local_780._4_4_;
                fVar175 = fStack_778;
                fVar178 = fStack_774;
                fVar267 = fStack_770;
                fVar260 = fStack_76c;
                fVar261 = fStack_768;
              }
              auVar253 = vpcmpeqd_avx(auVar192,ZEXT816(0) << 0x40);
              auVar216 = vpcmpeqd_avx(auVar155,ZEXT816(0) << 0x40);
              auVar227._16_16_ = auVar216;
              auVar227._0_16_ = auVar253;
              auVar164 = auVar271._0_32_ & ~auVar227;
              if ((((((((auVar164 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar164 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar164 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar164 >> 0x7f,0) == '\0') &&
                    (auVar164 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar164 >> 0xbf,0) == '\0') &&
                  (auVar164 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar164[0x1f]) {
                auVar171._0_4_ = auVar253._0_4_ ^ auVar271._0_4_;
                auVar171._4_4_ = auVar253._4_4_ ^ auVar271._4_4_;
                auVar171._8_4_ = auVar253._8_4_ ^ auVar271._8_4_;
                auVar171._12_4_ = auVar253._12_4_ ^ auVar271._12_4_;
                auVar171._16_4_ = auVar216._0_4_ ^ auVar271._16_4_;
                auVar171._20_4_ = auVar216._4_4_ ^ auVar271._20_4_;
                auVar171._24_4_ = auVar216._8_4_ ^ auVar271._24_4_;
                auVar171._28_4_ = auVar216._12_4_ ^ auVar271._28_4_;
              }
              else {
                p_Var25 = context->args->filter;
                if ((p_Var25 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar22->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  local_800._0_16_ = auVar206._0_16_;
                  auVar286 = ZEXT1664(auVar286._0_16_);
                  auVar164 = ZEXT1632(auVar271._0_16_);
                  auVar387 = ZEXT1664(auVar387._0_16_);
                  (*p_Var25)(&local_830);
                  auVar206 = ZEXT1664(local_800._0_16_);
                  auVar339 = ZEXT3264(local_7a0);
                  auVar324 = ZEXT3264(auVar321);
                  auVar164 = vcmpps_avx(auVar164,auVar164,0xf);
                  auVar271 = ZEXT3264(auVar164);
                  auVar192._8_8_ = uStack_758;
                  auVar192._0_8_ = local_760;
                  auVar155._8_8_ = uStack_748;
                  auVar155._0_8_ = uStack_750;
                  fVar150 = (float)local_780._0_4_;
                  fVar173 = (float)local_780._4_4_;
                  fVar175 = fStack_778;
                  fVar178 = fStack_774;
                  fVar267 = fStack_770;
                  fVar260 = fStack_76c;
                  fVar261 = fStack_768;
                }
                auVar253 = vpcmpeqd_avx(auVar192,ZEXT816(0) << 0x40);
                auVar216 = vpcmpeqd_avx(auVar155,ZEXT816(0) << 0x40);
                auVar204._16_16_ = auVar216;
                auVar204._0_16_ = auVar253;
                auVar171._0_4_ = auVar253._0_4_ ^ auVar271._0_4_;
                auVar171._4_4_ = auVar253._4_4_ ^ auVar271._4_4_;
                auVar171._8_4_ = auVar253._8_4_ ^ auVar271._8_4_;
                auVar171._12_4_ = auVar253._12_4_ ^ auVar271._12_4_;
                auVar171._16_4_ = auVar216._0_4_ ^ auVar271._16_4_;
                auVar171._20_4_ = auVar216._4_4_ ^ auVar271._20_4_;
                auVar171._24_4_ = auVar216._8_4_ ^ auVar271._24_4_;
                auVar171._28_4_ = auVar216._12_4_ ^ auVar271._28_4_;
                auVar164 = auVar271._0_32_ & ~auVar204;
                if ((((((((auVar164 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar164 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar164 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar164 >> 0x7f,0) != '\0') ||
                      (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar164 >> 0xbf,0) != '\0') ||
                    (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar164[0x1f] < '\0') {
                  auVar164 = vmaskmovps_avx(auVar171,*(undefined1 (*) [32])local_830.hit);
                  *(undefined1 (*) [32])(local_830.ray + 0x180) = auVar164;
                  auVar164 = vmaskmovps_avx(auVar171,*(undefined1 (*) [32])(local_830.hit + 0x20));
                  *(undefined1 (*) [32])(local_830.ray + 0x1a0) = auVar164;
                  auVar164 = vmaskmovps_avx(auVar171,*(undefined1 (*) [32])(local_830.hit + 0x40));
                  *(undefined1 (*) [32])(local_830.ray + 0x1c0) = auVar164;
                  auVar164 = vmaskmovps_avx(auVar171,*(undefined1 (*) [32])(local_830.hit + 0x60));
                  *(undefined1 (*) [32])(local_830.ray + 0x1e0) = auVar164;
                  auVar164 = vmaskmovps_avx(auVar171,*(undefined1 (*) [32])(local_830.hit + 0x80));
                  *(undefined1 (*) [32])(local_830.ray + 0x200) = auVar164;
                  auVar164 = vmaskmovps_avx(auVar171,*(undefined1 (*) [32])(local_830.hit + 0xa0));
                  *(undefined1 (*) [32])(local_830.ray + 0x220) = auVar164;
                  auVar164 = vmaskmovps_avx(auVar171,*(undefined1 (*) [32])(local_830.hit + 0xc0));
                  *(undefined1 (*) [32])(local_830.ray + 0x240) = auVar164;
                  auVar164 = vmaskmovps_avx(auVar171,*(undefined1 (*) [32])(local_830.hit + 0xe0));
                  *(undefined1 (*) [32])(local_830.ray + 0x260) = auVar164;
                  auVar164 = vmaskmovps_avx(auVar171,*(undefined1 (*) [32])(local_830.hit + 0x100));
                  *(undefined1 (*) [32])(local_830.ray + 0x280) = auVar164;
                }
              }
              auVar164 = local_460;
              if ((((((((auVar171 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar171 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar171 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar171 >> 0x7f,0) == '\0') &&
                    (auVar171 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar171 >> 0xbf,0) == '\0') &&
                  (auVar171 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar171[0x1f]) {
                *(int *)(ray + k * 4 + 0x100) = auVar206._0_4_;
              }
              else {
                auVar206 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
              }
              *(undefined4 *)(local_620 + uVar144 * 4) = 0;
              auVar253 = vshufps_avx(auVar206._0_16_,auVar206._0_16_,0);
              auVar172._16_16_ = auVar253;
              auVar172._0_16_ = auVar253;
              auVar26 = vcmpps_avx(auVar164,auVar172,2);
              auVar241 = vandps_avx(auVar26,local_620);
              local_620 = local_620 & auVar26;
              if ((((((((local_620 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (local_620 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_620 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_620 >> 0x7f,0) == '\0') &&
                    (local_620 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(local_620 >> 0xbf,0) == '\0') &&
                  (local_620 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < local_620[0x1f]) break;
              auVar205._8_4_ = 0x7f800000;
              auVar205._0_8_ = 0x7f8000007f800000;
              auVar205._12_4_ = 0x7f800000;
              auVar205._16_4_ = 0x7f800000;
              auVar205._20_4_ = 0x7f800000;
              auVar205._24_4_ = 0x7f800000;
              auVar205._28_4_ = 0x7f800000;
              auVar164 = vblendvps_avx(auVar205,auVar164,auVar241);
              auVar26 = vshufps_avx(auVar164,auVar164,0xb1);
              auVar26 = vminps_avx(auVar164,auVar26);
              auVar27 = vshufpd_avx(auVar26,auVar26,5);
              auVar26 = vminps_avx(auVar26,auVar27);
              auVar27 = vperm2f128_avx(auVar26,auVar26,1);
              auVar26 = vminps_avx(auVar26,auVar27);
              auVar26 = vcmpps_avx(auVar164,auVar26,0);
              auVar27 = auVar241 & auVar26;
              auVar164 = auVar241;
              if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar27 >> 0x7f,0) != '\0') ||
                    (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar27 >> 0xbf,0) != '\0') ||
                  (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar27[0x1f] < '\0') {
                auVar164 = vandps_avx(auVar26,auVar241);
              }
              uVar141 = vmovmskps_avx(auVar164);
              uVar140 = 0;
              if (uVar141 != 0) {
                for (; (uVar141 >> uVar140 & 1) == 0; uVar140 = uVar140 + 1) {
                }
              }
              uVar144 = (ulong)uVar140;
              local_620 = auVar241;
            }
          }
        }
      }
      auVar253 = local_7e0._0_16_;
    }
LAB_00ab48df:
    auVar271 = ZEXT3264(auVar396);
    auVar206 = ZEXT3264(local_5c0);
    auVar309 = ZEXT3264(_local_700);
    if (8 < (int)uVar20) {
      auVar216 = vpshufd_avx(ZEXT416(uVar20),0);
      local_540 = auVar216._0_4_;
      fStack_53c = auVar216._4_4_;
      fStack_538 = auVar216._8_4_;
      fStack_534 = auVar216._12_4_;
      auVar253 = vshufps_avx(auVar253,auVar253,0);
      local_440._16_16_ = auVar253;
      local_440._0_16_ = auVar253;
      auVar253 = vpermilps_avx(ZEXT416(uVar145),0);
      local_120._16_16_ = auVar253;
      local_120._0_16_ = auVar253;
      auVar153._0_4_ = 1.0 / (float)local_4e0._0_4_;
      auVar153._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar253 = vshufps_avx(auVar153,auVar153,0);
      register0x00001210 = auVar253;
      _local_140 = auVar253;
      auVar253 = vpermilps_avx(local_510,0);
      local_4e0._16_16_ = auVar253;
      local_4e0._0_16_ = auVar253;
      auVar253 = vpermilps_avx(local_500._0_16_,0);
      local_500._16_16_ = auVar253;
      local_500._0_16_ = auVar253;
      auVar164 = auVar324._0_32_;
      local_37c = uVar20;
      for (lVar146 = 8; local_5c0 = auVar206._0_32_, lVar146 < (long)auVar148; lVar146 = lVar146 + 8
          ) {
        pauVar7 = (undefined1 (*) [28])(bezier_basis0 + lVar146 * 4 + lVar143);
        fVar273 = *(float *)*pauVar7;
        fVar274 = *(float *)(*pauVar7 + 4);
        fVar245 = *(float *)(*pauVar7 + 8);
        fVar264 = *(float *)(*pauVar7 + 0xc);
        fVar276 = *(float *)(*pauVar7 + 0x10);
        fVar277 = *(float *)(*pauVar7 + 0x14);
        fVar278 = *(float *)(*pauVar7 + 0x18);
        auVar136 = *pauVar7;
        pauVar7 = (undefined1 (*) [28])(lVar143 + 0x21fb768 + lVar146 * 4);
        fVar289 = *(float *)*pauVar7;
        fVar291 = *(float *)(*pauVar7 + 4);
        fVar296 = *(float *)(*pauVar7 + 8);
        fVar298 = *(float *)(*pauVar7 + 0xc);
        fVar325 = *(float *)(*pauVar7 + 0x10);
        fVar243 = *(float *)(*pauVar7 + 0x14);
        fVar313 = *(float *)(*pauVar7 + 0x18);
        auVar135 = *pauVar7;
        pauVar7 = (undefined1 (*) [28])(lVar143 + 0x21fbbec + lVar146 * 4);
        fVar326 = *(float *)*pauVar7;
        fVar292 = *(float *)(*pauVar7 + 4);
        fVar244 = *(float *)(*pauVar7 + 8);
        fVar315 = *(float *)(*pauVar7 + 0xc);
        fVar327 = *(float *)(*pauVar7 + 0x10);
        fVar328 = *(float *)(*pauVar7 + 0x14);
        fVar246 = *(float *)(*pauVar7 + 0x18);
        auVar134 = *pauVar7;
        pauVar7 = (undefined1 (*) [28])(lVar143 + 0x21fc070 + lVar146 * 4);
        fVar210 = *(float *)*pauVar7;
        fVar295 = *(float *)(*pauVar7 + 4);
        fVar351 = *(float *)(*pauVar7 + 8);
        fVar176 = *(float *)(*pauVar7 + 0xc);
        fVar179 = *(float *)(*pauVar7 + 0x10);
        fVar181 = *(float *)(*pauVar7 + 0x14);
        fVar183 = *(float *)(*pauVar7 + 0x18);
        auVar133 = *pauVar7;
        fVar329 = auVar339._0_4_;
        fVar340 = auVar339._4_4_;
        fVar300 = auVar339._8_4_;
        fVar343 = auVar339._12_4_;
        fVar345 = auVar339._16_4_;
        fVar347 = auVar339._20_4_;
        fVar349 = auVar339._24_4_;
        fVar186 = fStack_4a4 + auVar387._28_4_ + fStack_4a4;
        fVar266 = fStack_4a4 + fStack_4a4 + fVar263;
        local_7e0._0_4_ =
             fVar273 * (float)local_420._0_4_ +
             fVar329 * fVar289 + (float)local_4c0._0_4_ * fVar210 + fVar188 * fVar326;
        local_7e0._4_4_ =
             fVar274 * (float)local_420._4_4_ +
             fVar340 * fVar291 + (float)local_4c0._4_4_ * fVar295 + fVar207 * fVar292;
        local_7e0._8_4_ =
             fVar245 * fStack_418 + fVar300 * fVar296 + fStack_4b8 * fVar351 + fVar208 * fVar244;
        local_7e0._12_4_ =
             fVar264 * fStack_414 + fVar343 * fVar298 + fStack_4b4 * fVar176 + fVar209 * fVar315;
        local_7e0._16_4_ =
             fVar276 * fStack_410 + fVar345 * fVar325 + fStack_4b0 * fVar179 + fVar188 * fVar327;
        local_7e0._20_4_ =
             fVar277 * fStack_40c + fVar347 * fVar243 + fStack_4ac * fVar181 + fVar207 * fVar328;
        local_7e0._24_4_ =
             fVar278 * fStack_408 + fVar349 * fVar313 + fStack_4a8 * fVar183 + fVar208 * fVar246;
        local_7e0._28_4_ = fStack_4a4 + fVar263 + fVar186;
        fVar359 = auVar271._0_4_;
        fVar242 = auVar271._4_4_;
        fVar262 = auVar271._8_4_;
        fVar275 = auVar271._12_4_;
        fVar265 = auVar271._16_4_;
        fVar287 = auVar271._20_4_;
        fVar293 = auVar271._24_4_;
        auVar225._0_4_ =
             fVar273 * fVar359 + fVar150 * fVar289 + auVar309._0_4_ * fVar326 + fVar248 * fVar210;
        auVar225._4_4_ =
             fVar274 * fVar242 + fVar173 * fVar291 + auVar309._4_4_ * fVar292 + fVar272 * fVar295;
        auVar225._8_4_ =
             fVar245 * fVar262 + fVar175 * fVar296 + auVar309._8_4_ * fVar244 + fVar247 * fVar351;
        auVar225._12_4_ =
             fVar264 * fVar275 + fVar178 * fVar298 + auVar309._12_4_ * fVar315 + fVar263 * fVar176;
        auVar225._16_4_ =
             fVar276 * fVar265 + fVar267 * fVar325 + auVar309._16_4_ * fVar327 + fVar248 * fVar179;
        auVar225._20_4_ =
             fVar277 * fVar287 + fVar260 * fVar243 + auVar309._20_4_ * fVar328 + fVar272 * fVar181;
        auVar225._24_4_ =
             fVar278 * fVar293 + fVar261 * fVar313 + auVar309._24_4_ * fVar246 + fVar247 * fVar183;
        auVar225._28_4_ = fVar186 + fStack_4a4 + fStack_4a4 + auVar286._28_4_;
        fVar151 = fVar273 * (float)local_2a0._0_4_ +
                  fVar289 * (float)local_280._0_4_ +
                  (float)local_a0._0_4_ * fVar326 + (float)local_c0._0_4_ * fVar210;
        fVar174 = fVar274 * (float)local_2a0._4_4_ +
                  fVar291 * (float)local_280._4_4_ +
                  (float)local_a0._4_4_ * fVar292 + (float)local_c0._4_4_ * fVar295;
        fVar177 = fVar245 * fStack_298 +
                  fVar296 * fStack_278 + fStack_98 * fVar244 + fStack_b8 * fVar351;
        fVar180 = fVar264 * fStack_294 +
                  fVar298 * fStack_274 + fStack_94 * fVar315 + fStack_b4 * fVar176;
        fVar182 = fVar276 * fStack_290 +
                  fVar325 * fStack_270 + fStack_90 * fVar327 + fStack_b0 * fVar179;
        fVar184 = fVar277 * fStack_28c +
                  fVar243 * fStack_26c + fStack_8c * fVar328 + fStack_ac * fVar181;
        fVar185 = fVar278 * fStack_288 +
                  fVar313 * fStack_268 + fStack_88 * fVar246 + fStack_a8 * fVar183;
        fVar186 = fVar186 + fVar266;
        pfVar1 = (float *)(bezier_basis1 + lVar146 * 4 + lVar143);
        fVar243 = *pfVar1;
        fVar313 = pfVar1[1];
        fVar326 = pfVar1[2];
        fVar292 = pfVar1[3];
        fVar244 = pfVar1[4];
        fVar315 = pfVar1[5];
        fVar327 = pfVar1[6];
        pfVar2 = (float *)(lVar143 + 0x21fdb88 + lVar146 * 4);
        fVar328 = *pfVar2;
        fVar246 = pfVar2[1];
        fVar210 = pfVar2[2];
        fVar295 = pfVar2[3];
        fVar351 = pfVar2[4];
        fVar176 = pfVar2[5];
        fVar179 = pfVar2[6];
        pfVar2 = (float *)(lVar143 + 0x21fe00c + lVar146 * 4);
        fVar181 = *pfVar2;
        fVar183 = pfVar2[1];
        fVar187 = pfVar2[2];
        fVar211 = pfVar2[3];
        fVar279 = pfVar2[4];
        fVar288 = pfVar2[5];
        fVar290 = pfVar2[6];
        pauVar7 = (undefined1 (*) [28])(lVar143 + 0x21fe490 + lVar146 * 4);
        fVar267 = *(float *)*pauVar7;
        fVar260 = *(float *)(*pauVar7 + 4);
        fVar261 = *(float *)(*pauVar7 + 8);
        fVar273 = *(float *)(*pauVar7 + 0xc);
        fVar274 = *(float *)(*pauVar7 + 0x10);
        fVar245 = *(float *)(*pauVar7 + 0x14);
        fVar264 = *(float *)(*pauVar7 + 0x18);
        auVar137 = *pauVar7;
        fVar325 = auVar339._28_4_;
        fVar277 = auVar309._28_4_;
        auVar387 = ZEXT3264(auVar271._0_32_);
        fVar276 = fVar277 + fVar277 + fVar266;
        auVar284._0_4_ =
             (float)local_420._0_4_ * fVar243 +
             fVar329 * fVar328 + fVar188 * fVar181 + fVar267 * (float)local_4c0._0_4_;
        auVar284._4_4_ =
             (float)local_420._4_4_ * fVar313 +
             fVar340 * fVar246 + fVar207 * fVar183 + fVar260 * (float)local_4c0._4_4_;
        auVar284._8_4_ =
             fStack_418 * fVar326 + fVar300 * fVar210 + fVar208 * fVar187 + fVar261 * fStack_4b8;
        auVar284._12_4_ =
             fStack_414 * fVar292 + fVar343 * fVar295 + fVar209 * fVar211 + fVar273 * fStack_4b4;
        auVar284._16_4_ =
             fStack_410 * fVar244 + fVar345 * fVar351 + fVar188 * fVar279 + fVar274 * fStack_4b0;
        auVar284._20_4_ =
             fStack_40c * fVar315 + fVar347 * fVar176 + fVar207 * fVar288 + fVar245 * fStack_4ac;
        auVar284._24_4_ =
             fStack_408 * fVar327 + fVar349 * fVar179 + fVar208 * fVar290 + fVar264 * fStack_4a8;
        auVar284._28_4_ = fVar277 + fVar325 + fVar276;
        auVar269._0_4_ =
             fVar359 * fVar243 +
             fVar328 * (float)local_780._0_4_ + fVar181 * auVar309._0_4_ + fVar248 * fVar267;
        auVar269._4_4_ =
             fVar242 * fVar313 +
             fVar246 * (float)local_780._4_4_ + fVar183 * auVar309._4_4_ + fVar272 * fVar260;
        auVar269._8_4_ =
             fVar262 * fVar326 + fVar210 * fStack_778 + fVar187 * auVar309._8_4_ + fVar247 * fVar261
        ;
        auVar269._12_4_ =
             fVar275 * fVar292 +
             fVar295 * fStack_774 + fVar211 * auVar309._12_4_ + fVar263 * fVar273;
        auVar269._16_4_ =
             fVar265 * fVar244 +
             fVar351 * fStack_770 + fVar279 * auVar309._16_4_ + fVar248 * fVar274;
        auVar269._20_4_ =
             fVar287 * fVar315 +
             fVar176 * fStack_76c + fVar288 * auVar309._20_4_ + fVar272 * fVar245;
        auVar269._24_4_ =
             fVar293 * fVar327 +
             fVar179 * fStack_768 + fVar290 * auVar309._24_4_ + fVar247 * fVar264;
        auVar269._28_4_ = fVar276 + fVar277 + fVar277 + auVar271._28_4_;
        local_5a0._0_4_ =
             fVar328 * (float)local_280._0_4_ +
             (float)local_a0._0_4_ * fVar181 + (float)local_c0._0_4_ * fVar267 +
             fVar243 * (float)local_2a0._0_4_;
        local_5a0._4_4_ =
             fVar246 * (float)local_280._4_4_ +
             (float)local_a0._4_4_ * fVar183 + (float)local_c0._4_4_ * fVar260 +
             fVar313 * (float)local_2a0._4_4_;
        fStack_598 = fVar210 * fStack_278 + fStack_98 * fVar187 + fStack_b8 * fVar261 +
                     fVar326 * fStack_298;
        fStack_594 = fVar295 * fStack_274 + fStack_94 * fVar211 + fStack_b4 * fVar273 +
                     fVar292 * fStack_294;
        fStack_590 = fVar351 * fStack_270 + fStack_90 * fVar279 + fStack_b0 * fVar274 +
                     fVar244 * fStack_290;
        fStack_58c = fVar176 * fStack_26c + fStack_8c * fVar288 + fStack_ac * fVar245 +
                     fVar315 * fStack_28c;
        fStack_588 = fVar179 * fStack_268 + fStack_88 * fVar290 + fStack_a8 * fVar264 +
                     fVar327 * fStack_288;
        fStack_584 = fVar277 + fVar277 + fVar325 + fVar276;
        auVar26 = vsubps_avx(auVar284,local_7e0);
        auVar321 = vsubps_avx(auVar269,auVar225);
        fVar267 = auVar26._0_4_;
        fVar261 = auVar26._4_4_;
        auVar84._4_4_ = auVar225._4_4_ * fVar261;
        auVar84._0_4_ = auVar225._0_4_ * fVar267;
        fVar274 = auVar26._8_4_;
        auVar84._8_4_ = auVar225._8_4_ * fVar274;
        fVar264 = auVar26._12_4_;
        auVar84._12_4_ = auVar225._12_4_ * fVar264;
        fVar277 = auVar26._16_4_;
        auVar84._16_4_ = auVar225._16_4_ * fVar277;
        fVar289 = auVar26._20_4_;
        auVar84._20_4_ = auVar225._20_4_ * fVar289;
        fVar296 = auVar26._24_4_;
        auVar84._24_4_ = auVar225._24_4_ * fVar296;
        auVar84._28_4_ = fVar276;
        fVar260 = auVar321._0_4_;
        fVar273 = auVar321._4_4_;
        auVar85._4_4_ = local_7e0._4_4_ * fVar273;
        auVar85._0_4_ = (float)local_7e0._0_4_ * fVar260;
        fVar245 = auVar321._8_4_;
        auVar85._8_4_ = local_7e0._8_4_ * fVar245;
        fVar276 = auVar321._12_4_;
        auVar85._12_4_ = local_7e0._12_4_ * fVar276;
        fVar278 = auVar321._16_4_;
        auVar85._16_4_ = local_7e0._16_4_ * fVar278;
        fVar291 = auVar321._20_4_;
        auVar85._20_4_ = local_7e0._20_4_ * fVar291;
        fVar298 = auVar321._24_4_;
        auVar85._24_4_ = local_7e0._24_4_ * fVar298;
        auVar85._28_4_ = auVar269._28_4_;
        auVar27 = vsubps_avx(auVar84,auVar85);
        auVar130._4_4_ = fVar174;
        auVar130._0_4_ = fVar151;
        auVar130._8_4_ = fVar177;
        auVar130._12_4_ = fVar180;
        auVar130._16_4_ = fVar182;
        auVar130._20_4_ = fVar184;
        auVar130._24_4_ = fVar185;
        auVar130._28_4_ = fVar186;
        auVar241 = vmaxps_avx(auVar130,_local_5a0);
        auVar86._4_4_ = auVar241._4_4_ * auVar241._4_4_ * (fVar261 * fVar261 + fVar273 * fVar273);
        auVar86._0_4_ = auVar241._0_4_ * auVar241._0_4_ * (fVar267 * fVar267 + fVar260 * fVar260);
        auVar86._8_4_ = auVar241._8_4_ * auVar241._8_4_ * (fVar274 * fVar274 + fVar245 * fVar245);
        auVar86._12_4_ = auVar241._12_4_ * auVar241._12_4_ * (fVar264 * fVar264 + fVar276 * fVar276)
        ;
        auVar86._16_4_ = auVar241._16_4_ * auVar241._16_4_ * (fVar277 * fVar277 + fVar278 * fVar278)
        ;
        auVar86._20_4_ = auVar241._20_4_ * auVar241._20_4_ * (fVar289 * fVar289 + fVar291 * fVar291)
        ;
        auVar86._24_4_ = auVar241._24_4_ * auVar241._24_4_ * (fVar296 * fVar296 + fVar298 * fVar298)
        ;
        auVar86._28_4_ = auVar284._28_4_ + auVar269._28_4_;
        auVar87._4_4_ = auVar27._4_4_ * auVar27._4_4_;
        auVar87._0_4_ = auVar27._0_4_ * auVar27._0_4_;
        auVar87._8_4_ = auVar27._8_4_ * auVar27._8_4_;
        auVar87._12_4_ = auVar27._12_4_ * auVar27._12_4_;
        auVar87._16_4_ = auVar27._16_4_ * auVar27._16_4_;
        auVar87._20_4_ = auVar27._20_4_ * auVar27._20_4_;
        auVar87._24_4_ = auVar27._24_4_ * auVar27._24_4_;
        auVar87._28_4_ = auVar27._28_4_;
        local_640 = vcmpps_avx(auVar87,auVar86,2);
        local_380 = (uint)lVar146;
        auVar216 = vpshufd_avx(ZEXT416(local_380),0);
        auVar253 = vpor_avx(auVar216,_DAT_01f4ad30);
        auVar216 = vpor_avx(auVar216,_DAT_01f7afa0);
        auVar131._4_4_ = fStack_53c;
        auVar131._0_4_ = local_540;
        auVar131._8_4_ = fStack_538;
        auVar131._12_4_ = fStack_534;
        auVar253 = vpcmpgtd_avx(auVar131,auVar253);
        auVar286 = ZEXT1664(auVar253);
        auVar216 = vpcmpgtd_avx(auVar131,auVar216);
        register0x00001310 = auVar216;
        _local_560 = auVar253;
        auVar241 = _local_560 & local_640;
        fVar150 = (float)local_780._0_4_;
        fVar173 = (float)local_780._4_4_;
        fVar175 = fStack_778;
        fVar178 = fStack_774;
        fVar267 = fStack_770;
        fVar260 = fStack_76c;
        fVar261 = fStack_768;
        if ((((((((auVar241 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar241 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar241 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar241 >> 0x7f,0) == '\0') &&
              (auVar241 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar241 >> 0xbf,0) == '\0') &&
            (auVar241 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar241[0x1f]) {
          auVar206 = ZEXT3264(local_5c0);
          auVar309 = ZEXT3264(_local_700);
          auVar339 = ZEXT3264(auVar339._0_32_);
          auVar271 = ZEXT3264(auVar271._0_32_);
        }
        else {
          local_660._0_4_ = auVar137._0_4_;
          local_660._4_4_ = auVar137._4_4_;
          fStack_658 = auVar137._8_4_;
          fStack_654 = auVar137._12_4_;
          fStack_650 = auVar137._16_4_;
          fStack_64c = auVar137._20_4_;
          fStack_648 = auVar137._24_4_;
          local_660._0_4_ =
               fVar243 * (float)local_680._0_4_ +
               fVar328 * (float)local_e0._0_4_ +
               fVar181 * (float)local_100._0_4_ + (float)local_400._0_4_ * (float)local_660._0_4_;
          local_660._4_4_ =
               fVar313 * (float)local_680._4_4_ +
               fVar246 * (float)local_e0._4_4_ +
               fVar183 * (float)local_100._4_4_ + (float)local_400._4_4_ * (float)local_660._4_4_;
          fStack_658 = fVar326 * fStack_678 +
                       fVar210 * fStack_d8 + fVar187 * fStack_f8 + fStack_3f8 * fStack_658;
          fStack_654 = fVar292 * fStack_674 +
                       fVar295 * fStack_d4 + fVar211 * fStack_f4 + fStack_3f4 * fStack_654;
          fStack_650 = fVar244 * fStack_670 +
                       fVar351 * fStack_d0 + fVar279 * fStack_f0 + fStack_3f0 * fStack_650;
          fStack_64c = fVar315 * fStack_66c +
                       fVar176 * fStack_cc + fVar288 * fStack_ec + fStack_3ec * fStack_64c;
          fStack_648 = fVar327 * fStack_668 +
                       fVar179 * fStack_c8 + fVar290 * fStack_e8 + fStack_3e8 * fStack_648;
          fStack_644 = pfVar1[7] + fStack_764 + local_640._28_4_ + 0.0;
          local_6c0._0_4_ = auVar135._0_4_;
          local_6c0._4_4_ = auVar135._4_4_;
          fStack_6b8 = auVar135._8_4_;
          fStack_6b4 = auVar135._12_4_;
          uStack_6b0._0_4_ = auVar135._16_4_;
          uStack_6b0._4_4_ = auVar135._20_4_;
          uStack_6a8._0_4_ = auVar135._24_4_;
          local_6e0._0_4_ = auVar134._0_4_;
          local_6e0._4_4_ = auVar134._4_4_;
          uStack_6d8._0_4_ = auVar134._8_4_;
          uStack_6d8._4_4_ = auVar134._12_4_;
          uStack_6d0._0_4_ = auVar134._16_4_;
          uStack_6d0._4_4_ = auVar134._20_4_;
          uStack_6c8._0_4_ = auVar134._24_4_;
          local_8e0._0_4_ = auVar133._0_4_;
          local_8e0._4_4_ = auVar133._4_4_;
          fStack_8d8 = auVar133._8_4_;
          fStack_8d4 = auVar133._12_4_;
          fStack_8d0 = auVar133._16_4_;
          fStack_8cc = auVar133._20_4_;
          fStack_8c8 = auVar133._24_4_;
          fVar279 = (float)local_400._0_4_ * (float)local_8e0._0_4_;
          fVar288 = (float)local_400._4_4_ * (float)local_8e0._4_4_;
          fVar290 = fStack_3f8 * fStack_8d8;
          fVar266 = fStack_3f4 * fStack_8d4;
          fVar294 = fStack_3f0 * fStack_8d0;
          fVar297 = fStack_3ec * fStack_8cc;
          fVar299 = fStack_3e8 * fStack_8c8;
          pfVar1 = (float *)(lVar143 + 0x21fcdfc + lVar146 * 4);
          fVar273 = *pfVar1;
          fVar274 = pfVar1[1];
          fVar245 = pfVar1[2];
          fVar264 = pfVar1[3];
          fVar276 = pfVar1[4];
          fVar277 = pfVar1[5];
          fVar278 = pfVar1[6];
          pfVar2 = (float *)(lVar143 + 0x21fd280 + lVar146 * 4);
          fVar289 = *pfVar2;
          fVar291 = pfVar2[1];
          fVar296 = pfVar2[2];
          fVar298 = pfVar2[3];
          fVar243 = pfVar2[4];
          fVar313 = pfVar2[5];
          fVar326 = pfVar2[6];
          pfVar3 = (float *)(lVar143 + 0x21fc978 + lVar146 * 4);
          fVar292 = *pfVar3;
          fVar244 = pfVar3[1];
          fVar315 = pfVar3[2];
          fVar327 = pfVar3[3];
          fVar328 = pfVar3[4];
          fVar246 = pfVar3[5];
          fVar210 = pfVar3[6];
          fVar187 = pfVar1[7] + pfVar2[7];
          fVar211 = pfVar2[7] + fVar325 + 0.0;
          fVar301 = fVar325 + auVar271._28_4_ + fVar325 + 0.0;
          pfVar1 = (float *)(lVar143 + 0x21fc4f4 + lVar146 * 4);
          fVar325 = *pfVar1;
          fVar295 = pfVar1[1];
          fVar351 = pfVar1[2];
          fVar176 = pfVar1[3];
          fVar179 = pfVar1[4];
          fVar181 = pfVar1[5];
          fVar183 = pfVar1[6];
          fStack_8c4 = fVar187 + fVar211;
          local_8e0._4_4_ =
               (float)local_420._4_4_ * fVar295 +
               fVar244 * fVar340 + fVar207 * fVar274 + (float)local_4c0._4_4_ * fVar291;
          local_8e0._0_4_ =
               (float)local_420._0_4_ * fVar325 +
               fVar292 * fVar329 + fVar188 * fVar273 + (float)local_4c0._0_4_ * fVar289;
          fStack_8d8 = fStack_418 * fVar351 +
                       fVar315 * fVar300 + fVar208 * fVar245 + fStack_4b8 * fVar296;
          fStack_8d4 = fStack_414 * fVar176 +
                       fVar327 * fVar343 + fVar209 * fVar264 + fStack_4b4 * fVar298;
          fStack_8d0 = fStack_410 * fVar179 +
                       fVar328 * fVar345 + fVar188 * fVar276 + fStack_4b0 * fVar243;
          fStack_8cc = fStack_40c * fVar181 +
                       fVar246 * fVar347 + fVar207 * fVar277 + fStack_4ac * fVar313;
          fStack_8c8 = fStack_408 * fVar183 +
                       fVar210 * fVar349 + fVar208 * fVar278 + fStack_4a8 * fVar326;
          auVar199._0_4_ =
               fVar359 * fVar325 +
               (float)local_700._0_4_ * fVar273 + fVar248 * fVar289 +
               fVar292 * (float)local_780._0_4_;
          auVar199._4_4_ =
               fVar242 * fVar295 +
               (float)local_700._4_4_ * fVar274 + fVar272 * fVar291 +
               fVar244 * (float)local_780._4_4_;
          auVar199._8_4_ =
               fVar262 * fVar351 + fStack_6f8 * fVar245 + fVar247 * fVar296 + fVar315 * fStack_778;
          auVar199._12_4_ =
               fVar275 * fVar176 + fStack_6f4 * fVar264 + fVar263 * fVar298 + fVar327 * fStack_774;
          auVar199._16_4_ =
               fVar265 * fVar179 + fStack_6f0 * fVar276 + fVar248 * fVar243 + fVar328 * fStack_770;
          auVar199._20_4_ =
               fVar287 * fVar181 + fStack_6ec * fVar277 + fVar272 * fVar313 + fVar246 * fStack_76c;
          auVar199._24_4_ =
               fVar293 * fVar183 + fStack_6e8 * fVar278 + fVar247 * fVar326 + fVar210 * fStack_768;
          auVar199._28_4_ = fVar211 + fVar301;
          auVar385._0_4_ =
               fVar292 * (float)local_e0._0_4_ +
               (float)local_100._0_4_ * fVar273 + (float)local_400._0_4_ * fVar289 +
               fVar325 * (float)local_680._0_4_;
          auVar385._4_4_ =
               fVar244 * (float)local_e0._4_4_ +
               (float)local_100._4_4_ * fVar274 + (float)local_400._4_4_ * fVar291 +
               fVar295 * (float)local_680._4_4_;
          auVar385._8_4_ =
               fVar315 * fStack_d8 + fStack_f8 * fVar245 + fStack_3f8 * fVar296 +
               fVar351 * fStack_678;
          auVar385._12_4_ =
               fVar327 * fStack_d4 + fStack_f4 * fVar264 + fStack_3f4 * fVar298 +
               fVar176 * fStack_674;
          auVar385._16_4_ =
               fVar328 * fStack_d0 + fStack_f0 * fVar276 + fStack_3f0 * fVar243 +
               fVar179 * fStack_670;
          auVar385._20_4_ =
               fVar246 * fStack_cc + fStack_ec * fVar277 + fStack_3ec * fVar313 +
               fVar181 * fStack_66c;
          auVar385._24_4_ =
               fVar210 * fStack_c8 + fStack_e8 * fVar278 + fStack_3e8 * fVar326 +
               fVar183 * fStack_668;
          auVar385._28_4_ = pfVar3[7] + fVar187 + fVar301;
          pfVar1 = (float *)(lVar143 + 0x21ff21c + lVar146 * 4);
          fVar359 = *pfVar1;
          fVar242 = pfVar1[1];
          fVar273 = pfVar1[2];
          fVar262 = pfVar1[3];
          fVar274 = pfVar1[4];
          fVar245 = pfVar1[5];
          fVar275 = pfVar1[6];
          pfVar2 = (float *)(lVar143 + 0x21ff6a0 + lVar146 * 4);
          fVar264 = *pfVar2;
          fVar276 = pfVar2[1];
          fVar265 = pfVar2[2];
          fVar277 = pfVar2[3];
          fVar278 = pfVar2[4];
          fVar287 = pfVar2[5];
          fVar289 = pfVar2[6];
          pfVar3 = (float *)(lVar143 + 0x21fed98 + lVar146 * 4);
          fVar291 = *pfVar3;
          fVar293 = pfVar3[1];
          fVar296 = pfVar3[2];
          fVar298 = pfVar3[3];
          fVar325 = pfVar3[4];
          fVar243 = pfVar3[5];
          fVar313 = pfVar3[6];
          pfVar4 = (float *)(lVar143 + 0x21fe914 + lVar146 * 4);
          fVar326 = *pfVar4;
          fVar292 = pfVar4[1];
          fVar244 = pfVar4[2];
          fVar315 = pfVar4[3];
          fVar327 = pfVar4[4];
          fVar328 = pfVar4[5];
          fVar246 = pfVar4[6];
          auVar337._0_4_ =
               (float)local_420._0_4_ * fVar326 +
               fVar291 * fVar329 + fVar188 * fVar359 + (float)local_4c0._0_4_ * fVar264;
          auVar337._4_4_ =
               (float)local_420._4_4_ * fVar292 +
               fVar293 * fVar340 + fVar207 * fVar242 + (float)local_4c0._4_4_ * fVar276;
          auVar337._8_4_ =
               fStack_418 * fVar244 + fVar296 * fVar300 + fVar208 * fVar273 + fStack_4b8 * fVar265;
          auVar337._12_4_ =
               fStack_414 * fVar315 + fVar298 * fVar343 + fVar209 * fVar262 + fStack_4b4 * fVar277;
          auVar337._16_4_ =
               fStack_410 * fVar327 + fVar325 * fVar345 + fVar188 * fVar274 + fStack_4b0 * fVar278;
          auVar337._20_4_ =
               fStack_40c * fVar328 + fVar243 * fVar347 + fVar207 * fVar245 + fStack_4ac * fVar287;
          auVar337._24_4_ =
               fStack_408 * fVar246 + fVar313 * fVar349 + fVar208 * fVar275 + fStack_4a8 * fVar289;
          auVar337._28_4_ = fStack_404 + fStack_404 + fStack_4a4 + fStack_404;
          auVar377._0_4_ =
               fVar326 * fVar394 +
               fVar291 * (float)local_780._0_4_ +
               (float)local_700._0_4_ * fVar359 + fVar248 * fVar264;
          auVar377._4_4_ =
               fVar292 * fVar400 +
               fVar293 * (float)local_780._4_4_ +
               (float)local_700._4_4_ * fVar242 + fVar272 * fVar276;
          auVar377._8_4_ =
               fVar244 * fVar401 + fVar296 * fStack_778 + fStack_6f8 * fVar273 + fVar247 * fVar265;
          auVar377._12_4_ =
               fVar315 * fVar402 + fVar298 * fStack_774 + fStack_6f4 * fVar262 + fVar263 * fVar277;
          auVar377._16_4_ =
               fVar327 * fVar394 + fVar325 * fStack_770 + fStack_6f0 * fVar274 + fVar248 * fVar278;
          auVar377._20_4_ =
               fVar328 * fVar400 + fVar243 * fStack_76c + fStack_6ec * fVar245 + fVar272 * fVar287;
          auVar377._24_4_ =
               fVar246 * fVar401 + fVar313 * fStack_768 + fStack_6e8 * fVar275 + fVar247 * fVar289;
          auVar377._28_4_ = fStack_404 + fStack_404 + fVar263 + fStack_404;
          auVar270._8_4_ = 0x7fffffff;
          auVar270._0_8_ = 0x7fffffff7fffffff;
          auVar270._12_4_ = 0x7fffffff;
          auVar270._16_4_ = 0x7fffffff;
          auVar270._20_4_ = 0x7fffffff;
          auVar270._24_4_ = 0x7fffffff;
          auVar270._28_4_ = 0x7fffffff;
          auVar241 = vandps_avx(_local_8e0,auVar270);
          auVar27 = vandps_avx(auVar199,auVar270);
          auVar27 = vmaxps_avx(auVar241,auVar27);
          auVar241 = vandps_avx(auVar385,auVar270);
          auVar27 = vmaxps_avx(auVar27,auVar241);
          auVar27 = vcmpps_avx(auVar27,local_440,1);
          auVar28 = vblendvps_avx(_local_8e0,auVar26,auVar27);
          auVar166._0_4_ =
               fVar326 * (float)local_680._0_4_ +
               fVar291 * (float)local_e0._0_4_ +
               (float)local_400._0_4_ * fVar264 + (float)local_100._0_4_ * fVar359;
          auVar166._4_4_ =
               fVar292 * (float)local_680._4_4_ +
               fVar293 * (float)local_e0._4_4_ +
               (float)local_400._4_4_ * fVar276 + (float)local_100._4_4_ * fVar242;
          auVar166._8_4_ =
               fVar244 * fStack_678 +
               fVar296 * fStack_d8 + fStack_3f8 * fVar265 + fStack_f8 * fVar273;
          auVar166._12_4_ =
               fVar315 * fStack_674 +
               fVar298 * fStack_d4 + fStack_3f4 * fVar277 + fStack_f4 * fVar262;
          auVar166._16_4_ =
               fVar327 * fStack_670 +
               fVar325 * fStack_d0 + fStack_3f0 * fVar278 + fStack_f0 * fVar274;
          auVar166._20_4_ =
               fVar328 * fStack_66c +
               fVar243 * fStack_cc + fStack_3ec * fVar287 + fStack_ec * fVar245;
          auVar166._24_4_ =
               fVar246 * fStack_668 +
               fVar313 * fStack_c8 + fStack_3e8 * fVar289 + fStack_e8 * fVar275;
          auVar166._28_4_ = auVar241._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
          auVar29 = vblendvps_avx(auVar199,auVar321,auVar27);
          auVar241 = vandps_avx(auVar337,auVar270);
          auVar27 = vandps_avx(auVar377,auVar270);
          auVar30 = vmaxps_avx(auVar241,auVar27);
          auVar241 = vandps_avx(auVar166,auVar270);
          auVar241 = vmaxps_avx(auVar30,auVar241);
          local_7c0._0_4_ = auVar136._0_4_;
          local_7c0._4_4_ = auVar136._4_4_;
          uStack_7b8._0_4_ = auVar136._8_4_;
          uStack_7b8._4_4_ = auVar136._12_4_;
          uStack_7b0._0_4_ = auVar136._16_4_;
          uStack_7b0._4_4_ = auVar136._20_4_;
          uStack_7a8._0_4_ = auVar136._24_4_;
          auVar27 = vcmpps_avx(auVar241,local_440,1);
          auVar241 = vblendvps_avx(auVar337,auVar26,auVar27);
          auVar167._0_4_ =
               (float)local_680._0_4_ * (float)local_7c0._0_4_ +
               (float)local_e0._0_4_ * (float)local_6c0._0_4_ +
               (float)local_100._0_4_ * (float)local_6e0._0_4_ + fVar279;
          auVar167._4_4_ =
               (float)local_680._4_4_ * (float)local_7c0._4_4_ +
               (float)local_e0._4_4_ * (float)local_6c0._4_4_ +
               (float)local_100._4_4_ * (float)local_6e0._4_4_ + fVar288;
          auVar167._8_4_ =
               fStack_678 * (float)uStack_7b8 +
               fStack_d8 * fStack_6b8 + fStack_f8 * (float)uStack_6d8 + fVar290;
          auVar167._12_4_ =
               fStack_674 * uStack_7b8._4_4_ +
               fStack_d4 * fStack_6b4 + fStack_f4 * uStack_6d8._4_4_ + fVar266;
          auVar167._16_4_ =
               fStack_670 * (float)uStack_7b0 +
               fStack_d0 * (float)uStack_6b0 + fStack_f0 * (float)uStack_6d0 + fVar294;
          auVar167._20_4_ =
               fStack_66c * uStack_7b0._4_4_ +
               fStack_cc * uStack_6b0._4_4_ + fStack_ec * uStack_6d0._4_4_ + fVar297;
          auVar167._24_4_ =
               fStack_668 * (float)uStack_7a8 +
               fStack_c8 * (float)uStack_6a8 + fStack_e8 * (float)uStack_6c8 + fVar299;
          auVar167._28_4_ = auVar30._28_4_ + fStack_644 + local_640._28_4_ + 0.0;
          auVar26 = vblendvps_avx(auVar377,auVar321,auVar27);
          fVar187 = auVar28._0_4_;
          fVar211 = auVar28._4_4_;
          fVar279 = auVar28._8_4_;
          fVar288 = auVar28._12_4_;
          fVar290 = auVar28._16_4_;
          fVar266 = auVar28._20_4_;
          fVar329 = auVar28._24_4_;
          fVar340 = auVar28._28_4_;
          fVar291 = auVar241._0_4_;
          fVar296 = auVar241._4_4_;
          fVar325 = auVar241._8_4_;
          fVar313 = auVar241._12_4_;
          fVar292 = auVar241._16_4_;
          fVar315 = auVar241._20_4_;
          fVar328 = auVar241._24_4_;
          fVar359 = auVar29._0_4_;
          fVar273 = auVar29._4_4_;
          fVar274 = auVar29._8_4_;
          fVar275 = auVar29._12_4_;
          fVar276 = auVar29._16_4_;
          fVar277 = auVar29._20_4_;
          fVar287 = auVar29._24_4_;
          auVar358._0_4_ = fVar359 * fVar359 + fVar187 * fVar187;
          auVar358._4_4_ = fVar273 * fVar273 + fVar211 * fVar211;
          auVar358._8_4_ = fVar274 * fVar274 + fVar279 * fVar279;
          auVar358._12_4_ = fVar275 * fVar275 + fVar288 * fVar288;
          auVar358._16_4_ = fVar276 * fVar276 + fVar290 * fVar290;
          auVar358._20_4_ = fVar277 * fVar277 + fVar266 * fVar266;
          auVar358._24_4_ = fVar287 * fVar287 + fVar329 * fVar329;
          auVar358._28_4_ = fStack_404 + fStack_8c4;
          auVar27 = vrsqrtps_avx(auVar358);
          fVar242 = auVar27._0_4_;
          fVar262 = auVar27._4_4_;
          auVar88._4_4_ = fVar262 * 1.5;
          auVar88._0_4_ = fVar242 * 1.5;
          fVar245 = auVar27._8_4_;
          auVar88._8_4_ = fVar245 * 1.5;
          fVar264 = auVar27._12_4_;
          auVar88._12_4_ = fVar264 * 1.5;
          fVar265 = auVar27._16_4_;
          auVar88._16_4_ = fVar265 * 1.5;
          fVar278 = auVar27._20_4_;
          auVar88._20_4_ = fVar278 * 1.5;
          fVar289 = auVar27._24_4_;
          auVar88._24_4_ = fVar289 * 1.5;
          auVar88._28_4_ = auVar377._28_4_;
          auVar89._4_4_ = fVar262 * fVar262 * fVar262 * auVar358._4_4_ * 0.5;
          auVar89._0_4_ = fVar242 * fVar242 * fVar242 * auVar358._0_4_ * 0.5;
          auVar89._8_4_ = fVar245 * fVar245 * fVar245 * auVar358._8_4_ * 0.5;
          auVar89._12_4_ = fVar264 * fVar264 * fVar264 * auVar358._12_4_ * 0.5;
          auVar89._16_4_ = fVar265 * fVar265 * fVar265 * auVar358._16_4_ * 0.5;
          auVar89._20_4_ = fVar278 * fVar278 * fVar278 * auVar358._20_4_ * 0.5;
          auVar89._24_4_ = fVar289 * fVar289 * fVar289 * auVar358._24_4_ * 0.5;
          auVar89._28_4_ = auVar358._28_4_;
          auVar28 = vsubps_avx(auVar88,auVar89);
          fVar210 = auVar28._0_4_;
          fVar295 = auVar28._4_4_;
          fVar351 = auVar28._8_4_;
          fVar176 = auVar28._12_4_;
          fVar179 = auVar28._16_4_;
          fVar181 = auVar28._20_4_;
          fVar183 = auVar28._24_4_;
          fVar242 = auVar26._0_4_;
          fVar262 = auVar26._4_4_;
          fVar245 = auVar26._8_4_;
          fVar264 = auVar26._12_4_;
          fVar265 = auVar26._16_4_;
          fVar278 = auVar26._20_4_;
          fVar289 = auVar26._24_4_;
          auVar322._0_4_ = fVar242 * fVar242 + fVar291 * fVar291;
          auVar322._4_4_ = fVar262 * fVar262 + fVar296 * fVar296;
          auVar322._8_4_ = fVar245 * fVar245 + fVar325 * fVar325;
          auVar322._12_4_ = fVar264 * fVar264 + fVar313 * fVar313;
          auVar322._16_4_ = fVar265 * fVar265 + fVar292 * fVar292;
          auVar322._20_4_ = fVar278 * fVar278 + fVar315 * fVar315;
          auVar322._24_4_ = fVar289 * fVar289 + fVar328 * fVar328;
          auVar322._28_4_ = auVar27._28_4_ + auVar241._28_4_;
          auVar241 = vrsqrtps_avx(auVar322);
          fVar293 = auVar241._0_4_;
          fVar298 = auVar241._4_4_;
          auVar90._4_4_ = fVar298 * 1.5;
          auVar90._0_4_ = fVar293 * 1.5;
          fVar243 = auVar241._8_4_;
          auVar90._8_4_ = fVar243 * 1.5;
          fVar326 = auVar241._12_4_;
          auVar90._12_4_ = fVar326 * 1.5;
          fVar244 = auVar241._16_4_;
          auVar90._16_4_ = fVar244 * 1.5;
          fVar327 = auVar241._20_4_;
          auVar90._20_4_ = fVar327 * 1.5;
          fVar246 = auVar241._24_4_;
          auVar90._24_4_ = fVar246 * 1.5;
          auVar90._28_4_ = auVar377._28_4_;
          auVar91._4_4_ = fVar298 * fVar298 * fVar298 * auVar322._4_4_ * 0.5;
          auVar91._0_4_ = fVar293 * fVar293 * fVar293 * auVar322._0_4_ * 0.5;
          auVar91._8_4_ = fVar243 * fVar243 * fVar243 * auVar322._8_4_ * 0.5;
          auVar91._12_4_ = fVar326 * fVar326 * fVar326 * auVar322._12_4_ * 0.5;
          auVar91._16_4_ = fVar244 * fVar244 * fVar244 * auVar322._16_4_ * 0.5;
          auVar91._20_4_ = fVar327 * fVar327 * fVar327 * auVar322._20_4_ * 0.5;
          auVar91._24_4_ = fVar246 * fVar246 * fVar246 * auVar322._24_4_ * 0.5;
          auVar91._28_4_ = auVar322._28_4_;
          auVar26 = vsubps_avx(auVar90,auVar91);
          fVar293 = auVar26._0_4_;
          fVar298 = auVar26._4_4_;
          fVar243 = auVar26._8_4_;
          fVar326 = auVar26._12_4_;
          fVar244 = auVar26._16_4_;
          fVar327 = auVar26._20_4_;
          fVar246 = auVar26._24_4_;
          fVar359 = fVar151 * fVar210 * fVar359;
          fVar273 = fVar174 * fVar295 * fVar273;
          auVar92._4_4_ = fVar273;
          auVar92._0_4_ = fVar359;
          fVar274 = fVar177 * fVar351 * fVar274;
          auVar92._8_4_ = fVar274;
          fVar275 = fVar180 * fVar176 * fVar275;
          auVar92._12_4_ = fVar275;
          fVar276 = fVar182 * fVar179 * fVar276;
          auVar92._16_4_ = fVar276;
          fVar277 = fVar184 * fVar181 * fVar277;
          auVar92._20_4_ = fVar277;
          fVar287 = fVar185 * fVar183 * fVar287;
          auVar92._24_4_ = fVar287;
          auVar92._28_4_ = auVar241._28_4_;
          local_7c0._4_4_ = fVar273 + local_7e0._4_4_;
          local_7c0._0_4_ = fVar359 + (float)local_7e0._0_4_;
          uStack_7b8._0_4_ = fVar274 + local_7e0._8_4_;
          uStack_7b8._4_4_ = fVar275 + local_7e0._12_4_;
          uStack_7b0._0_4_ = fVar276 + local_7e0._16_4_;
          uStack_7b0._4_4_ = fVar277 + local_7e0._20_4_;
          uStack_7a8._0_4_ = fVar287 + local_7e0._24_4_;
          uStack_7a8._4_4_ = auVar241._28_4_ + local_7e0._28_4_;
          fVar359 = fVar151 * fVar210 * -fVar187;
          fVar273 = fVar174 * fVar295 * -fVar211;
          auVar93._4_4_ = fVar273;
          auVar93._0_4_ = fVar359;
          fVar274 = fVar177 * fVar351 * -fVar279;
          auVar93._8_4_ = fVar274;
          fVar275 = fVar180 * fVar176 * -fVar288;
          auVar93._12_4_ = fVar275;
          fVar276 = fVar182 * fVar179 * -fVar290;
          auVar93._16_4_ = fVar276;
          fVar277 = fVar184 * fVar181 * -fVar266;
          auVar93._20_4_ = fVar277;
          fVar287 = fVar185 * fVar183 * -fVar329;
          auVar93._24_4_ = fVar287;
          auVar93._28_4_ = -fVar340;
          local_6c0._4_4_ = auVar225._4_4_ + fVar273;
          local_6c0._0_4_ = auVar225._0_4_ + fVar359;
          fStack_6b8 = auVar225._8_4_ + fVar274;
          fStack_6b4 = auVar225._12_4_ + fVar275;
          uStack_6b0._0_4_ = auVar225._16_4_ + fVar276;
          uStack_6b0._4_4_ = auVar225._20_4_ + fVar277;
          uStack_6a8._0_4_ = auVar225._24_4_ + fVar287;
          uStack_6a8._4_4_ = auVar225._28_4_ + -fVar340;
          fVar359 = fVar210 * 0.0 * fVar151;
          fVar273 = fVar295 * 0.0 * fVar174;
          auVar94._4_4_ = fVar273;
          auVar94._0_4_ = fVar359;
          fVar274 = fVar351 * 0.0 * fVar177;
          auVar94._8_4_ = fVar274;
          fVar275 = fVar176 * 0.0 * fVar180;
          auVar94._12_4_ = fVar275;
          fVar276 = fVar179 * 0.0 * fVar182;
          auVar94._16_4_ = fVar276;
          fVar277 = fVar181 * 0.0 * fVar184;
          auVar94._20_4_ = fVar277;
          fVar287 = fVar183 * 0.0 * fVar185;
          auVar94._24_4_ = fVar287;
          auVar94._28_4_ = fVar340;
          auVar241 = vsubps_avx(local_7e0,auVar92);
          auVar398._0_4_ = fVar359 + auVar167._0_4_;
          auVar398._4_4_ = fVar273 + auVar167._4_4_;
          auVar398._8_4_ = fVar274 + auVar167._8_4_;
          auVar398._12_4_ = fVar275 + auVar167._12_4_;
          auVar398._16_4_ = fVar276 + auVar167._16_4_;
          auVar398._20_4_ = fVar277 + auVar167._20_4_;
          auVar398._24_4_ = fVar287 + auVar167._24_4_;
          auVar398._28_4_ = fVar340 + auVar167._28_4_;
          fVar359 = (float)local_5a0._0_4_ * fVar293 * fVar242;
          fVar242 = (float)local_5a0._4_4_ * fVar298 * fVar262;
          auVar95._4_4_ = fVar242;
          auVar95._0_4_ = fVar359;
          fVar273 = fStack_598 * fVar243 * fVar245;
          auVar95._8_4_ = fVar273;
          fVar262 = fStack_594 * fVar326 * fVar264;
          auVar95._12_4_ = fVar262;
          fVar274 = fStack_590 * fVar244 * fVar265;
          auVar95._16_4_ = fVar274;
          fVar245 = fStack_58c * fVar327 * fVar278;
          auVar95._20_4_ = fVar245;
          fVar275 = fStack_588 * fVar246 * fVar289;
          auVar95._24_4_ = fVar275;
          auVar95._28_4_ = fVar186;
          auVar158 = vsubps_avx(auVar225,auVar93);
          auVar386._0_4_ = auVar284._0_4_ + fVar359;
          auVar386._4_4_ = auVar284._4_4_ + fVar242;
          auVar386._8_4_ = auVar284._8_4_ + fVar273;
          auVar386._12_4_ = auVar284._12_4_ + fVar262;
          auVar386._16_4_ = auVar284._16_4_ + fVar274;
          auVar386._20_4_ = auVar284._20_4_ + fVar245;
          auVar386._24_4_ = auVar284._24_4_ + fVar275;
          auVar386._28_4_ = auVar284._28_4_ + fVar186;
          fVar359 = fVar293 * -fVar291 * (float)local_5a0._0_4_;
          fVar242 = fVar298 * -fVar296 * (float)local_5a0._4_4_;
          auVar96._4_4_ = fVar242;
          auVar96._0_4_ = fVar359;
          fVar273 = fVar243 * -fVar325 * fStack_598;
          auVar96._8_4_ = fVar273;
          fVar262 = fVar326 * -fVar313 * fStack_594;
          auVar96._12_4_ = fVar262;
          fVar274 = fVar244 * -fVar292 * fStack_590;
          auVar96._16_4_ = fVar274;
          fVar245 = fVar327 * -fVar315 * fStack_58c;
          auVar96._20_4_ = fVar245;
          fVar275 = fVar246 * -fVar328 * fStack_588;
          auVar96._24_4_ = fVar275;
          auVar96._28_4_ = local_7e0._28_4_;
          auVar193 = vsubps_avx(auVar167,auVar94);
          auVar259._0_4_ = auVar269._0_4_ + fVar359;
          auVar259._4_4_ = auVar269._4_4_ + fVar242;
          auVar259._8_4_ = auVar269._8_4_ + fVar273;
          auVar259._12_4_ = auVar269._12_4_ + fVar262;
          auVar259._16_4_ = auVar269._16_4_ + fVar274;
          auVar259._20_4_ = auVar269._20_4_ + fVar245;
          auVar259._24_4_ = auVar269._24_4_ + fVar275;
          auVar259._28_4_ = auVar269._28_4_ + local_7e0._28_4_;
          fVar359 = fVar293 * 0.0 * (float)local_5a0._0_4_;
          fVar242 = fVar298 * 0.0 * (float)local_5a0._4_4_;
          auVar97._4_4_ = fVar242;
          auVar97._0_4_ = fVar359;
          fVar273 = fVar243 * 0.0 * fStack_598;
          auVar97._8_4_ = fVar273;
          fVar262 = fVar326 * 0.0 * fStack_594;
          auVar97._12_4_ = fVar262;
          fVar274 = fVar244 * 0.0 * fStack_590;
          auVar97._16_4_ = fVar274;
          fVar245 = fVar327 * 0.0 * fStack_58c;
          auVar97._20_4_ = fVar245;
          fVar275 = fVar246 * 0.0 * fStack_588;
          auVar97._24_4_ = fVar275;
          auVar97._28_4_ = auVar167._28_4_;
          auVar27 = vsubps_avx(auVar284,auVar95);
          auVar338._0_4_ = (float)local_660._0_4_ + fVar359;
          auVar338._4_4_ = (float)local_660._4_4_ + fVar242;
          auVar338._8_4_ = fStack_658 + fVar273;
          auVar338._12_4_ = fStack_654 + fVar262;
          auVar338._16_4_ = fStack_650 + fVar274;
          auVar338._20_4_ = fStack_64c + fVar245;
          auVar338._24_4_ = fStack_648 + fVar275;
          auVar338._28_4_ = fStack_644 + auVar167._28_4_;
          auVar28 = vsubps_avx(auVar269,auVar96);
          auVar29 = vsubps_avx(_local_660,auVar97);
          auVar30 = vsubps_avx(auVar259,auVar158);
          auVar31 = vsubps_avx(auVar338,auVar193);
          auVar98._4_4_ = auVar193._4_4_ * auVar30._4_4_;
          auVar98._0_4_ = auVar193._0_4_ * auVar30._0_4_;
          auVar98._8_4_ = auVar193._8_4_ * auVar30._8_4_;
          auVar98._12_4_ = auVar193._12_4_ * auVar30._12_4_;
          auVar98._16_4_ = auVar193._16_4_ * auVar30._16_4_;
          auVar98._20_4_ = auVar193._20_4_ * auVar30._20_4_;
          auVar98._24_4_ = auVar193._24_4_ * auVar30._24_4_;
          auVar98._28_4_ = auVar377._28_4_;
          auVar99._4_4_ = auVar158._4_4_ * auVar31._4_4_;
          auVar99._0_4_ = auVar158._0_4_ * auVar31._0_4_;
          auVar99._8_4_ = auVar158._8_4_ * auVar31._8_4_;
          auVar99._12_4_ = auVar158._12_4_ * auVar31._12_4_;
          auVar99._16_4_ = auVar158._16_4_ * auVar31._16_4_;
          auVar99._20_4_ = auVar158._20_4_ * auVar31._20_4_;
          auVar99._24_4_ = auVar158._24_4_ * auVar31._24_4_;
          auVar99._28_4_ = fStack_644;
          auVar41 = vsubps_avx(auVar99,auVar98);
          auVar100._4_4_ = auVar241._4_4_ * auVar31._4_4_;
          auVar100._0_4_ = auVar241._0_4_ * auVar31._0_4_;
          auVar100._8_4_ = auVar241._8_4_ * auVar31._8_4_;
          auVar100._12_4_ = auVar241._12_4_ * auVar31._12_4_;
          auVar100._16_4_ = auVar241._16_4_ * auVar31._16_4_;
          auVar100._20_4_ = auVar241._20_4_ * auVar31._20_4_;
          auVar100._24_4_ = auVar241._24_4_ * auVar31._24_4_;
          auVar100._28_4_ = auVar31._28_4_;
          auVar31 = vsubps_avx(auVar386,auVar241);
          auVar101._4_4_ = auVar193._4_4_ * auVar31._4_4_;
          auVar101._0_4_ = auVar193._0_4_ * auVar31._0_4_;
          auVar101._8_4_ = auVar193._8_4_ * auVar31._8_4_;
          auVar101._12_4_ = auVar193._12_4_ * auVar31._12_4_;
          auVar101._16_4_ = auVar193._16_4_ * auVar31._16_4_;
          auVar101._20_4_ = auVar193._20_4_ * auVar31._20_4_;
          auVar101._24_4_ = auVar193._24_4_ * auVar31._24_4_;
          auVar101._28_4_ = auVar26._28_4_;
          auVar42 = vsubps_avx(auVar101,auVar100);
          auVar102._4_4_ = auVar158._4_4_ * auVar31._4_4_;
          auVar102._0_4_ = auVar158._0_4_ * auVar31._0_4_;
          auVar102._8_4_ = auVar158._8_4_ * auVar31._8_4_;
          auVar102._12_4_ = auVar158._12_4_ * auVar31._12_4_;
          auVar102._16_4_ = auVar158._16_4_ * auVar31._16_4_;
          auVar102._20_4_ = auVar158._20_4_ * auVar31._20_4_;
          auVar102._24_4_ = auVar158._24_4_ * auVar31._24_4_;
          auVar102._28_4_ = auVar26._28_4_;
          auVar103._4_4_ = auVar241._4_4_ * auVar30._4_4_;
          auVar103._0_4_ = auVar241._0_4_ * auVar30._0_4_;
          auVar103._8_4_ = auVar241._8_4_ * auVar30._8_4_;
          auVar103._12_4_ = auVar241._12_4_ * auVar30._12_4_;
          auVar103._16_4_ = auVar241._16_4_ * auVar30._16_4_;
          auVar103._20_4_ = auVar241._20_4_ * auVar30._20_4_;
          auVar103._24_4_ = auVar241._24_4_ * auVar30._24_4_;
          auVar103._28_4_ = auVar30._28_4_;
          auVar26 = vsubps_avx(auVar103,auVar102);
          auVar200._0_4_ = auVar41._0_4_ * 0.0 + auVar26._0_4_ + auVar42._0_4_ * 0.0;
          auVar200._4_4_ = auVar41._4_4_ * 0.0 + auVar26._4_4_ + auVar42._4_4_ * 0.0;
          auVar200._8_4_ = auVar41._8_4_ * 0.0 + auVar26._8_4_ + auVar42._8_4_ * 0.0;
          auVar200._12_4_ = auVar41._12_4_ * 0.0 + auVar26._12_4_ + auVar42._12_4_ * 0.0;
          auVar200._16_4_ = auVar41._16_4_ * 0.0 + auVar26._16_4_ + auVar42._16_4_ * 0.0;
          auVar200._20_4_ = auVar41._20_4_ * 0.0 + auVar26._20_4_ + auVar42._20_4_ * 0.0;
          auVar200._24_4_ = auVar41._24_4_ * 0.0 + auVar26._24_4_ + auVar42._24_4_ * 0.0;
          auVar200._28_4_ = auVar41._28_4_ + auVar26._28_4_ + auVar42._28_4_;
          auVar157 = vcmpps_avx(auVar200,ZEXT832(0) << 0x20,2);
          auVar26 = vblendvps_avx(auVar27,_local_7c0,auVar157);
          auVar27 = vblendvps_avx(auVar28,_local_6c0,auVar157);
          auVar28 = vblendvps_avx(auVar29,auVar398,auVar157);
          auVar29 = vblendvps_avx(auVar241,auVar386,auVar157);
          auVar30 = vblendvps_avx(auVar158,auVar259,auVar157);
          auVar31 = vblendvps_avx(auVar193,auVar338,auVar157);
          auVar41 = vblendvps_avx(auVar386,auVar241,auVar157);
          auVar42 = vblendvps_avx(auVar259,auVar158,auVar157);
          auVar156 = vblendvps_avx(auVar338,auVar193,auVar157);
          auVar241 = vandps_avx(local_640,_local_560);
          auVar41 = vsubps_avx(auVar41,auVar26);
          auVar194 = vsubps_avx(auVar42,auVar27);
          auVar156 = vsubps_avx(auVar156,auVar28);
          auVar195 = vsubps_avx(auVar27,auVar30);
          fVar359 = auVar194._0_4_;
          fVar297 = auVar28._0_4_;
          fVar264 = auVar194._4_4_;
          fVar299 = auVar28._4_4_;
          auVar104._4_4_ = fVar299 * fVar264;
          auVar104._0_4_ = fVar297 * fVar359;
          fVar291 = auVar194._8_4_;
          fVar301 = auVar28._8_4_;
          auVar104._8_4_ = fVar301 * fVar291;
          fVar326 = auVar194._12_4_;
          fVar311 = auVar28._12_4_;
          auVar104._12_4_ = fVar311 * fVar326;
          fVar210 = auVar194._16_4_;
          fVar312 = auVar28._16_4_;
          auVar104._16_4_ = fVar312 * fVar210;
          fVar187 = auVar194._20_4_;
          fVar314 = auVar28._20_4_;
          auVar104._20_4_ = fVar314 * fVar187;
          fVar340 = auVar194._24_4_;
          fVar316 = auVar28._24_4_;
          auVar104._24_4_ = fVar316 * fVar340;
          auVar104._28_4_ = auVar42._28_4_;
          fVar242 = auVar27._0_4_;
          fVar330 = auVar156._0_4_;
          fVar276 = auVar27._4_4_;
          fVar341 = auVar156._4_4_;
          auVar105._4_4_ = fVar341 * fVar276;
          auVar105._0_4_ = fVar330 * fVar242;
          fVar293 = auVar27._8_4_;
          fVar342 = auVar156._8_4_;
          auVar105._8_4_ = fVar342 * fVar293;
          fVar292 = auVar27._12_4_;
          fVar344 = auVar156._12_4_;
          auVar105._12_4_ = fVar344 * fVar292;
          fVar295 = auVar27._16_4_;
          fVar346 = auVar156._16_4_;
          auVar105._16_4_ = fVar346 * fVar295;
          fVar211 = auVar27._20_4_;
          fVar348 = auVar156._20_4_;
          auVar105._20_4_ = fVar348 * fVar211;
          fVar300 = auVar27._24_4_;
          fVar350 = auVar156._24_4_;
          uVar149 = auVar158._28_4_;
          auVar105._24_4_ = fVar350 * fVar300;
          auVar105._28_4_ = uVar149;
          auVar42 = vsubps_avx(auVar105,auVar104);
          fVar273 = auVar26._0_4_;
          fVar265 = auVar26._4_4_;
          auVar106._4_4_ = fVar341 * fVar265;
          auVar106._0_4_ = fVar330 * fVar273;
          fVar296 = auVar26._8_4_;
          auVar106._8_4_ = fVar342 * fVar296;
          fVar244 = auVar26._12_4_;
          auVar106._12_4_ = fVar344 * fVar244;
          fVar351 = auVar26._16_4_;
          auVar106._16_4_ = fVar346 * fVar351;
          fVar279 = auVar26._20_4_;
          auVar106._20_4_ = fVar348 * fVar279;
          fVar343 = auVar26._24_4_;
          auVar106._24_4_ = fVar350 * fVar343;
          auVar106._28_4_ = uVar149;
          fVar262 = auVar41._0_4_;
          fVar277 = auVar41._4_4_;
          auVar107._4_4_ = fVar299 * fVar277;
          auVar107._0_4_ = fVar297 * fVar262;
          fVar298 = auVar41._8_4_;
          auVar107._8_4_ = fVar301 * fVar298;
          fVar315 = auVar41._12_4_;
          auVar107._12_4_ = fVar311 * fVar315;
          fVar176 = auVar41._16_4_;
          auVar107._16_4_ = fVar312 * fVar176;
          fVar288 = auVar41._20_4_;
          auVar107._20_4_ = fVar314 * fVar288;
          fVar345 = auVar41._24_4_;
          auVar107._24_4_ = fVar316 * fVar345;
          auVar107._28_4_ = auVar386._28_4_;
          auVar158 = vsubps_avx(auVar107,auVar106);
          auVar108._4_4_ = fVar276 * fVar277;
          auVar108._0_4_ = fVar242 * fVar262;
          auVar108._8_4_ = fVar293 * fVar298;
          auVar108._12_4_ = fVar292 * fVar315;
          auVar108._16_4_ = fVar295 * fVar176;
          auVar108._20_4_ = fVar211 * fVar288;
          auVar108._24_4_ = fVar300 * fVar345;
          auVar108._28_4_ = uVar149;
          auVar109._4_4_ = fVar265 * fVar264;
          auVar109._0_4_ = fVar273 * fVar359;
          auVar109._8_4_ = fVar296 * fVar291;
          auVar109._12_4_ = fVar244 * fVar326;
          auVar109._16_4_ = fVar351 * fVar210;
          auVar109._20_4_ = fVar279 * fVar187;
          auVar109._24_4_ = fVar343 * fVar340;
          auVar109._28_4_ = auVar193._28_4_;
          auVar193 = vsubps_avx(auVar109,auVar108);
          auVar28 = vsubps_avx(auVar28,auVar31);
          fVar245 = auVar193._28_4_ + auVar158._28_4_;
          local_7e0._0_4_ = auVar193._0_4_ + auVar158._0_4_ * 0.0 + auVar42._0_4_ * 0.0;
          local_7e0._4_4_ = auVar193._4_4_ + auVar158._4_4_ * 0.0 + auVar42._4_4_ * 0.0;
          local_7e0._8_4_ = auVar193._8_4_ + auVar158._8_4_ * 0.0 + auVar42._8_4_ * 0.0;
          local_7e0._12_4_ = auVar193._12_4_ + auVar158._12_4_ * 0.0 + auVar42._12_4_ * 0.0;
          local_7e0._16_4_ = auVar193._16_4_ + auVar158._16_4_ * 0.0 + auVar42._16_4_ * 0.0;
          local_7e0._20_4_ = auVar193._20_4_ + auVar158._20_4_ * 0.0 + auVar42._20_4_ * 0.0;
          local_7e0._24_4_ = auVar193._24_4_ + auVar158._24_4_ * 0.0 + auVar42._24_4_ * 0.0;
          local_7e0._28_4_ = fVar245 + auVar42._28_4_;
          fVar274 = auVar195._0_4_;
          fVar278 = auVar195._4_4_;
          auVar110._4_4_ = auVar31._4_4_ * fVar278;
          auVar110._0_4_ = auVar31._0_4_ * fVar274;
          fVar325 = auVar195._8_4_;
          auVar110._8_4_ = auVar31._8_4_ * fVar325;
          fVar327 = auVar195._12_4_;
          auVar110._12_4_ = auVar31._12_4_ * fVar327;
          fVar179 = auVar195._16_4_;
          auVar110._16_4_ = auVar31._16_4_ * fVar179;
          fVar290 = auVar195._20_4_;
          auVar110._20_4_ = auVar31._20_4_ * fVar290;
          fVar347 = auVar195._24_4_;
          auVar110._24_4_ = auVar31._24_4_ * fVar347;
          auVar110._28_4_ = fVar245;
          fVar245 = auVar28._0_4_;
          fVar287 = auVar28._4_4_;
          auVar111._4_4_ = auVar30._4_4_ * fVar287;
          auVar111._0_4_ = auVar30._0_4_ * fVar245;
          fVar243 = auVar28._8_4_;
          auVar111._8_4_ = auVar30._8_4_ * fVar243;
          fVar328 = auVar28._12_4_;
          auVar111._12_4_ = auVar30._12_4_ * fVar328;
          fVar181 = auVar28._16_4_;
          auVar111._16_4_ = auVar30._16_4_ * fVar181;
          fVar266 = auVar28._20_4_;
          auVar111._20_4_ = auVar30._20_4_ * fVar266;
          fVar349 = auVar28._24_4_;
          auVar111._24_4_ = auVar30._24_4_ * fVar349;
          auVar111._28_4_ = auVar193._28_4_;
          auVar158 = vsubps_avx(auVar111,auVar110);
          auVar26 = vsubps_avx(auVar26,auVar29);
          auVar387 = ZEXT3264(auVar26);
          fVar275 = auVar26._0_4_;
          fVar289 = auVar26._4_4_;
          auVar112._4_4_ = auVar31._4_4_ * fVar289;
          auVar112._0_4_ = auVar31._0_4_ * fVar275;
          fVar313 = auVar26._8_4_;
          auVar112._8_4_ = auVar31._8_4_ * fVar313;
          fVar246 = auVar26._12_4_;
          auVar112._12_4_ = auVar31._12_4_ * fVar246;
          fVar183 = auVar26._16_4_;
          auVar112._16_4_ = auVar31._16_4_ * fVar183;
          fVar329 = auVar26._20_4_;
          auVar112._20_4_ = auVar31._20_4_ * fVar329;
          fVar294 = auVar26._24_4_;
          auVar112._24_4_ = auVar31._24_4_ * fVar294;
          auVar112._28_4_ = auVar31._28_4_;
          auVar113._4_4_ = fVar287 * auVar29._4_4_;
          auVar113._0_4_ = fVar245 * auVar29._0_4_;
          auVar113._8_4_ = fVar243 * auVar29._8_4_;
          auVar113._12_4_ = fVar328 * auVar29._12_4_;
          auVar113._16_4_ = fVar181 * auVar29._16_4_;
          auVar113._20_4_ = fVar266 * auVar29._20_4_;
          auVar113._24_4_ = fVar349 * auVar29._24_4_;
          auVar113._28_4_ = auVar42._28_4_;
          auVar26 = vsubps_avx(auVar112,auVar113);
          auVar114._4_4_ = auVar30._4_4_ * fVar289;
          auVar114._0_4_ = auVar30._0_4_ * fVar275;
          auVar114._8_4_ = auVar30._8_4_ * fVar313;
          auVar114._12_4_ = auVar30._12_4_ * fVar246;
          auVar114._16_4_ = auVar30._16_4_ * fVar183;
          auVar114._20_4_ = auVar30._20_4_ * fVar329;
          auVar114._24_4_ = auVar30._24_4_ * fVar294;
          auVar114._28_4_ = auVar30._28_4_;
          auVar115._4_4_ = fVar278 * auVar29._4_4_;
          auVar115._0_4_ = fVar274 * auVar29._0_4_;
          auVar115._8_4_ = fVar325 * auVar29._8_4_;
          auVar115._12_4_ = fVar327 * auVar29._12_4_;
          auVar115._16_4_ = fVar179 * auVar29._16_4_;
          auVar115._20_4_ = fVar290 * auVar29._20_4_;
          auVar115._24_4_ = fVar347 * auVar29._24_4_;
          auVar115._28_4_ = auVar29._28_4_;
          auVar29 = vsubps_avx(auVar115,auVar114);
          auVar168._0_4_ = auVar158._0_4_ * 0.0 + auVar29._0_4_ + auVar26._0_4_ * 0.0;
          auVar168._4_4_ = auVar158._4_4_ * 0.0 + auVar29._4_4_ + auVar26._4_4_ * 0.0;
          auVar168._8_4_ = auVar158._8_4_ * 0.0 + auVar29._8_4_ + auVar26._8_4_ * 0.0;
          auVar168._12_4_ = auVar158._12_4_ * 0.0 + auVar29._12_4_ + auVar26._12_4_ * 0.0;
          auVar168._16_4_ = auVar158._16_4_ * 0.0 + auVar29._16_4_ + auVar26._16_4_ * 0.0;
          auVar168._20_4_ = auVar158._20_4_ * 0.0 + auVar29._20_4_ + auVar26._20_4_ * 0.0;
          auVar168._24_4_ = auVar158._24_4_ * 0.0 + auVar29._24_4_ + auVar26._24_4_ * 0.0;
          auVar168._28_4_ = auVar26._28_4_ + auVar29._28_4_ + auVar26._28_4_;
          auVar26 = vmaxps_avx(local_7e0,auVar168);
          auVar26 = vcmpps_avx(auVar26,ZEXT1232(ZEXT412(0)) << 0x20,2);
          auVar29 = auVar241 & auVar26;
          auVar123 = auVar27;
          if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar29 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar29 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar29 >> 0x7f,0) == '\0') &&
                (auVar29 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar29 >> 0xbf,0) == '\0') &&
              (auVar29 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar29[0x1f]) {
LAB_00ab587d:
            auVar286 = ZEXT3264(auVar123);
            auVar324 = ZEXT3264(CONCAT824(uStack_5c8,
                                          CONCAT816(uStack_5d0,CONCAT88(uStack_5d8,local_5e0))));
            auVar379._4_4_ = fVar174;
            auVar379._0_4_ = fVar151;
            auVar379._8_4_ = fVar177;
            auVar379._12_4_ = fVar180;
            auVar379._16_4_ = fVar182;
            auVar379._20_4_ = fVar184;
            auVar379._24_4_ = fVar185;
            auVar379._28_4_ = fVar186;
          }
          else {
            auVar29 = vandps_avx(auVar26,auVar241);
            auVar116._4_4_ = fVar287 * fVar264;
            auVar116._0_4_ = fVar245 * fVar359;
            auVar116._8_4_ = fVar243 * fVar291;
            auVar116._12_4_ = fVar328 * fVar326;
            auVar116._16_4_ = fVar181 * fVar210;
            auVar116._20_4_ = fVar266 * fVar187;
            auVar116._24_4_ = fVar349 * fVar340;
            auVar116._28_4_ = auVar241._28_4_;
            auVar117._4_4_ = fVar278 * fVar341;
            auVar117._0_4_ = fVar274 * fVar330;
            auVar117._8_4_ = fVar325 * fVar342;
            auVar117._12_4_ = fVar327 * fVar344;
            auVar117._16_4_ = fVar179 * fVar346;
            auVar117._20_4_ = fVar290 * fVar348;
            auVar117._24_4_ = fVar347 * fVar350;
            auVar117._28_4_ = auVar26._28_4_;
            auVar26 = vsubps_avx(auVar117,auVar116);
            auVar118._4_4_ = fVar289 * fVar341;
            auVar118._0_4_ = fVar275 * fVar330;
            auVar118._8_4_ = fVar313 * fVar342;
            auVar118._12_4_ = fVar246 * fVar344;
            auVar118._16_4_ = fVar183 * fVar346;
            auVar118._20_4_ = fVar329 * fVar348;
            auVar118._24_4_ = fVar294 * fVar350;
            auVar118._28_4_ = auVar156._28_4_;
            auVar119._4_4_ = fVar287 * fVar277;
            auVar119._0_4_ = fVar245 * fVar262;
            auVar119._8_4_ = fVar243 * fVar298;
            auVar119._12_4_ = fVar328 * fVar315;
            auVar119._16_4_ = fVar181 * fVar176;
            auVar119._20_4_ = fVar266 * fVar288;
            auVar119._24_4_ = fVar349 * fVar345;
            auVar119._28_4_ = auVar28._28_4_;
            auVar30 = vsubps_avx(auVar119,auVar118);
            auVar120._4_4_ = fVar278 * fVar277;
            auVar120._0_4_ = fVar274 * fVar262;
            auVar120._8_4_ = fVar325 * fVar298;
            auVar120._12_4_ = fVar327 * fVar315;
            auVar120._16_4_ = fVar179 * fVar176;
            auVar120._20_4_ = fVar290 * fVar288;
            auVar120._24_4_ = fVar347 * fVar345;
            auVar120._28_4_ = auVar41._28_4_;
            auVar121._4_4_ = fVar289 * fVar264;
            auVar121._0_4_ = fVar275 * fVar359;
            auVar121._8_4_ = fVar313 * fVar291;
            auVar121._12_4_ = fVar246 * fVar326;
            auVar121._16_4_ = fVar183 * fVar210;
            auVar121._20_4_ = fVar329 * fVar187;
            auVar121._24_4_ = fVar294 * fVar340;
            auVar121._28_4_ = auVar194._28_4_;
            auVar31 = vsubps_avx(auVar121,auVar120);
            auVar323._0_4_ = auVar26._0_4_ * 0.0 + auVar31._0_4_ + auVar30._0_4_ * 0.0;
            auVar323._4_4_ = auVar26._4_4_ * 0.0 + auVar31._4_4_ + auVar30._4_4_ * 0.0;
            auVar323._8_4_ = auVar26._8_4_ * 0.0 + auVar31._8_4_ + auVar30._8_4_ * 0.0;
            auVar323._12_4_ = auVar26._12_4_ * 0.0 + auVar31._12_4_ + auVar30._12_4_ * 0.0;
            auVar323._16_4_ = auVar26._16_4_ * 0.0 + auVar31._16_4_ + auVar30._16_4_ * 0.0;
            auVar323._20_4_ = auVar26._20_4_ * 0.0 + auVar31._20_4_ + auVar30._20_4_ * 0.0;
            auVar323._24_4_ = auVar26._24_4_ * 0.0 + auVar31._24_4_ + auVar30._24_4_ * 0.0;
            auVar323._28_4_ = auVar195._28_4_ + auVar31._28_4_ + auVar41._28_4_;
            auVar241 = vrcpps_avx(auVar323);
            fVar359 = auVar241._0_4_;
            fVar262 = auVar241._4_4_;
            auVar122._4_4_ = auVar323._4_4_ * fVar262;
            auVar122._0_4_ = auVar323._0_4_ * fVar359;
            fVar274 = auVar241._8_4_;
            auVar122._8_4_ = auVar323._8_4_ * fVar274;
            fVar245 = auVar241._12_4_;
            auVar122._12_4_ = auVar323._12_4_ * fVar245;
            fVar275 = auVar241._16_4_;
            auVar122._16_4_ = auVar323._16_4_ * fVar275;
            fVar264 = auVar241._20_4_;
            auVar122._20_4_ = auVar323._20_4_ * fVar264;
            fVar277 = auVar241._24_4_;
            auVar122._24_4_ = auVar323._24_4_ * fVar277;
            auVar122._28_4_ = auVar28._28_4_;
            auVar378._8_4_ = 0x3f800000;
            auVar378._0_8_ = 0x3f8000003f800000;
            auVar378._12_4_ = 0x3f800000;
            auVar378._16_4_ = 0x3f800000;
            auVar378._20_4_ = 0x3f800000;
            auVar378._24_4_ = 0x3f800000;
            auVar378._28_4_ = 0x3f800000;
            auVar241 = vsubps_avx(auVar378,auVar122);
            fVar359 = auVar241._0_4_ * fVar359 + fVar359;
            fVar262 = auVar241._4_4_ * fVar262 + fVar262;
            fVar274 = auVar241._8_4_ * fVar274 + fVar274;
            fVar245 = auVar241._12_4_ * fVar245 + fVar245;
            fVar275 = auVar241._16_4_ * fVar275 + fVar275;
            fVar264 = auVar241._20_4_ * fVar264 + fVar264;
            fVar277 = auVar241._24_4_ * fVar277 + fVar277;
            fVar242 = auVar30._0_4_ * fVar242;
            fVar276 = auVar30._4_4_ * fVar276;
            auVar123._4_4_ = fVar276;
            auVar123._0_4_ = fVar242;
            fVar293 = auVar30._8_4_ * fVar293;
            auVar123._8_4_ = fVar293;
            fVar292 = auVar30._12_4_ * fVar292;
            auVar123._12_4_ = fVar292;
            fVar295 = auVar30._16_4_ * fVar295;
            auVar123._16_4_ = fVar295;
            fVar211 = auVar30._20_4_ * fVar211;
            auVar123._20_4_ = fVar211;
            fVar300 = auVar30._24_4_ * fVar300;
            auVar123._24_4_ = fVar300;
            auVar123._28_4_ = auVar27._28_4_;
            auVar124._4_4_ = (fVar265 * auVar26._4_4_ + fVar276 + fVar299 * auVar31._4_4_) * fVar262
            ;
            auVar124._0_4_ = (fVar273 * auVar26._0_4_ + fVar242 + fVar297 * auVar31._0_4_) * fVar359
            ;
            auVar124._8_4_ = (fVar296 * auVar26._8_4_ + fVar293 + fVar301 * auVar31._8_4_) * fVar274
            ;
            auVar124._12_4_ =
                 (fVar244 * auVar26._12_4_ + fVar292 + fVar311 * auVar31._12_4_) * fVar245;
            auVar124._16_4_ =
                 (fVar351 * auVar26._16_4_ + fVar295 + fVar312 * auVar31._16_4_) * fVar275;
            auVar124._20_4_ =
                 (fVar279 * auVar26._20_4_ + fVar211 + fVar314 * auVar31._20_4_) * fVar264;
            auVar124._24_4_ =
                 (fVar343 * auVar26._24_4_ + fVar300 + fVar316 * auVar31._24_4_) * fVar277;
            auVar124._28_4_ = auVar27._28_4_ + auVar31._28_4_;
            uVar149 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar240._4_4_ = uVar149;
            auVar240._0_4_ = uVar149;
            auVar240._8_4_ = uVar149;
            auVar240._12_4_ = uVar149;
            auVar240._16_4_ = uVar149;
            auVar240._20_4_ = uVar149;
            auVar240._24_4_ = uVar149;
            auVar240._28_4_ = uVar149;
            auVar26 = vcmpps_avx(local_120,auVar124,2);
            auVar241 = vcmpps_avx(auVar124,auVar240,2);
            auVar241 = vandps_avx(auVar26,auVar241);
            auVar27 = auVar29 & auVar241;
            if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar27 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar27 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar27 >> 0x7f,0) == '\0') &&
                  (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar27 >> 0xbf,0) == '\0') &&
                (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar27[0x1f]) goto LAB_00ab587d;
            auVar241 = vandps_avx(auVar29,auVar241);
            auVar286 = ZEXT3264(auVar241);
            auVar27 = vcmpps_avx(auVar323,ZEXT1232(ZEXT412(0)) << 0x20,4);
            auVar28 = auVar241 & auVar27;
            auVar324 = ZEXT3264(CONCAT824(uStack_5c8,
                                          CONCAT816(uStack_5d0,CONCAT88(uStack_5d8,local_5e0))));
            auVar379._4_4_ = fVar174;
            auVar379._0_4_ = fVar151;
            auVar379._8_4_ = fVar177;
            auVar379._12_4_ = fVar180;
            auVar379._16_4_ = fVar182;
            auVar379._20_4_ = fVar184;
            auVar379._24_4_ = fVar185;
            auVar379._28_4_ = fVar186;
            if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar28 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar28 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar28 >> 0x7f,0) != '\0') ||
                  (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar28 >> 0xbf,0) != '\0') ||
                (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar28[0x1f] < '\0') {
              auVar241 = vandps_avx(auVar27,auVar241);
              auVar324 = ZEXT3264(auVar241);
              auVar125._4_4_ = fVar262 * local_7e0._4_4_;
              auVar125._0_4_ = fVar359 * (float)local_7e0._0_4_;
              auVar125._8_4_ = fVar274 * local_7e0._8_4_;
              auVar125._12_4_ = fVar245 * local_7e0._12_4_;
              auVar125._16_4_ = fVar275 * local_7e0._16_4_;
              auVar125._20_4_ = fVar264 * local_7e0._20_4_;
              auVar125._24_4_ = fVar277 * local_7e0._24_4_;
              auVar125._28_4_ = auVar26._28_4_;
              auVar126._4_4_ = auVar168._4_4_ * fVar262;
              auVar126._0_4_ = auVar168._0_4_ * fVar359;
              auVar126._8_4_ = auVar168._8_4_ * fVar274;
              auVar126._12_4_ = auVar168._12_4_ * fVar245;
              auVar126._16_4_ = auVar168._16_4_ * fVar275;
              auVar126._20_4_ = auVar168._20_4_ * fVar264;
              auVar126._24_4_ = auVar168._24_4_ * fVar277;
              auVar126._28_4_ = auVar168._28_4_;
              auVar285._8_4_ = 0x3f800000;
              auVar285._0_8_ = 0x3f8000003f800000;
              auVar285._12_4_ = 0x3f800000;
              auVar285._16_4_ = 0x3f800000;
              auVar285._20_4_ = 0x3f800000;
              auVar285._24_4_ = 0x3f800000;
              auVar285._28_4_ = 0x3f800000;
              auVar286 = ZEXT3264(auVar285);
              auVar241 = vsubps_avx(auVar285,auVar125);
              local_5c0 = vblendvps_avx(auVar241,auVar125,auVar157);
              auVar241 = vsubps_avx(auVar285,auVar126);
              _local_4a0 = vblendvps_avx(auVar241,auVar126,auVar157);
              local_580 = auVar124;
            }
          }
          auVar339 = ZEXT3264(local_7a0);
          auVar241 = auVar324._0_32_;
          if ((((((((auVar241 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar241 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar241 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar241 >> 0x7f,0) != '\0') ||
                (auVar324 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
               SUB321(auVar241 >> 0xbf,0) != '\0') ||
              (auVar324 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
              auVar324[0x1f] < '\0') {
            auVar26 = vsubps_avx(_local_5a0,auVar379);
            fVar242 = auVar379._0_4_ + auVar26._0_4_ * local_5c0._0_4_;
            fVar273 = auVar379._4_4_ + auVar26._4_4_ * local_5c0._4_4_;
            fVar262 = auVar379._8_4_ + auVar26._8_4_ * local_5c0._8_4_;
            fVar274 = auVar379._12_4_ + auVar26._12_4_ * local_5c0._12_4_;
            fVar245 = auVar379._16_4_ + auVar26._16_4_ * local_5c0._16_4_;
            fVar275 = auVar379._20_4_ + auVar26._20_4_ * local_5c0._20_4_;
            fVar264 = auVar379._24_4_ + auVar26._24_4_ * local_5c0._24_4_;
            fVar276 = auVar379._28_4_ + auVar26._28_4_;
            fVar359 = *(float *)((long)local_708->ray_space + k * 4 + -0x20);
            auVar127._4_4_ = (fVar273 + fVar273) * fVar359;
            auVar127._0_4_ = (fVar242 + fVar242) * fVar359;
            auVar127._8_4_ = (fVar262 + fVar262) * fVar359;
            auVar127._12_4_ = (fVar274 + fVar274) * fVar359;
            auVar127._16_4_ = (fVar245 + fVar245) * fVar359;
            auVar127._20_4_ = (fVar275 + fVar275) * fVar359;
            auVar127._24_4_ = (fVar264 + fVar264) * fVar359;
            auVar127._28_4_ = fVar276 + fVar276;
            auVar26 = vcmpps_avx(local_580,auVar127,6);
            auVar27 = auVar241 & auVar26;
            auVar309 = ZEXT3264(_local_700);
            if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar27 >> 0x7f,0) != '\0') ||
                  (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar27 >> 0xbf,0) != '\0') ||
                (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar27[0x1f] < '\0') {
              local_3c0 = (float)local_4a0._0_4_ + (float)local_4a0._0_4_ + -1.0;
              fStack_3bc = (float)local_4a0._4_4_ + (float)local_4a0._4_4_ + -1.0;
              fStack_3b8 = (float)uStack_498 + (float)uStack_498 + -1.0;
              fStack_3b4 = uStack_498._4_4_ + uStack_498._4_4_ + -1.0;
              fStack_3b0 = (float)uStack_490 + (float)uStack_490 + -1.0;
              fStack_3ac = uStack_490._4_4_ + uStack_490._4_4_ + -1.0;
              fStack_3a8 = (float)uStack_488 + (float)uStack_488 + -1.0;
              fStack_3a4 = uStack_488._4_4_ + uStack_488._4_4_ + -1.0;
              local_3e0 = local_5c0;
              local_4a0._4_4_ = fStack_3bc;
              local_4a0._0_4_ = local_3c0;
              uStack_498._0_4_ = fStack_3b8;
              uStack_498._4_4_ = fStack_3b4;
              uStack_490._0_4_ = fStack_3b0;
              uStack_490._4_4_ = fStack_3ac;
              auVar138 = _local_4a0;
              uStack_488._0_4_ = fStack_3a8;
              uStack_488._4_4_ = fStack_3a4;
              auVar27 = _local_4a0;
              local_3a0 = local_580;
              uStack_368 = uStack_8e8;
              uStack_358 = uStack_838;
              uStack_348 = uStack_848;
              uStack_338 = uStack_858;
              pGVar22 = (context->scene->geometries).items[local_730].ptr;
              _local_4a0 = auVar27;
              if ((pGVar22->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                local_620 = vandps_avx(auVar26,auVar241);
                auVar215._0_4_ = (float)(int)local_380;
                auVar215._4_12_ = auVar158._4_12_;
                auVar253 = vshufps_avx(auVar215,auVar215,0);
                local_300[0] = (auVar253._0_4_ + local_5c0._0_4_ + 0.0) * (float)local_140._0_4_;
                local_300[1] = (auVar253._4_4_ + local_5c0._4_4_ + 1.0) * (float)local_140._4_4_;
                local_300[2] = (auVar253._8_4_ + local_5c0._8_4_ + 2.0) * fStack_138;
                local_300[3] = (auVar253._12_4_ + local_5c0._12_4_ + 3.0) * fStack_134;
                fStack_2f0 = (auVar253._0_4_ + local_5c0._16_4_ + 4.0) * fStack_130;
                fStack_2ec = (auVar253._4_4_ + local_5c0._20_4_ + 5.0) * fStack_12c;
                fStack_2e8 = (auVar253._8_4_ + local_5c0._24_4_ + 6.0) * fStack_128;
                fStack_2e4 = auVar253._12_4_ + local_5c0._28_4_ + 7.0;
                uStack_490 = auVar138._16_8_;
                uStack_488 = auVar27._24_8_;
                local_2e0 = local_4a0;
                uStack_2d8 = uStack_498;
                uStack_2d0 = uStack_490;
                uStack_2c8 = uStack_488;
                local_2c0 = local_580;
                auVar201._8_4_ = 0x7f800000;
                auVar201._0_8_ = 0x7f8000007f800000;
                auVar201._12_4_ = 0x7f800000;
                auVar201._16_4_ = 0x7f800000;
                auVar201._20_4_ = 0x7f800000;
                auVar201._24_4_ = 0x7f800000;
                auVar201._28_4_ = 0x7f800000;
                auVar241 = vblendvps_avx(auVar201,local_580,local_620);
                auVar26 = vshufps_avx(auVar241,auVar241,0xb1);
                auVar26 = vminps_avx(auVar241,auVar26);
                auVar27 = vshufpd_avx(auVar26,auVar26,5);
                auVar26 = vminps_avx(auVar26,auVar27);
                auVar27 = vperm2f128_avx(auVar26,auVar26,1);
                auVar26 = vminps_avx(auVar26,auVar27);
                auVar26 = vcmpps_avx(auVar241,auVar26,0);
                auVar27 = local_620 & auVar26;
                auVar241 = local_620;
                if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar27 >> 0x7f,0) != '\0') ||
                      (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar27 >> 0xbf,0) != '\0') ||
                    (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar27[0x1f] < '\0') {
                  auVar241 = vandps_avx(auVar26,local_620);
                }
                uVar140 = vmovmskps_avx(auVar241);
                uVar145 = 0;
                if (uVar140 != 0) {
                  for (; (uVar140 >> uVar145 & 1) == 0; uVar145 = uVar145 + 1) {
                  }
                }
                uVar144 = (ulong)uVar145;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar22->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar359 = local_300[uVar144];
                  uVar149 = *(undefined4 *)((long)&local_2e0 + uVar144 * 4);
                  fVar273 = 1.0 - fVar359;
                  fVar242 = fVar359 * fVar273 + fVar359 * fVar273;
                  auVar286 = ZEXT464(0x40400000);
                  auVar253 = ZEXT416((uint)(fVar359 * fVar359 * 3.0));
                  auVar253 = vshufps_avx(auVar253,auVar253,0);
                  auVar216 = ZEXT416((uint)((fVar242 - fVar359 * fVar359) * 3.0));
                  auVar216 = vshufps_avx(auVar216,auVar216,0);
                  auVar231 = ZEXT416((uint)((fVar273 * fVar273 - fVar242) * 3.0));
                  auVar231 = vshufps_avx(auVar231,auVar231,0);
                  auVar220 = ZEXT416((uint)(fVar273 * fVar273 * -3.0));
                  auVar220 = vshufps_avx(auVar220,auVar220,0);
                  auVar217._0_4_ =
                       auVar220._0_4_ * fVar302 +
                       auVar231._0_4_ * fVar388 +
                       auVar253._0_4_ * fVar367 + auVar216._0_4_ * fVar393;
                  auVar217._4_4_ =
                       auVar220._4_4_ * fVar310 +
                       auVar231._4_4_ * fVar392 +
                       auVar253._4_4_ * fVar380 + auVar216._4_4_ * fVar399;
                  auVar217._8_4_ =
                       auVar220._8_4_ * auVar303._8_4_ +
                       auVar231._8_4_ * auVar389._8_4_ +
                       auVar253._8_4_ * auVar368._8_4_ + auVar216._8_4_ * auVar395._8_4_;
                  auVar217._12_4_ =
                       auVar220._12_4_ * auVar303._12_4_ +
                       auVar231._12_4_ * auVar389._12_4_ +
                       auVar253._12_4_ * auVar368._12_4_ + auVar216._12_4_ * auVar395._12_4_;
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2c0 + uVar144 * 4);
                  *(float *)(ray + k * 4 + 0x180) = auVar217._0_4_;
                  uVar21 = vextractps_avx(auVar217,1);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar21;
                  uVar21 = vextractps_avx(auVar217,2);
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar21;
                  *(float *)(ray + k * 4 + 0x1e0) = fVar359;
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar149;
                  *(uint *)(ray + k * 4 + 0x220) = uVar19;
                  *(int *)(ray + k * 4 + 0x240) = (int)local_730;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                }
                else {
                  local_7c0 = auVar148;
                  stack0xfffffffffffff964 = auVar269._4_28_;
                  local_6a0._0_4_ = local_37c;
                  auVar253 = *local_718;
                  local_7e0._16_8_ = *(undefined8 *)(local_720 + 0x10);
                  local_7e0._24_8_ = *(undefined8 *)(local_720 + 0x18);
                  local_800._16_8_ = *(undefined8 *)(local_720 + 0x10);
                  local_800._0_16_ = *local_718;
                  local_800._24_8_ = *(undefined8 *)(local_720 + 0x18);
                  auVar206 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                  auVar241 = vcmpps_avx(_local_700,_local_700,0xf);
                  auVar324 = ZEXT3264(auVar241);
                  _local_6e0 = auVar321;
                  local_370 = auVar303._0_8_;
                  local_360 = auVar389._0_8_;
                  local_350 = auVar395._0_8_;
                  local_340 = auVar368._0_8_;
                  while( true ) {
                    local_200 = local_300[uVar144];
                    local_1e0 = *(undefined4 *)((long)&local_2e0 + uVar144 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2c0 + uVar144 * 4);
                    fVar359 = 1.0 - local_200;
                    fVar267 = local_200 * fVar359 + local_200 * fVar359;
                    auVar286 = ZEXT464(0x40400000);
                    auVar216 = ZEXT416((uint)(local_200 * local_200 * 3.0));
                    auVar216 = vshufps_avx(auVar216,auVar216,0);
                    auVar231 = ZEXT416((uint)((fVar267 - local_200 * local_200) * 3.0));
                    auVar231 = vshufps_avx(auVar231,auVar231,0);
                    auVar220 = ZEXT416((uint)((fVar359 * fVar359 - fVar267) * 3.0));
                    auVar220 = vshufps_avx(auVar220,auVar220,0);
                    local_830.context = context->user;
                    auVar218 = ZEXT416((uint)(fVar359 * fVar359 * -3.0));
                    auVar218 = vshufps_avx(auVar218,auVar218,0);
                    auVar219._0_4_ =
                         auVar218._0_4_ * fVar302 +
                         auVar220._0_4_ * fVar388 +
                         auVar216._0_4_ * fVar367 + auVar231._0_4_ * fVar393;
                    auVar219._4_4_ =
                         auVar218._4_4_ * fVar310 +
                         auVar220._4_4_ * fVar392 +
                         auVar216._4_4_ * fVar380 + auVar231._4_4_ * fVar399;
                    auVar219._8_4_ =
                         auVar218._8_4_ * auVar303._8_4_ +
                         auVar220._8_4_ * auVar389._8_4_ +
                         auVar216._8_4_ * auVar368._8_4_ + auVar231._8_4_ * auVar395._8_4_;
                    auVar219._12_4_ =
                         auVar218._12_4_ * auVar303._12_4_ +
                         auVar220._12_4_ * auVar389._12_4_ +
                         auVar216._12_4_ * auVar368._12_4_ + auVar231._12_4_ * auVar395._12_4_;
                    auStack_250 = vshufps_avx(auVar219,auVar219,0);
                    local_260[0] = (RTCHitN)auStack_250[0];
                    local_260[1] = (RTCHitN)auStack_250[1];
                    local_260[2] = (RTCHitN)auStack_250[2];
                    local_260[3] = (RTCHitN)auStack_250[3];
                    local_260[4] = (RTCHitN)auStack_250[4];
                    local_260[5] = (RTCHitN)auStack_250[5];
                    local_260[6] = (RTCHitN)auStack_250[6];
                    local_260[7] = (RTCHitN)auStack_250[7];
                    local_260[8] = (RTCHitN)auStack_250[8];
                    local_260[9] = (RTCHitN)auStack_250[9];
                    local_260[10] = (RTCHitN)auStack_250[10];
                    local_260[0xb] = (RTCHitN)auStack_250[0xb];
                    local_260[0xc] = (RTCHitN)auStack_250[0xc];
                    local_260[0xd] = (RTCHitN)auStack_250[0xd];
                    local_260[0xe] = (RTCHitN)auStack_250[0xe];
                    local_260[0xf] = (RTCHitN)auStack_250[0xf];
                    auStack_230 = vshufps_avx(auVar219,auVar219,0x55);
                    local_240 = auStack_230;
                    auStack_210 = vshufps_avx(auVar219,auVar219,0xaa);
                    local_220 = auStack_210;
                    fStack_1fc = local_200;
                    fStack_1f8 = local_200;
                    fStack_1f4 = local_200;
                    fStack_1f0 = local_200;
                    fStack_1ec = local_200;
                    fStack_1e8 = local_200;
                    fStack_1e4 = local_200;
                    uStack_1dc = local_1e0;
                    uStack_1d8 = local_1e0;
                    uStack_1d4 = local_1e0;
                    uStack_1d0 = local_1e0;
                    uStack_1cc = local_1e0;
                    uStack_1c8 = local_1e0;
                    uStack_1c4 = local_1e0;
                    local_1c0 = local_500._0_8_;
                    uStack_1b8 = local_500._8_8_;
                    uStack_1b0 = local_500._16_8_;
                    uStack_1a8 = local_500._24_8_;
                    local_1a0 = local_4e0._0_8_;
                    uStack_198 = local_4e0._8_8_;
                    uStack_190 = local_4e0._16_8_;
                    uStack_188 = local_4e0._24_8_;
                    local_710[1] = auVar324._0_32_;
                    *local_710 = auVar324._0_32_;
                    local_180 = (local_830.context)->instID[0];
                    uStack_17c = local_180;
                    uStack_178 = local_180;
                    uStack_174 = local_180;
                    uStack_170 = local_180;
                    uStack_16c = local_180;
                    uStack_168 = local_180;
                    uStack_164 = local_180;
                    local_160 = (local_830.context)->instPrimID[0];
                    uStack_15c = local_160;
                    uStack_158 = local_160;
                    uStack_154 = local_160;
                    uStack_150 = local_160;
                    uStack_14c = local_160;
                    uStack_148 = local_160;
                    uStack_144 = local_160;
                    local_760 = local_800._0_8_;
                    uStack_758 = local_800._8_8_;
                    uStack_750 = local_800._16_8_;
                    uStack_748 = local_800._24_8_;
                    local_830.valid = (int *)&local_760;
                    local_830.geometryUserPtr = pGVar22->userPtr;
                    local_830.hit = local_260;
                    local_830.N = 8;
                    auVar154 = local_7e0._0_16_;
                    auVar191 = auVar253;
                    local_830.ray = (RTCRayN *)ray;
                    if (pGVar22->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar286 = ZEXT1664(auVar286._0_16_);
                      auVar241 = ZEXT1632(auVar324._0_16_);
                      auVar387 = ZEXT1664(auVar387._0_16_);
                      (*pGVar22->intersectionFilterN)(&local_830);
                      auVar206 = ZEXT1664(auVar206._0_16_);
                      auVar241 = vcmpps_avx(auVar241,auVar241,0xf);
                      auVar324 = ZEXT3264(auVar241);
                      auVar191._8_8_ = uStack_758;
                      auVar191._0_8_ = local_760;
                      auVar154._8_8_ = uStack_748;
                      auVar154._0_8_ = uStack_750;
                    }
                    auVar216 = vpcmpeqd_avx(auVar191,ZEXT816(0) << 0x40);
                    auVar231 = vpcmpeqd_avx(auVar154,ZEXT816(0) << 0x40);
                    auVar226._16_16_ = auVar231;
                    auVar226._0_16_ = auVar216;
                    auVar241 = auVar324._0_32_ & ~auVar226;
                    if ((((((((auVar241 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar241 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar241 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar241 >> 0x7f,0) == '\0') &&
                          (auVar241 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar241 >> 0xbf,0) == '\0') &&
                        (auVar241 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar241[0x1f]) {
                      auVar169._0_4_ = auVar216._0_4_ ^ auVar324._0_4_;
                      auVar169._4_4_ = auVar216._4_4_ ^ auVar324._4_4_;
                      auVar169._8_4_ = auVar216._8_4_ ^ auVar324._8_4_;
                      auVar169._12_4_ = auVar216._12_4_ ^ auVar324._12_4_;
                      auVar169._16_4_ = auVar231._0_4_ ^ auVar324._16_4_;
                      auVar169._20_4_ = auVar231._4_4_ ^ auVar324._20_4_;
                      auVar169._24_4_ = auVar231._8_4_ ^ auVar324._24_4_;
                      auVar169._28_4_ = auVar231._12_4_ ^ auVar324._28_4_;
                    }
                    else {
                      p_Var25 = context->args->filter;
                      if ((p_Var25 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar22->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar286 = ZEXT1664(auVar286._0_16_);
                        auVar241 = ZEXT1632(auVar324._0_16_);
                        auVar387 = ZEXT1664(auVar387._0_16_);
                        (*p_Var25)(&local_830);
                        auVar206 = ZEXT1664(auVar206._0_16_);
                        auVar241 = vcmpps_avx(auVar241,auVar241,0xf);
                        auVar324 = ZEXT3264(auVar241);
                        auVar191._8_8_ = uStack_758;
                        auVar191._0_8_ = local_760;
                        auVar154._8_8_ = uStack_748;
                        auVar154._0_8_ = uStack_750;
                      }
                      auVar216 = vpcmpeqd_avx(auVar191,ZEXT816(0) << 0x40);
                      auVar231 = vpcmpeqd_avx(auVar154,ZEXT816(0) << 0x40);
                      auVar202._16_16_ = auVar231;
                      auVar202._0_16_ = auVar216;
                      auVar169._0_4_ = auVar216._0_4_ ^ auVar324._0_4_;
                      auVar169._4_4_ = auVar216._4_4_ ^ auVar324._4_4_;
                      auVar169._8_4_ = auVar216._8_4_ ^ auVar324._8_4_;
                      auVar169._12_4_ = auVar216._12_4_ ^ auVar324._12_4_;
                      auVar169._16_4_ = auVar231._0_4_ ^ auVar324._16_4_;
                      auVar169._20_4_ = auVar231._4_4_ ^ auVar324._20_4_;
                      auVar169._24_4_ = auVar231._8_4_ ^ auVar324._24_4_;
                      auVar169._28_4_ = auVar231._12_4_ ^ auVar324._28_4_;
                      auVar241 = auVar324._0_32_ & ~auVar202;
                      if ((((((((auVar241 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar241 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar241 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar241 >> 0x7f,0) != '\0') ||
                            (auVar241 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar241 >> 0xbf,0) != '\0') ||
                          (auVar241 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar241[0x1f] < '\0') {
                        auVar241 = vmaskmovps_avx(auVar169,*(undefined1 (*) [32])local_830.hit);
                        *(undefined1 (*) [32])(local_830.ray + 0x180) = auVar241;
                        auVar241 = vmaskmovps_avx(auVar169,*(undefined1 (*) [32])
                                                            (local_830.hit + 0x20));
                        *(undefined1 (*) [32])(local_830.ray + 0x1a0) = auVar241;
                        auVar241 = vmaskmovps_avx(auVar169,*(undefined1 (*) [32])
                                                            (local_830.hit + 0x40));
                        *(undefined1 (*) [32])(local_830.ray + 0x1c0) = auVar241;
                        auVar241 = vmaskmovps_avx(auVar169,*(undefined1 (*) [32])
                                                            (local_830.hit + 0x60));
                        *(undefined1 (*) [32])(local_830.ray + 0x1e0) = auVar241;
                        auVar241 = vmaskmovps_avx(auVar169,*(undefined1 (*) [32])
                                                            (local_830.hit + 0x80));
                        *(undefined1 (*) [32])(local_830.ray + 0x200) = auVar241;
                        auVar241 = vmaskmovps_avx(auVar169,*(undefined1 (*) [32])
                                                            (local_830.hit + 0xa0));
                        *(undefined1 (*) [32])(local_830.ray + 0x220) = auVar241;
                        auVar241 = vmaskmovps_avx(auVar169,*(undefined1 (*) [32])
                                                            (local_830.hit + 0xc0));
                        *(undefined1 (*) [32])(local_830.ray + 0x240) = auVar241;
                        auVar241 = vmaskmovps_avx(auVar169,*(undefined1 (*) [32])
                                                            (local_830.hit + 0xe0));
                        *(undefined1 (*) [32])(local_830.ray + 0x260) = auVar241;
                        auVar241 = vmaskmovps_avx(auVar169,*(undefined1 (*) [32])
                                                            (local_830.hit + 0x100));
                        *(undefined1 (*) [32])(local_830.ray + 0x280) = auVar241;
                      }
                    }
                    auVar241 = local_580;
                    if ((((((((auVar169 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar169 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar169 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar169 >> 0x7f,0) == '\0') &&
                          (auVar169 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar169 >> 0xbf,0) == '\0') &&
                        (auVar169 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar169[0x1f]) {
                      *(int *)(ray + k * 4 + 0x100) = auVar206._0_4_;
                    }
                    else {
                      auVar206 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                    }
                    *(undefined4 *)(local_620 + uVar144 * 4) = 0;
                    auVar216 = vshufps_avx(auVar206._0_16_,auVar206._0_16_,0);
                    auVar170._16_16_ = auVar216;
                    auVar170._0_16_ = auVar216;
                    auVar321 = vcmpps_avx(auVar241,auVar170,2);
                    auVar26 = vandps_avx(auVar321,local_620);
                    local_620 = local_620 & auVar321;
                    if ((((((((local_620 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                             && (local_620 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                             ) && (local_620 >> 0x5f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) && SUB321(local_620 >> 0x7f,0) == '\0') &&
                          (local_620 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(local_620 >> 0xbf,0) == '\0') &&
                        (local_620 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < local_620[0x1f]) break;
                    auVar203._8_4_ = 0x7f800000;
                    auVar203._0_8_ = 0x7f8000007f800000;
                    auVar203._12_4_ = 0x7f800000;
                    auVar203._16_4_ = 0x7f800000;
                    auVar203._20_4_ = 0x7f800000;
                    auVar203._24_4_ = 0x7f800000;
                    auVar203._28_4_ = 0x7f800000;
                    auVar241 = vblendvps_avx(auVar203,auVar241,auVar26);
                    auVar321 = vshufps_avx(auVar241,auVar241,0xb1);
                    auVar321 = vminps_avx(auVar241,auVar321);
                    auVar27 = vshufpd_avx(auVar321,auVar321,5);
                    auVar321 = vminps_avx(auVar321,auVar27);
                    auVar27 = vperm2f128_avx(auVar321,auVar321,1);
                    auVar321 = vminps_avx(auVar321,auVar27);
                    auVar321 = vcmpps_avx(auVar241,auVar321,0);
                    auVar27 = auVar26 & auVar321;
                    auVar241 = auVar26;
                    if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar27 >> 0x7f,0) != '\0') ||
                          (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar27 >> 0xbf,0) != '\0') ||
                        (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar27[0x1f] < '\0') {
                      auVar241 = vandps_avx(auVar321,auVar26);
                    }
                    uVar140 = vmovmskps_avx(auVar241);
                    uVar145 = 0;
                    if (uVar140 != 0) {
                      for (; (uVar140 >> uVar145 & 1) == 0; uVar145 = uVar145 + 1) {
                      }
                    }
                    uVar144 = (ulong)uVar145;
                    local_620 = auVar26;
                  }
                  auVar309 = ZEXT3264(_local_700);
                  auVar339 = ZEXT3264(local_7a0);
                  auVar148 = local_7c0;
                  fVar150 = (float)local_780._0_4_;
                  fVar173 = (float)local_780._4_4_;
                  fVar175 = fStack_778;
                  fVar178 = fStack_774;
                  fVar267 = fStack_770;
                  fVar260 = fStack_76c;
                  fVar261 = fStack_768;
                  local_37c = local_6a0._0_4_;
                }
              }
              auVar271 = ZEXT3264(auVar396);
              auVar206 = ZEXT3264(local_5c0);
              goto LAB_00ab55a4;
            }
          }
          auVar309 = ZEXT3264(_local_700);
          auVar206 = ZEXT3264(local_5c0);
          auVar271 = ZEXT3264(auVar396);
        }
LAB_00ab55a4:
        auVar324 = ZEXT3264(auVar164);
      }
    }
    uVar149 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar165._4_4_ = uVar149;
    auVar165._0_4_ = uVar149;
    auVar165._8_4_ = uVar149;
    auVar165._12_4_ = uVar149;
    auVar165._16_4_ = uVar149;
    auVar165._20_4_ = uVar149;
    auVar165._24_4_ = uVar149;
    auVar165._28_4_ = uVar149;
    auVar164 = vcmpps_avx(local_80,auVar165,2);
    uVar145 = vmovmskps_avx(auVar164);
    uVar142 = (ulong)((uint)uVar142 & (uint)uVar142 + 0xff & uVar145);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }